

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Primitive PVar29;
  Geometry *pGVar30;
  __int_type_conflict _Var31;
  long lVar32;
  long lVar33;
  RTCFilterFunctionN p_Var34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  uint uVar108;
  uint uVar109;
  ulong uVar110;
  undefined1 (*pauVar111) [32];
  uint uVar112;
  uint uVar113;
  uint uVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  int iVar118;
  ulong uVar119;
  float fVar120;
  float fVar147;
  float fVar149;
  __m128 a;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar148;
  float fVar150;
  float fVar152;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar153;
  float fVar155;
  float fVar157;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar151;
  float fVar159;
  undefined1 auVar137 [32];
  float fVar154;
  float fVar156;
  float fVar158;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar131 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar160;
  float fVar187;
  float fVar188;
  undefined1 auVar162 [16];
  undefined1 auVar174 [32];
  undefined1 auVar163 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar190;
  undefined1 auVar164 [16];
  float fVar161;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  float fVar189;
  float fVar191;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar193 [16];
  float fVar192;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar219;
  undefined1 auVar201 [32];
  float fVar220;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar194 [16];
  float fVar217;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar197 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  float fVar221;
  float fVar243;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [28];
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar246;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar247;
  float fVar261;
  float fVar262;
  float fVar263;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar264;
  float fVar265;
  float fVar267;
  undefined1 auVar258 [32];
  float fVar266;
  float fVar268;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar269;
  float fVar285;
  float fVar286;
  undefined1 auVar270 [16];
  float fVar287;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  float fVar288;
  float fVar289;
  float fVar291;
  undefined1 auVar276 [32];
  float fVar293;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar290;
  float fVar292;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  float fVar294;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar314;
  undefined1 auVar299 [32];
  float fVar312;
  float fVar315;
  undefined1 auVar300 [32];
  float fVar309;
  float fVar313;
  float fVar316;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar317;
  float fVar327;
  float fVar328;
  float fVar330;
  float fVar332;
  float fVar334;
  float fVar336;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar329;
  float fVar331;
  float fVar333;
  float fVar335;
  float fVar337;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  float fVar338;
  float fVar349;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar347;
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar353;
  float fVar355;
  undefined1 auVar356 [16];
  float fVar354;
  undefined1 auVar357 [28];
  float fVar364;
  float fVar366;
  float fVar370;
  float fVar372;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  float fVar365;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar371;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  undefined1 auVar362 [32];
  undefined1 auVar363 [64];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar391;
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [64];
  float fVar392;
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar407;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [64];
  float fVar408;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  float fVar422;
  float fVar423;
  float in_register_0000151c;
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [64];
  float fVar424;
  float fVar430;
  float fVar431;
  float fVar432;
  float fVar433;
  float fVar434;
  float fVar435;
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  float in_register_0000159c;
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b0c;
  float local_b00;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  RTCFilterFunctionNArguments local_a98;
  int local_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_950;
  float local_948;
  float local_944;
  undefined4 local_940;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined4 uStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar29 = prim[1];
  uVar110 = (ulong)(byte)PVar29;
  lVar115 = uVar110 * 0x25;
  fVar221 = *(float *)(prim + lVar115 + 0x12);
  auVar49 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar115 + 6));
  auVar270._0_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar270._4_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar270._8_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar270._12_4_ = fVar221 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 4 + 6)));
  auVar162._0_4_ = fVar221 * auVar49._0_4_;
  auVar162._4_4_ = fVar221 * auVar49._4_4_;
  auVar162._8_4_ = fVar221 * auVar49._8_4_;
  auVar162._12_4_ = fVar221 * auVar49._12_4_;
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 4 + 10)));
  auVar132._16_16_ = auVar49;
  auVar132._0_16_ = auVar123;
  auVar132 = vcvtdq2ps_avx(auVar132);
  lVar32 = uVar110 * 5;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar32 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar32 + 10)));
  auVar201._16_16_ = auVar49;
  auVar201._0_16_ = auVar123;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 6 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 6 + 10)));
  auVar186 = vcvtdq2ps_avx(auVar201);
  auVar235._16_16_ = auVar49;
  auVar235._0_16_ = auVar123;
  auVar37 = vcvtdq2ps_avx(auVar235);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0xf + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0xf + 10)));
  auVar236._16_16_ = auVar49;
  auVar236._0_16_ = auVar123;
  auVar38 = vcvtdq2ps_avx(auVar236);
  lVar117 = (ulong)(byte)PVar29 * 0x10;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar117 + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar117 + 10)));
  auVar299._16_16_ = auVar49;
  auVar299._0_16_ = auVar123;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar117 + uVar110 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar299);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar117 + uVar110 + 10)));
  auVar318._16_16_ = auVar49;
  auVar318._0_16_ = auVar123;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1a + 6)));
  auVar178 = vcvtdq2ps_avx(auVar318);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1a + 10)));
  auVar319._16_16_ = auVar49;
  auVar319._0_16_ = auVar123;
  auVar205 = vcvtdq2ps_avx(auVar319);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1b + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1b + 10)));
  auVar358._16_16_ = auVar49;
  auVar358._0_16_ = auVar123;
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1c + 6)));
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar110 * 0x1c + 10)));
  auVar40 = vcvtdq2ps_avx(auVar358);
  auVar378._16_16_ = auVar49;
  auVar378._0_16_ = auVar123;
  auVar41 = vcvtdq2ps_avx(auVar378);
  auVar123 = vshufps_avx(auVar270,auVar270,0);
  auVar49 = vshufps_avx(auVar270,auVar270,0x55);
  auVar128 = vshufps_avx(auVar270,auVar270,0xaa);
  fVar221 = auVar128._0_4_;
  fVar161 = auVar128._4_4_;
  fVar242 = auVar128._8_4_;
  fVar189 = auVar128._12_4_;
  fVar220 = auVar49._0_4_;
  fVar218 = auVar49._4_4_;
  fVar243 = auVar49._8_4_;
  fVar219 = auVar49._12_4_;
  fVar244 = auVar123._0_4_;
  fVar245 = auVar123._4_4_;
  fVar246 = auVar123._8_4_;
  fVar247 = auVar123._12_4_;
  auVar409._0_4_ = fVar244 * auVar132._0_4_ + fVar220 * auVar186._0_4_ + fVar221 * auVar37._0_4_;
  auVar409._4_4_ = fVar245 * auVar132._4_4_ + fVar218 * auVar186._4_4_ + fVar161 * auVar37._4_4_;
  auVar409._8_4_ = fVar246 * auVar132._8_4_ + fVar243 * auVar186._8_4_ + fVar242 * auVar37._8_4_;
  auVar409._12_4_ = fVar247 * auVar132._12_4_ + fVar219 * auVar186._12_4_ + fVar189 * auVar37._12_4_
  ;
  auVar409._16_4_ = fVar244 * auVar132._16_4_ + fVar220 * auVar186._16_4_ + fVar221 * auVar37._16_4_
  ;
  auVar409._20_4_ = fVar245 * auVar132._20_4_ + fVar218 * auVar186._20_4_ + fVar161 * auVar37._20_4_
  ;
  auVar409._24_4_ = fVar246 * auVar132._24_4_ + fVar243 * auVar186._24_4_ + fVar242 * auVar37._24_4_
  ;
  auVar409._28_4_ = fVar219 + in_register_000015dc + in_register_0000151c;
  auVar393._0_4_ = fVar244 * auVar38._0_4_ + fVar220 * auVar39._0_4_ + auVar178._0_4_ * fVar221;
  auVar393._4_4_ = fVar245 * auVar38._4_4_ + fVar218 * auVar39._4_4_ + auVar178._4_4_ * fVar161;
  auVar393._8_4_ = fVar246 * auVar38._8_4_ + fVar243 * auVar39._8_4_ + auVar178._8_4_ * fVar242;
  auVar393._12_4_ = fVar247 * auVar38._12_4_ + fVar219 * auVar39._12_4_ + auVar178._12_4_ * fVar189;
  auVar393._16_4_ = fVar244 * auVar38._16_4_ + fVar220 * auVar39._16_4_ + auVar178._16_4_ * fVar221;
  auVar393._20_4_ = fVar245 * auVar38._20_4_ + fVar218 * auVar39._20_4_ + auVar178._20_4_ * fVar161;
  auVar393._24_4_ = fVar246 * auVar38._24_4_ + fVar243 * auVar39._24_4_ + auVar178._24_4_ * fVar242;
  auVar393._28_4_ = fVar219 + in_register_000015dc + in_register_0000159c;
  auVar276._0_4_ = fVar244 * auVar205._0_4_ + fVar220 * auVar40._0_4_ + auVar41._0_4_ * fVar221;
  auVar276._4_4_ = fVar245 * auVar205._4_4_ + fVar218 * auVar40._4_4_ + auVar41._4_4_ * fVar161;
  auVar276._8_4_ = fVar246 * auVar205._8_4_ + fVar243 * auVar40._8_4_ + auVar41._8_4_ * fVar242;
  auVar276._12_4_ = fVar247 * auVar205._12_4_ + fVar219 * auVar40._12_4_ + auVar41._12_4_ * fVar189;
  auVar276._16_4_ = fVar244 * auVar205._16_4_ + fVar220 * auVar40._16_4_ + auVar41._16_4_ * fVar221;
  auVar276._20_4_ = fVar245 * auVar205._20_4_ + fVar218 * auVar40._20_4_ + auVar41._20_4_ * fVar161;
  auVar276._24_4_ = fVar246 * auVar205._24_4_ + fVar243 * auVar40._24_4_ + auVar41._24_4_ * fVar242;
  auVar276._28_4_ = fVar247 + fVar219 + fVar189;
  auVar123 = vshufps_avx(auVar162,auVar162,0);
  auVar49 = vshufps_avx(auVar162,auVar162,0x55);
  auVar128 = vshufps_avx(auVar162,auVar162,0xaa);
  fVar221 = auVar128._0_4_;
  fVar161 = auVar128._4_4_;
  fVar242 = auVar128._8_4_;
  fVar189 = auVar128._12_4_;
  fVar245 = auVar49._0_4_;
  fVar246 = auVar49._4_4_;
  fVar247 = auVar49._8_4_;
  fVar261 = auVar49._12_4_;
  fVar220 = auVar186._28_4_ + auVar37._28_4_;
  fVar218 = auVar123._0_4_;
  fVar243 = auVar123._4_4_;
  fVar219 = auVar123._8_4_;
  fVar244 = auVar123._12_4_;
  auVar174._0_4_ = fVar218 * auVar132._0_4_ + fVar245 * auVar186._0_4_ + fVar221 * auVar37._0_4_;
  auVar174._4_4_ = fVar243 * auVar132._4_4_ + fVar246 * auVar186._4_4_ + fVar161 * auVar37._4_4_;
  auVar174._8_4_ = fVar219 * auVar132._8_4_ + fVar247 * auVar186._8_4_ + fVar242 * auVar37._8_4_;
  auVar174._12_4_ = fVar244 * auVar132._12_4_ + fVar261 * auVar186._12_4_ + fVar189 * auVar37._12_4_
  ;
  auVar174._16_4_ = fVar218 * auVar132._16_4_ + fVar245 * auVar186._16_4_ + fVar221 * auVar37._16_4_
  ;
  auVar174._20_4_ = fVar243 * auVar132._20_4_ + fVar246 * auVar186._20_4_ + fVar161 * auVar37._20_4_
  ;
  auVar174._24_4_ = fVar219 * auVar132._24_4_ + fVar247 * auVar186._24_4_ + fVar242 * auVar37._24_4_
  ;
  auVar174._28_4_ = auVar132._28_4_ + fVar220;
  auVar133._0_4_ = fVar218 * auVar38._0_4_ + auVar178._0_4_ * fVar221 + fVar245 * auVar39._0_4_;
  auVar133._4_4_ = fVar243 * auVar38._4_4_ + auVar178._4_4_ * fVar161 + fVar246 * auVar39._4_4_;
  auVar133._8_4_ = fVar219 * auVar38._8_4_ + auVar178._8_4_ * fVar242 + fVar247 * auVar39._8_4_;
  auVar133._12_4_ = fVar244 * auVar38._12_4_ + auVar178._12_4_ * fVar189 + fVar261 * auVar39._12_4_;
  auVar133._16_4_ = fVar218 * auVar38._16_4_ + auVar178._16_4_ * fVar221 + fVar245 * auVar39._16_4_;
  auVar133._20_4_ = fVar243 * auVar38._20_4_ + auVar178._20_4_ * fVar161 + fVar246 * auVar39._20_4_;
  auVar133._24_4_ = fVar219 * auVar38._24_4_ + auVar178._24_4_ * fVar242 + fVar247 * auVar39._24_4_;
  auVar133._28_4_ = auVar132._28_4_ + auVar178._28_4_ + auVar37._28_4_;
  auVar320._8_4_ = 0x7fffffff;
  auVar320._0_8_ = 0x7fffffff7fffffff;
  auVar320._12_4_ = 0x7fffffff;
  auVar320._16_4_ = 0x7fffffff;
  auVar320._20_4_ = 0x7fffffff;
  auVar320._24_4_ = 0x7fffffff;
  auVar320._28_4_ = 0x7fffffff;
  auVar341._8_4_ = 0x219392ef;
  auVar341._0_8_ = 0x219392ef219392ef;
  auVar341._12_4_ = 0x219392ef;
  auVar341._16_4_ = 0x219392ef;
  auVar341._20_4_ = 0x219392ef;
  auVar341._24_4_ = 0x219392ef;
  auVar341._28_4_ = 0x219392ef;
  auVar132 = vandps_avx(auVar409,auVar320);
  auVar132 = vcmpps_avx(auVar132,auVar341,1);
  auVar186 = vblendvps_avx(auVar409,auVar341,auVar132);
  auVar132 = vandps_avx(auVar393,auVar320);
  auVar132 = vcmpps_avx(auVar132,auVar341,1);
  auVar37 = vblendvps_avx(auVar393,auVar341,auVar132);
  auVar132 = vandps_avx(auVar276,auVar320);
  auVar132 = vcmpps_avx(auVar132,auVar341,1);
  auVar132 = vblendvps_avx(auVar276,auVar341,auVar132);
  auVar202._0_4_ = fVar218 * auVar205._0_4_ + fVar245 * auVar40._0_4_ + auVar41._0_4_ * fVar221;
  auVar202._4_4_ = fVar243 * auVar205._4_4_ + fVar246 * auVar40._4_4_ + auVar41._4_4_ * fVar161;
  auVar202._8_4_ = fVar219 * auVar205._8_4_ + fVar247 * auVar40._8_4_ + auVar41._8_4_ * fVar242;
  auVar202._12_4_ = fVar244 * auVar205._12_4_ + fVar261 * auVar40._12_4_ + auVar41._12_4_ * fVar189;
  auVar202._16_4_ = fVar218 * auVar205._16_4_ + fVar245 * auVar40._16_4_ + auVar41._16_4_ * fVar221;
  auVar202._20_4_ = fVar243 * auVar205._20_4_ + fVar246 * auVar40._20_4_ + auVar41._20_4_ * fVar161;
  auVar202._24_4_ = fVar219 * auVar205._24_4_ + fVar247 * auVar40._24_4_ + auVar41._24_4_ * fVar242;
  auVar202._28_4_ = fVar220 + auVar39._28_4_ + fVar189;
  auVar38 = vrcpps_avx(auVar186);
  fVar221 = auVar38._0_4_;
  fVar242 = auVar38._4_4_;
  auVar39._4_4_ = auVar186._4_4_ * fVar242;
  auVar39._0_4_ = auVar186._0_4_ * fVar221;
  fVar220 = auVar38._8_4_;
  auVar39._8_4_ = auVar186._8_4_ * fVar220;
  fVar243 = auVar38._12_4_;
  auVar39._12_4_ = auVar186._12_4_ * fVar243;
  fVar244 = auVar38._16_4_;
  auVar39._16_4_ = auVar186._16_4_ * fVar244;
  fVar245 = auVar38._20_4_;
  auVar39._20_4_ = auVar186._20_4_ * fVar245;
  fVar246 = auVar38._24_4_;
  auVar39._24_4_ = auVar186._24_4_ * fVar246;
  auVar39._28_4_ = auVar186._28_4_;
  auVar342._8_4_ = 0x3f800000;
  auVar342._0_8_ = 0x3f8000003f800000;
  auVar342._12_4_ = 0x3f800000;
  auVar342._16_4_ = 0x3f800000;
  auVar342._20_4_ = 0x3f800000;
  auVar342._24_4_ = 0x3f800000;
  auVar342._28_4_ = 0x3f800000;
  auVar178 = vsubps_avx(auVar342,auVar39);
  auVar39 = vrcpps_avx(auVar37);
  fVar221 = fVar221 + fVar221 * auVar178._0_4_;
  fVar242 = fVar242 + fVar242 * auVar178._4_4_;
  fVar220 = fVar220 + fVar220 * auVar178._8_4_;
  fVar243 = fVar243 + fVar243 * auVar178._12_4_;
  fVar244 = fVar244 + fVar244 * auVar178._16_4_;
  fVar245 = fVar245 + fVar245 * auVar178._20_4_;
  fVar246 = fVar246 + fVar246 * auVar178._24_4_;
  fVar247 = auVar39._0_4_;
  fVar261 = auVar39._4_4_;
  auVar186._4_4_ = fVar261 * auVar37._4_4_;
  auVar186._0_4_ = fVar247 * auVar37._0_4_;
  fVar262 = auVar39._8_4_;
  auVar186._8_4_ = fVar262 * auVar37._8_4_;
  fVar263 = auVar39._12_4_;
  auVar186._12_4_ = fVar263 * auVar37._12_4_;
  fVar264 = auVar39._16_4_;
  auVar186._16_4_ = fVar264 * auVar37._16_4_;
  fVar265 = auVar39._20_4_;
  auVar186._20_4_ = fVar265 * auVar37._20_4_;
  fVar267 = auVar39._24_4_;
  auVar186._24_4_ = fVar267 * auVar37._24_4_;
  auVar186._28_4_ = auVar37._28_4_;
  auVar37 = vsubps_avx(auVar342,auVar186);
  fVar247 = fVar247 + fVar247 * auVar37._0_4_;
  fVar261 = fVar261 + fVar261 * auVar37._4_4_;
  fVar262 = fVar262 + fVar262 * auVar37._8_4_;
  fVar263 = fVar263 + fVar263 * auVar37._12_4_;
  fVar264 = fVar264 + fVar264 * auVar37._16_4_;
  fVar265 = fVar265 + fVar265 * auVar37._20_4_;
  fVar267 = fVar267 + fVar267 * auVar37._24_4_;
  auVar186 = vrcpps_avx(auVar132);
  fVar269 = auVar186._0_4_;
  fVar285 = auVar186._4_4_;
  auVar205._4_4_ = fVar285 * auVar132._4_4_;
  auVar205._0_4_ = fVar269 * auVar132._0_4_;
  fVar286 = auVar186._8_4_;
  auVar205._8_4_ = fVar286 * auVar132._8_4_;
  fVar287 = auVar186._12_4_;
  auVar205._12_4_ = fVar287 * auVar132._12_4_;
  fVar288 = auVar186._16_4_;
  auVar205._16_4_ = fVar288 * auVar132._16_4_;
  fVar289 = auVar186._20_4_;
  auVar205._20_4_ = fVar289 * auVar132._20_4_;
  fVar291 = auVar186._24_4_;
  auVar205._24_4_ = fVar291 * auVar132._24_4_;
  auVar205._28_4_ = auVar132._28_4_;
  auVar132 = vsubps_avx(auVar342,auVar205);
  fVar269 = fVar269 + fVar269 * auVar132._0_4_;
  fVar285 = fVar285 + fVar285 * auVar132._4_4_;
  fVar286 = fVar286 + fVar286 * auVar132._8_4_;
  fVar287 = fVar287 + fVar287 * auVar132._12_4_;
  fVar288 = fVar288 + fVar288 * auVar132._16_4_;
  fVar289 = fVar289 + fVar289 * auVar132._20_4_;
  fVar291 = fVar291 + fVar291 * auVar132._24_4_;
  auVar123 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar115 + 0x16)) * *(float *)(prim + lVar115 + 0x1a)))
  ;
  auVar127 = vshufps_avx(auVar123,auVar123,0);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *(ulong *)(prim + uVar110 * 7 + 6);
  auVar123 = vpmovsxwd_avx(auVar123);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar110 * 7 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar49);
  auVar321._16_16_ = auVar49;
  auVar321._0_16_ = auVar123;
  auVar132 = vcvtdq2ps_avx(auVar321);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 6);
  auVar123 = vpmovsxwd_avx(auVar128);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar110 * 0xb + 0xe);
  auVar49 = vpmovsxwd_avx(auVar169);
  auVar343._16_16_ = auVar49;
  auVar343._0_16_ = auVar123;
  auVar186 = vcvtdq2ps_avx(auVar343);
  auVar186 = vsubps_avx(auVar186,auVar132);
  fVar161 = auVar127._0_4_;
  fVar189 = auVar127._4_4_;
  fVar218 = auVar127._8_4_;
  fVar219 = auVar127._12_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar110 * 9 + 6);
  auVar123 = vpmovsxwd_avx(auVar127);
  auVar356._8_8_ = 0;
  auVar356._0_8_ = *(ulong *)(prim + uVar110 * 9 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar356);
  auVar322._0_4_ = auVar186._0_4_ * fVar161 + auVar132._0_4_;
  auVar322._4_4_ = auVar186._4_4_ * fVar189 + auVar132._4_4_;
  auVar322._8_4_ = auVar186._8_4_ * fVar218 + auVar132._8_4_;
  auVar322._12_4_ = auVar186._12_4_ * fVar219 + auVar132._12_4_;
  auVar322._16_4_ = auVar186._16_4_ * fVar161 + auVar132._16_4_;
  auVar322._20_4_ = auVar186._20_4_ * fVar189 + auVar132._20_4_;
  auVar322._24_4_ = auVar186._24_4_ * fVar218 + auVar132._24_4_;
  auVar322._28_4_ = auVar186._28_4_ + auVar132._28_4_;
  auVar344._16_16_ = auVar49;
  auVar344._0_16_ = auVar123;
  auVar132 = vcvtdq2ps_avx(auVar344);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 6);
  auVar123 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar110 * 0xd + 0xe);
  auVar49 = vpmovsxwd_avx(auVar13);
  auVar359._16_16_ = auVar49;
  auVar359._0_16_ = auVar123;
  auVar186 = vcvtdq2ps_avx(auVar359);
  auVar186 = vsubps_avx(auVar186,auVar132);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 6);
  auVar123 = vpmovsxwd_avx(auVar130);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar110 * 0x12 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar14);
  auVar345._0_4_ = auVar132._0_4_ + auVar186._0_4_ * fVar161;
  auVar345._4_4_ = auVar132._4_4_ + auVar186._4_4_ * fVar189;
  auVar345._8_4_ = auVar132._8_4_ + auVar186._8_4_ * fVar218;
  auVar345._12_4_ = auVar132._12_4_ + auVar186._12_4_ * fVar219;
  auVar345._16_4_ = auVar132._16_4_ + auVar186._16_4_ * fVar161;
  auVar345._20_4_ = auVar132._20_4_ + auVar186._20_4_ * fVar189;
  auVar345._24_4_ = auVar132._24_4_ + auVar186._24_4_ * fVar218;
  auVar345._28_4_ = auVar132._28_4_ + auVar186._28_4_;
  auVar360._16_16_ = auVar49;
  auVar360._0_16_ = auVar123;
  auVar132 = vcvtdq2ps_avx(auVar360);
  uVar119 = (ulong)(uint)((int)lVar32 << 2);
  lVar115 = uVar110 * 2 + uVar119;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar115 + 6);
  auVar123 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar115 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar16);
  auVar379._16_16_ = auVar49;
  auVar379._0_16_ = auVar123;
  auVar186 = vcvtdq2ps_avx(auVar379);
  auVar186 = vsubps_avx(auVar186,auVar132);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar119 + 6);
  auVar123 = vpmovsxwd_avx(auVar17);
  auVar361._0_4_ = auVar132._0_4_ + auVar186._0_4_ * fVar161;
  auVar361._4_4_ = auVar132._4_4_ + auVar186._4_4_ * fVar189;
  auVar361._8_4_ = auVar132._8_4_ + auVar186._8_4_ * fVar218;
  auVar361._12_4_ = auVar132._12_4_ + auVar186._12_4_ * fVar219;
  auVar361._16_4_ = auVar132._16_4_ + auVar186._16_4_ * fVar161;
  auVar361._20_4_ = auVar132._20_4_ + auVar186._20_4_ * fVar189;
  auVar361._24_4_ = auVar132._24_4_ + auVar186._24_4_ * fVar218;
  auVar361._28_4_ = auVar132._28_4_ + auVar186._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar119 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar18);
  auVar380._16_16_ = auVar49;
  auVar380._0_16_ = auVar123;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar110 * 0x18 + 6);
  auVar123 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar110 * 0x18 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar20);
  auVar132 = vcvtdq2ps_avx(auVar380);
  auVar394._16_16_ = auVar49;
  auVar394._0_16_ = auVar123;
  auVar186 = vcvtdq2ps_avx(auVar394);
  auVar186 = vsubps_avx(auVar186,auVar132);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar110 * 0x1d + 6);
  auVar123 = vpmovsxwd_avx(auVar21);
  auVar381._0_4_ = auVar132._0_4_ + auVar186._0_4_ * fVar161;
  auVar381._4_4_ = auVar132._4_4_ + auVar186._4_4_ * fVar189;
  auVar381._8_4_ = auVar132._8_4_ + auVar186._8_4_ * fVar218;
  auVar381._12_4_ = auVar132._12_4_ + auVar186._12_4_ * fVar219;
  auVar381._16_4_ = auVar132._16_4_ + auVar186._16_4_ * fVar161;
  auVar381._20_4_ = auVar132._20_4_ + auVar186._20_4_ * fVar189;
  auVar381._24_4_ = auVar132._24_4_ + auVar186._24_4_ * fVar218;
  auVar381._28_4_ = auVar132._28_4_ + auVar186._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar110 * 0x1d + 0xe);
  auVar49 = vpmovsxwd_avx(auVar22);
  lVar115 = uVar110 + (ulong)(byte)PVar29 * 0x20;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar115 + 6);
  auVar128 = vpmovsxwd_avx(auVar23);
  auVar395._16_16_ = auVar49;
  auVar395._0_16_ = auVar123;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar115 + 0xe);
  auVar123 = vpmovsxwd_avx(auVar24);
  auVar410._16_16_ = auVar123;
  auVar410._0_16_ = auVar128;
  auVar132 = vcvtdq2ps_avx(auVar395);
  auVar186 = vcvtdq2ps_avx(auVar410);
  auVar186 = vsubps_avx(auVar186,auVar132);
  auVar396._0_4_ = auVar132._0_4_ + auVar186._0_4_ * fVar161;
  auVar396._4_4_ = auVar132._4_4_ + auVar186._4_4_ * fVar189;
  auVar396._8_4_ = auVar132._8_4_ + auVar186._8_4_ * fVar218;
  auVar396._12_4_ = auVar132._12_4_ + auVar186._12_4_ * fVar219;
  auVar396._16_4_ = auVar132._16_4_ + auVar186._16_4_ * fVar161;
  auVar396._20_4_ = auVar132._20_4_ + auVar186._20_4_ * fVar189;
  auVar396._24_4_ = auVar132._24_4_ + auVar186._24_4_ * fVar218;
  auVar396._28_4_ = auVar132._28_4_ + auVar186._28_4_;
  lVar115 = (ulong)(byte)PVar29 * 0x20 - uVar110;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar115 + 6);
  auVar123 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar115 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar26);
  auVar411._16_16_ = auVar49;
  auVar411._0_16_ = auVar123;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar110 * 0x23 + 6);
  auVar123 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar110 * 0x23 + 0xe);
  auVar49 = vpmovsxwd_avx(auVar28);
  auVar425._16_16_ = auVar49;
  auVar425._0_16_ = auVar123;
  auVar132 = vcvtdq2ps_avx(auVar411);
  auVar186 = vcvtdq2ps_avx(auVar425);
  auVar186 = vsubps_avx(auVar186,auVar132);
  auVar412._0_4_ = auVar132._0_4_ + auVar186._0_4_ * fVar161;
  auVar412._4_4_ = auVar132._4_4_ + auVar186._4_4_ * fVar189;
  auVar412._8_4_ = auVar132._8_4_ + auVar186._8_4_ * fVar218;
  auVar412._12_4_ = auVar132._12_4_ + auVar186._12_4_ * fVar219;
  auVar412._16_4_ = auVar132._16_4_ + auVar186._16_4_ * fVar161;
  auVar412._20_4_ = auVar132._20_4_ + auVar186._20_4_ * fVar189;
  auVar412._24_4_ = auVar132._24_4_ + auVar186._24_4_ * fVar218;
  auVar412._28_4_ = auVar132._28_4_ + fVar219;
  auVar132 = vsubps_avx(auVar322,auVar174);
  auVar295._0_4_ = fVar221 * auVar132._0_4_;
  auVar295._4_4_ = fVar242 * auVar132._4_4_;
  auVar295._8_4_ = fVar220 * auVar132._8_4_;
  auVar295._12_4_ = fVar243 * auVar132._12_4_;
  auVar40._16_4_ = fVar244 * auVar132._16_4_;
  auVar40._0_16_ = auVar295;
  auVar40._20_4_ = fVar245 * auVar132._20_4_;
  auVar40._24_4_ = fVar246 * auVar132._24_4_;
  auVar40._28_4_ = auVar132._28_4_;
  auVar132 = vsubps_avx(auVar345,auVar174);
  auVar222._0_4_ = fVar221 * auVar132._0_4_;
  auVar222._4_4_ = fVar242 * auVar132._4_4_;
  auVar222._8_4_ = fVar220 * auVar132._8_4_;
  auVar222._12_4_ = fVar243 * auVar132._12_4_;
  auVar41._16_4_ = fVar244 * auVar132._16_4_;
  auVar41._0_16_ = auVar222;
  auVar41._20_4_ = fVar245 * auVar132._20_4_;
  auVar41._24_4_ = fVar246 * auVar132._24_4_;
  auVar41._28_4_ = auVar38._28_4_ + auVar178._28_4_;
  auVar132 = vsubps_avx(auVar361,auVar133);
  auVar163._0_4_ = fVar247 * auVar132._0_4_;
  auVar163._4_4_ = fVar261 * auVar132._4_4_;
  auVar163._8_4_ = fVar262 * auVar132._8_4_;
  auVar163._12_4_ = fVar263 * auVar132._12_4_;
  auVar38._16_4_ = fVar264 * auVar132._16_4_;
  auVar38._0_16_ = auVar163;
  auVar38._20_4_ = fVar265 * auVar132._20_4_;
  auVar38._24_4_ = fVar267 * auVar132._24_4_;
  auVar38._28_4_ = auVar132._28_4_;
  auVar132 = vsubps_avx(auVar381,auVar133);
  auVar248._0_4_ = fVar247 * auVar132._0_4_;
  auVar248._4_4_ = fVar261 * auVar132._4_4_;
  auVar248._8_4_ = fVar262 * auVar132._8_4_;
  auVar248._12_4_ = fVar263 * auVar132._12_4_;
  auVar178._16_4_ = fVar264 * auVar132._16_4_;
  auVar178._0_16_ = auVar248;
  auVar178._20_4_ = fVar265 * auVar132._20_4_;
  auVar178._24_4_ = fVar267 * auVar132._24_4_;
  auVar178._28_4_ = auVar39._28_4_ + auVar37._28_4_;
  auVar132 = vsubps_avx(auVar396,auVar202);
  auVar121._0_4_ = fVar269 * auVar132._0_4_;
  auVar121._4_4_ = fVar285 * auVar132._4_4_;
  auVar121._8_4_ = fVar286 * auVar132._8_4_;
  auVar121._12_4_ = fVar287 * auVar132._12_4_;
  auVar37._16_4_ = fVar288 * auVar132._16_4_;
  auVar37._0_16_ = auVar121;
  auVar37._20_4_ = fVar289 * auVar132._20_4_;
  auVar37._24_4_ = fVar291 * auVar132._24_4_;
  auVar37._28_4_ = auVar132._28_4_;
  auVar132 = vsubps_avx(auVar412,auVar202);
  auVar193._0_4_ = fVar269 * auVar132._0_4_;
  auVar193._4_4_ = fVar285 * auVar132._4_4_;
  auVar193._8_4_ = fVar286 * auVar132._8_4_;
  auVar193._12_4_ = fVar287 * auVar132._12_4_;
  auVar50._16_4_ = fVar288 * auVar132._16_4_;
  auVar50._0_16_ = auVar193;
  auVar50._20_4_ = fVar289 * auVar132._20_4_;
  auVar50._24_4_ = fVar291 * auVar132._24_4_;
  auVar50._28_4_ = auVar132._28_4_;
  auVar123 = vpminsd_avx(auVar40._16_16_,auVar41._16_16_);
  auVar49 = vpminsd_avx(auVar295,auVar222);
  auVar346._16_16_ = auVar123;
  auVar346._0_16_ = auVar49;
  auVar169 = auVar38._16_16_;
  auVar390 = ZEXT1664(auVar169);
  auVar123 = vpminsd_avx(auVar169,auVar178._16_16_);
  auVar49 = vpminsd_avx(auVar163,auVar248);
  auVar397._16_16_ = auVar123;
  auVar397._0_16_ = auVar49;
  auVar132 = vmaxps_avx(auVar346,auVar397);
  auVar127 = auVar50._16_16_;
  auVar400 = ZEXT1664(auVar127);
  auVar128 = auVar37._16_16_;
  auVar417 = ZEXT1664(auVar128);
  auVar123 = vpminsd_avx(auVar128,auVar127);
  auVar49 = vpminsd_avx(auVar121,auVar193);
  auVar426._16_16_ = auVar123;
  auVar426._0_16_ = auVar49;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar436._4_4_ = uVar8;
  auVar436._0_4_ = uVar8;
  auVar436._8_4_ = uVar8;
  auVar436._12_4_ = uVar8;
  auVar436._16_4_ = uVar8;
  auVar436._20_4_ = uVar8;
  auVar436._24_4_ = uVar8;
  auVar436._28_4_ = uVar8;
  auVar186 = vmaxps_avx(auVar426,auVar436);
  auVar132 = vmaxps_avx(auVar132,auVar186);
  local_2c0._4_4_ = auVar132._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar132._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar132._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar132._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar132._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar132._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar132._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar132._28_4_;
  auVar123 = vpmaxsd_avx(auVar40._16_16_,auVar41._16_16_);
  auVar49 = vpmaxsd_avx(auVar295,auVar222);
  auVar237._16_16_ = auVar123;
  auVar237._0_16_ = auVar49;
  auVar123 = vpmaxsd_avx(auVar169,auVar178._16_16_);
  auVar49 = vpmaxsd_avx(auVar163,auVar248);
  auVar175._16_16_ = auVar123;
  auVar175._0_16_ = auVar49;
  auVar132 = vminps_avx(auVar237,auVar175);
  auVar123 = vpmaxsd_avx(auVar128,auVar127);
  auVar49 = vpmaxsd_avx(auVar121,auVar193);
  fVar221 = (ray->super_RayK<1>).tfar;
  auVar203._4_4_ = fVar221;
  auVar203._0_4_ = fVar221;
  auVar203._8_4_ = fVar221;
  auVar203._12_4_ = fVar221;
  auVar203._16_4_ = fVar221;
  auVar203._20_4_ = fVar221;
  auVar203._24_4_ = fVar221;
  auVar203._28_4_ = fVar221;
  auVar134._16_16_ = auVar123;
  auVar134._0_16_ = auVar49;
  auVar186 = vminps_avx(auVar134,auVar203);
  auVar132 = vminps_avx(auVar132,auVar186);
  auVar138._4_4_ = auVar132._4_4_ * 1.0000004;
  auVar138._0_4_ = auVar132._0_4_ * 1.0000004;
  auVar138._8_4_ = auVar132._8_4_ * 1.0000004;
  auVar138._12_4_ = auVar132._12_4_ * 1.0000004;
  auVar138._16_4_ = auVar132._16_4_ * 1.0000004;
  auVar138._20_4_ = auVar132._20_4_ * 1.0000004;
  auVar138._24_4_ = auVar132._24_4_ * 1.0000004;
  auVar138._28_4_ = auVar132._28_4_;
  auVar132 = vcmpps_avx(local_2c0,auVar138,2);
  auVar123 = vpshufd_avx(ZEXT116((byte)PVar29),0);
  auVar176._16_16_ = auVar123;
  auVar176._0_16_ = auVar123;
  auVar186 = vcvtdq2ps_avx(auVar176);
  auVar186 = vcmpps_avx(_DAT_01faff40,auVar186,1);
  auVar132 = vandps_avx(auVar132,auVar186);
  uVar108 = vmovmskps_avx(auVar132);
  if (uVar108 == 0) {
    return;
  }
  uVar108 = uVar108 & 0xff;
  auVar135._16_16_ = mm_lookupmask_ps._240_16_;
  auVar135._0_16_ = mm_lookupmask_ps._240_16_;
  local_460 = vblendps_avx(auVar135,ZEXT832(0) << 0x20,0x80);
LAB_0113a3ff:
  lVar115 = 0;
  if (uVar108 != 0) {
    for (; (uVar108 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
    }
  }
  uVar114 = *(uint *)(prim + 2);
  pGVar30 = (context->scene->geometries).items[uVar114].ptr;
  uVar110 = (ulong)*(uint *)(*(long *)&pGVar30->field_0x58 +
                            (ulong)*(uint *)(prim + lVar115 * 4 + 6) *
                            pGVar30[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar221 = (pGVar30->time_range).lower;
  fVar221 = pGVar30->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar221) /
            ((pGVar30->time_range).upper - fVar221));
  auVar123 = vroundss_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),9);
  auVar123 = vminss_avx(auVar123,ZEXT416((uint)(pGVar30->fnumTimeSegments + -1.0)));
  auVar123 = vmaxss_avx(ZEXT816(0) << 0x20,auVar123);
  fVar221 = fVar221 - auVar123._0_4_;
  _Var31 = pGVar30[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar116 = (long)(int)auVar123._0_4_ * 0x38;
  lVar32 = *(long *)(_Var31 + 0x10 + lVar116);
  lVar117 = *(long *)(_Var31 + 0x38 + lVar116);
  lVar33 = *(long *)(_Var31 + 0x48 + lVar116);
  auVar123 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
  pfVar1 = (float *)(lVar117 + uVar110 * lVar33);
  fVar220 = auVar123._0_4_;
  fVar218 = auVar123._4_4_;
  fVar243 = auVar123._8_4_;
  fVar219 = auVar123._12_4_;
  pfVar2 = (float *)(lVar117 + (uVar110 + 1) * lVar33);
  pfVar3 = (float *)(lVar117 + (uVar110 + 2) * lVar33);
  pfVar4 = (float *)(lVar117 + lVar33 * (uVar110 + 3));
  lVar117 = *(long *)(_Var31 + lVar116);
  auVar123 = vshufps_avx(ZEXT416((uint)(1.0 - fVar221)),ZEXT416((uint)(1.0 - fVar221)),0);
  pfVar5 = (float *)(lVar117 + lVar32 * uVar110);
  fVar221 = auVar123._0_4_;
  fVar161 = auVar123._4_4_;
  fVar242 = auVar123._8_4_;
  fVar189 = auVar123._12_4_;
  pfVar6 = (float *)(lVar117 + lVar32 * (uVar110 + 1));
  pfVar7 = (float *)(lVar117 + lVar32 * (uVar110 + 2));
  auVar194._0_4_ = fVar220 * *pfVar1 + fVar221 * *pfVar5;
  auVar194._4_4_ = fVar218 * pfVar1[1] + fVar161 * pfVar5[1];
  auVar194._8_4_ = fVar243 * pfVar1[2] + fVar242 * pfVar5[2];
  auVar194._12_4_ = fVar219 * pfVar1[3] + fVar189 * pfVar5[3];
  auVar223._0_4_ = fVar221 * *pfVar6 + fVar220 * *pfVar2;
  auVar223._4_4_ = fVar161 * pfVar6[1] + fVar218 * pfVar2[1];
  auVar223._8_4_ = fVar242 * pfVar6[2] + fVar243 * pfVar2[2];
  auVar223._12_4_ = fVar189 * pfVar6[3] + fVar219 * pfVar2[3];
  auVar249._0_4_ = fVar221 * *pfVar7 + fVar220 * *pfVar3;
  auVar249._4_4_ = fVar161 * pfVar7[1] + fVar218 * pfVar3[1];
  auVar249._8_4_ = fVar242 * pfVar7[2] + fVar243 * pfVar3[2];
  auVar249._12_4_ = fVar189 * pfVar7[3] + fVar219 * pfVar3[3];
  pfVar1 = (float *)(lVar117 + lVar32 * (uVar110 + 3));
  auVar271._0_4_ = fVar221 * *pfVar1 + fVar220 * *pfVar4;
  auVar271._4_4_ = fVar161 * pfVar1[1] + fVar218 * pfVar4[1];
  auVar271._8_4_ = fVar242 * pfVar1[2] + fVar243 * pfVar4[2];
  auVar271._12_4_ = fVar189 * pfVar1[3] + fVar219 * pfVar4[3];
  auVar122._0_4_ = (auVar194._0_4_ + auVar223._0_4_ + auVar249._0_4_ + auVar271._0_4_) * 0.25;
  auVar122._4_4_ = (auVar194._4_4_ + auVar223._4_4_ + auVar249._4_4_ + auVar271._4_4_) * 0.25;
  auVar122._8_4_ = (auVar194._8_4_ + auVar223._8_4_ + auVar249._8_4_ + auVar271._8_4_) * 0.25;
  auVar122._12_4_ = (auVar194._12_4_ + auVar223._12_4_ + auVar249._12_4_ + auVar271._12_4_) * 0.25;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar123 = vsubps_avx(auVar122,(undefined1  [16])aVar10);
  auVar123 = vdpps_avx(auVar123,(undefined1  [16])aVar11,0x7f);
  auVar49 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar128 = vrcpss_avx(auVar49,auVar49);
  auVar363 = ZEXT464(0x40000000);
  fVar221 = auVar123._0_4_ * auVar128._0_4_ * (2.0 - auVar128._0_4_ * auVar49._0_4_);
  local_7f0 = ZEXT416((uint)fVar221);
  auVar49 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
  fVar221 = aVar11.x;
  fVar161 = aVar11.y;
  fVar242 = aVar11.z;
  aVar190 = aVar11.field_3;
  auVar296._0_4_ = aVar10.x + fVar221 * auVar49._0_4_;
  auVar296._4_4_ = aVar10.y + fVar161 * auVar49._4_4_;
  auVar296._8_4_ = aVar10.z + fVar242 * auVar49._8_4_;
  auVar296._12_4_ = aVar10.field_3.w + aVar190.w * auVar49._12_4_;
  auVar123 = vblendps_avx(auVar296,_DAT_01f7aa10,8);
  _local_9f0 = vsubps_avx(auVar194,auVar123);
  auVar326 = ZEXT1664(_local_9f0);
  _local_a00 = vsubps_avx(auVar249,auVar123);
  _local_a10 = vsubps_avx(auVar223,auVar123);
  _local_a20 = vsubps_avx(auVar271,auVar123);
  auVar284 = ZEXT1664(_local_a20);
  auVar123 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001290 = auVar123;
  _local_1e0 = auVar123;
  auVar123 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  register0x00001290 = auVar123;
  _local_200 = auVar123;
  auVar123 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001290 = auVar123;
  _local_220 = auVar123;
  auVar123 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x00001290 = auVar123;
  _local_240 = auVar123;
  auVar123 = vshufps_avx(_local_a10,_local_a10,0);
  register0x00001290 = auVar123;
  _local_260 = auVar123;
  auVar123 = vshufps_avx(_local_a10,_local_a10,0x55);
  register0x00001290 = auVar123;
  _local_280 = auVar123;
  auVar123 = vshufps_avx(_local_a10,_local_a10,0xaa);
  register0x00001290 = auVar123;
  _local_320 = auVar123;
  auVar164._0_4_ = fVar221 * fVar221;
  auVar164._4_4_ = fVar161 * fVar161;
  auVar164._8_4_ = fVar242 * fVar242;
  auVar164._12_4_ = aVar190.w * aVar190.w;
  auVar123 = vshufps_avx(auVar164,auVar164,0xaa);
  auVar128 = vshufps_avx(auVar164,auVar164,0x55);
  auVar169 = vshufps_avx(_local_a10,_local_a10,0xff);
  register0x000012d0 = auVar169;
  _local_340 = auVar169;
  auVar169 = vshufps_avx(auVar164,auVar164,0);
  local_2a0._0_4_ = auVar169._0_4_ + auVar128._0_4_ + auVar123._0_4_;
  local_2a0._4_4_ = auVar169._4_4_ + auVar128._4_4_ + auVar123._4_4_;
  local_2a0._8_4_ = auVar169._8_4_ + auVar128._8_4_ + auVar123._8_4_;
  local_2a0._12_4_ = auVar169._12_4_ + auVar128._12_4_ + auVar123._12_4_;
  local_2a0._16_4_ = auVar169._0_4_ + auVar128._0_4_ + auVar123._0_4_;
  local_2a0._20_4_ = auVar169._4_4_ + auVar128._4_4_ + auVar123._4_4_;
  local_2a0._24_4_ = auVar169._8_4_ + auVar128._8_4_ + auVar123._8_4_;
  local_2a0._28_4_ = auVar169._12_4_ + auVar128._12_4_ + auVar123._12_4_;
  auVar306 = ZEXT3264(local_2a0);
  auVar123 = vshufps_avx(_local_a00,_local_a00,0);
  register0x00001250 = auVar123;
  _local_360 = auVar123;
  auVar123 = vshufps_avx(_local_a00,_local_a00,0x55);
  register0x00001250 = auVar123;
  _local_380 = auVar123;
  auVar123 = vshufps_avx(_local_a00,_local_a00,0xaa);
  register0x00001250 = auVar123;
  _local_3a0 = auVar123;
  auVar123 = vshufps_avx(_local_a00,_local_a00,0xff);
  register0x00001250 = auVar123;
  _local_3c0 = auVar123;
  auVar123 = vshufps_avx(_local_a20,_local_a20,0);
  register0x00001250 = auVar123;
  _local_3e0 = auVar123;
  auVar123 = vshufps_avx(_local_a20,_local_a20,0x55);
  register0x00001250 = auVar123;
  _local_400 = auVar123;
  auVar123 = vshufps_avx(_local_a20,_local_a20,0xaa);
  register0x00001250 = auVar123;
  _local_420 = auVar123;
  auVar123 = vshufps_avx(_local_a20,_local_a20,0xff);
  local_440._16_16_ = auVar123;
  local_440._0_16_ = auVar123;
  register0x00001210 = auVar49;
  _local_760 = auVar49;
  local_b0c = 1;
  uVar119 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_5a0 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_5c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  auVar136._8_4_ = 0x7fffffff;
  auVar136._0_8_ = 0x7fffffff7fffffff;
  auVar136._12_4_ = 0x7fffffff;
  auVar136._16_4_ = 0x7fffffff;
  auVar136._20_4_ = 0x7fffffff;
  auVar136._24_4_ = 0x7fffffff;
  auVar136._28_4_ = 0x7fffffff;
  local_480 = vandps_avx(local_2a0,auVar136);
  local_530 = ZEXT816(0x3f80000000000000);
  uVar110 = (ulong)*(uint *)(prim + lVar115 * 4 + 6);
  do {
    auVar258._8_4_ = 0x3f800000;
    auVar258._0_8_ = 0x3f8000003f800000;
    auVar258._12_4_ = 0x3f800000;
    auVar258._16_4_ = 0x3f800000;
    auVar258._20_4_ = 0x3f800000;
    auVar258._24_4_ = 0x3f800000;
    auVar258._28_4_ = 0x3f800000;
    iVar118 = (int)uVar119;
    auVar123 = vmovshdup_avx(local_530);
    auVar128 = vsubps_avx(auVar123,local_530);
    auVar123 = vshufps_avx(local_530,local_530,0);
    local_8a0._16_16_ = auVar123;
    local_8a0._0_16_ = auVar123;
    auVar49 = vshufps_avx(auVar128,auVar128,0);
    _fStack_790 = auVar49;
    _local_7a0 = auVar49;
    fVar160 = auVar49._0_4_;
    fVar187 = auVar49._4_4_;
    fVar188 = auVar49._8_4_;
    fVar191 = auVar49._12_4_;
    fVar192 = auVar123._0_4_;
    auVar238._0_4_ = fVar192 + fVar160 * 0.0;
    fVar215 = auVar123._4_4_;
    auVar238._4_4_ = fVar215 + fVar187 * 0.14285715;
    fVar216 = auVar123._8_4_;
    auVar238._8_4_ = fVar216 + fVar188 * 0.2857143;
    fVar217 = auVar123._12_4_;
    auVar238._12_4_ = fVar217 + fVar191 * 0.42857146;
    auVar238._16_4_ = fVar192 + fVar160 * 0.5714286;
    auVar238._20_4_ = fVar215 + fVar187 * 0.71428573;
    auVar238._24_4_ = fVar216 + fVar188 * 0.8571429;
    auVar238._28_4_ = fVar217 + fVar191;
    auVar132 = vsubps_avx(auVar258,auVar238);
    fVar161 = auVar132._0_4_;
    fVar242 = auVar132._4_4_;
    fVar189 = auVar132._8_4_;
    fVar220 = auVar132._12_4_;
    fVar218 = auVar132._16_4_;
    fVar243 = auVar132._20_4_;
    fVar219 = auVar132._24_4_;
    fVar247 = fVar161 * fVar161 * fVar161;
    fVar263 = fVar242 * fVar242 * fVar242;
    fVar265 = fVar189 * fVar189 * fVar189;
    fVar287 = fVar220 * fVar220 * fVar220;
    fVar289 = fVar218 * fVar218 * fVar218;
    fVar311 = fVar243 * fVar243 * fVar243;
    fVar314 = fVar219 * fVar219 * fVar219;
    fVar317 = auVar238._0_4_ * auVar238._0_4_ * auVar238._0_4_;
    fVar327 = auVar238._4_4_ * auVar238._4_4_ * auVar238._4_4_;
    fVar328 = auVar238._8_4_ * auVar238._8_4_ * auVar238._8_4_;
    fVar330 = auVar238._12_4_ * auVar238._12_4_ * auVar238._12_4_;
    fVar332 = auVar238._16_4_ * auVar238._16_4_ * auVar238._16_4_;
    fVar334 = auVar238._20_4_ * auVar238._20_4_ * auVar238._20_4_;
    fVar336 = auVar238._24_4_ * auVar238._24_4_ * auVar238._24_4_;
    fVar221 = auVar284._28_4_;
    fVar244 = auVar238._0_4_ * fVar161;
    fVar245 = auVar238._4_4_ * fVar242;
    fVar246 = auVar238._8_4_ * fVar189;
    fVar262 = auVar238._12_4_ * fVar220;
    fVar269 = auVar238._16_4_ * fVar218;
    fVar285 = auVar238._20_4_ * fVar243;
    fVar286 = auVar238._24_4_ * fVar219;
    fVar261 = auVar390._28_4_ + auVar417._28_4_;
    fVar353 = auVar326._28_4_ + fVar221 + fVar261;
    fVar376 = fVar261 + auVar306._28_4_ + auVar400._28_4_ + auVar363._28_4_;
    fVar261 = fVar247 * 0.16666667;
    fVar264 = fVar263 * 0.16666667;
    fVar267 = fVar265 * 0.16666667;
    fVar288 = fVar287 * 0.16666667;
    fVar291 = fVar289 * 0.16666667;
    fVar312 = fVar311 * 0.16666667;
    fVar315 = fVar314 * 0.16666667;
    fVar338 = (fVar317 + fVar247 * 4.0 + fVar161 * fVar244 * 12.0 + auVar238._0_4_ * fVar244 * 6.0)
              * 0.16666667;
    fVar347 = (fVar327 + fVar263 * 4.0 + fVar242 * fVar245 * 12.0 + auVar238._4_4_ * fVar245 * 6.0)
              * 0.16666667;
    fVar348 = (fVar328 + fVar265 * 4.0 + fVar189 * fVar246 * 12.0 + auVar238._8_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar349 = (fVar330 + fVar287 * 4.0 + fVar220 * fVar262 * 12.0 + auVar238._12_4_ * fVar262 * 6.0)
              * 0.16666667;
    fVar350 = (fVar332 + fVar289 * 4.0 + fVar218 * fVar269 * 12.0 + auVar238._16_4_ * fVar269 * 6.0)
              * 0.16666667;
    fVar351 = (fVar334 + fVar311 * 4.0 + fVar243 * fVar285 * 12.0 + auVar238._20_4_ * fVar285 * 6.0)
              * 0.16666667;
    fVar352 = (fVar336 + fVar314 * 4.0 + fVar219 * fVar286 * 12.0 + auVar238._24_4_ * fVar286 * 6.0)
              * 0.16666667;
    fVar247 = (fVar317 * 4.0 + fVar247 + auVar238._0_4_ * fVar244 * 12.0 + fVar161 * fVar244 * 6.0)
              * 0.16666667;
    fVar263 = (fVar327 * 4.0 + fVar263 + auVar238._4_4_ * fVar245 * 12.0 + fVar242 * fVar245 * 6.0)
              * 0.16666667;
    fVar265 = (fVar328 * 4.0 + fVar265 + auVar238._8_4_ * fVar246 * 12.0 + fVar189 * fVar246 * 6.0)
              * 0.16666667;
    fVar287 = (fVar330 * 4.0 + fVar287 + auVar238._12_4_ * fVar262 * 12.0 + fVar220 * fVar262 * 6.0)
              * 0.16666667;
    fVar289 = (fVar332 * 4.0 + fVar289 + auVar238._16_4_ * fVar269 * 12.0 + fVar218 * fVar269 * 6.0)
              * 0.16666667;
    fVar311 = (fVar334 * 4.0 + fVar311 + auVar238._20_4_ * fVar285 * 12.0 + fVar243 * fVar285 * 6.0)
              * 0.16666667;
    fVar314 = (fVar336 * 4.0 + fVar314 + auVar238._24_4_ * fVar286 * 12.0 + fVar219 * fVar286 * 6.0)
              * 0.16666667;
    fVar317 = fVar317 * 0.16666667;
    fVar327 = fVar327 * 0.16666667;
    fVar328 = fVar328 * 0.16666667;
    fVar330 = fVar330 * 0.16666667;
    fVar332 = fVar332 * 0.16666667;
    fVar334 = fVar334 * 0.16666667;
    fVar336 = fVar336 * 0.16666667;
    fVar407 = auVar400._28_4_ + 12.0;
    fVar377 = fVar376 + 12.166667;
    fVar391 = fVar407 + 12.166667;
    local_860 = (float)local_1e0._0_4_ * fVar261 +
                (float)local_260._0_4_ * fVar338 +
                fVar317 * (float)local_3e0._0_4_ + fVar247 * (float)local_360._0_4_;
    fStack_85c = (float)local_1e0._4_4_ * fVar264 +
                 (float)local_260._4_4_ * fVar347 +
                 fVar327 * (float)local_3e0._4_4_ + fVar263 * (float)local_360._4_4_;
    fStack_858 = fStack_1d8 * fVar267 +
                 fStack_258 * fVar348 + fVar328 * fStack_3d8 + fVar265 * fStack_358;
    fStack_854 = fStack_1d4 * fVar288 +
                 fStack_254 * fVar349 + fVar330 * fStack_3d4 + fVar287 * fStack_354;
    fStack_850 = fStack_1d0 * fVar291 +
                 fStack_250 * fVar350 + fVar332 * fStack_3d0 + fVar289 * fStack_350;
    fStack_84c = fStack_1cc * fVar312 +
                 fStack_24c * fVar351 + fVar334 * fStack_3cc + fVar311 * fStack_34c;
    fStack_848 = fStack_1c8 * fVar315 +
                 fStack_248 * fVar352 + fVar336 * fStack_3c8 + fVar314 * fStack_348;
    fStack_844 = fVar353 + fVar377;
    fVar120 = (float)local_200._0_4_ * fVar261 +
              (float)local_280._0_4_ * fVar338 +
              fVar317 * (float)local_400._0_4_ + fVar247 * (float)local_380._0_4_;
    fVar147 = (float)local_200._4_4_ * fVar264 +
              (float)local_280._4_4_ * fVar347 +
              fVar327 * (float)local_400._4_4_ + fVar263 * (float)local_380._4_4_;
    fVar149 = fStack_1f8 * fVar267 +
              fStack_278 * fVar348 + fVar328 * fStack_3f8 + fVar265 * fStack_378;
    fVar151 = fStack_1f4 * fVar288 +
              fStack_274 * fVar349 + fVar330 * fStack_3f4 + fVar287 * fStack_374;
    fVar153 = fStack_1f0 * fVar291 +
              fStack_270 * fVar350 + fVar332 * fStack_3f0 + fVar289 * fStack_370;
    fVar155 = fStack_1ec * fVar312 +
              fStack_26c * fVar351 + fVar334 * fStack_3ec + fVar311 * fStack_36c;
    fVar157 = fStack_1e8 * fVar315 +
              fStack_268 * fVar352 + fVar336 * fStack_3e8 + fVar314 * fStack_368;
    fVar159 = fVar353 + fVar391;
    local_840 = (float)local_220._0_4_ * fVar261 +
                fVar338 * (float)local_320._0_4_ +
                fVar317 * (float)local_420._0_4_ + fVar247 * (float)local_3a0._0_4_;
    fStack_83c = (float)local_220._4_4_ * fVar264 +
                 fVar347 * (float)local_320._4_4_ +
                 fVar327 * (float)local_420._4_4_ + fVar263 * (float)local_3a0._4_4_;
    fStack_838 = fStack_218 * fVar267 +
                 fVar348 * fStack_318 + fVar328 * fStack_418 + fVar265 * fStack_398;
    aStack_834.w = fStack_214 * fVar288 +
                   fVar349 * fStack_314 + fVar330 * fStack_414 + fVar287 * fStack_394;
    fStack_830 = fStack_210 * fVar291 +
                 fVar350 * fStack_310 + fVar332 * fStack_410 + fVar289 * fStack_390;
    fStack_82c = fStack_20c * fVar312 +
                 fVar351 * fStack_30c + fVar334 * fStack_40c + fVar311 * fStack_38c;
    fStack_828 = fStack_208 * fVar315 +
                 fVar352 * fStack_308 + fVar336 * fStack_408 + fVar314 * fStack_388;
    fStack_824 = fVar353 + fVar407 + auVar417._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_240._0_4_ * fVar261 +
         fVar338 * (float)local_340._0_4_ +
         fVar247 * (float)local_3c0._0_4_ + local_440._0_4_ * fVar317;
    local_ae0._4_4_ =
         (float)local_240._4_4_ * fVar264 +
         fVar347 * (float)local_340._4_4_ +
         fVar263 * (float)local_3c0._4_4_ + local_440._4_4_ * fVar327;
    fStack_ad8 = fStack_238 * fVar267 +
                 fVar348 * fStack_338 + fVar265 * fStack_3b8 + local_440._8_4_ * fVar328;
    fStack_ad4 = fStack_234 * fVar288 +
                 fVar349 * fStack_334 + fVar287 * fStack_3b4 + local_440._12_4_ * fVar330;
    fStack_ad0 = fStack_230 * fVar291 +
                 fVar350 * fStack_330 + fVar289 * fStack_3b0 + local_440._16_4_ * fVar332;
    fStack_acc = fStack_22c * fVar312 +
                 fVar351 * fStack_32c + fVar311 * fStack_3ac + local_440._20_4_ * fVar334;
    fStack_ac8 = fStack_228 * fVar315 +
                 fVar352 * fStack_328 + fVar314 * fStack_3a8 + local_440._24_4_ * fVar336;
    fStack_ac4 = auVar306._28_4_ + fVar353 + fVar376 + auVar326._28_4_;
    auVar51._4_4_ = auVar238._4_4_ * -auVar238._4_4_;
    auVar51._0_4_ = auVar238._0_4_ * -auVar238._0_4_;
    auVar51._8_4_ = auVar238._8_4_ * -auVar238._8_4_;
    auVar51._12_4_ = auVar238._12_4_ * -auVar238._12_4_;
    auVar51._16_4_ = auVar238._16_4_ * -auVar238._16_4_;
    auVar51._20_4_ = auVar238._20_4_ * -auVar238._20_4_;
    auVar51._24_4_ = auVar238._24_4_ * -auVar238._24_4_;
    auVar51._28_4_ = auVar238._28_4_;
    auVar52._4_4_ = fVar245 * 4.0;
    auVar52._0_4_ = fVar244 * 4.0;
    auVar52._8_4_ = fVar246 * 4.0;
    auVar52._12_4_ = fVar262 * 4.0;
    auVar52._16_4_ = fVar269 * 4.0;
    auVar52._20_4_ = fVar285 * 4.0;
    auVar52._24_4_ = fVar286 * 4.0;
    auVar52._28_4_ = fVar221;
    auVar132 = vsubps_avx(auVar51,auVar52);
    fVar314 = fVar161 * -fVar161 * 0.5;
    fVar315 = fVar242 * -fVar242 * 0.5;
    fVar317 = fVar189 * -fVar189 * 0.5;
    fVar327 = fVar220 * -fVar220 * 0.5;
    fVar328 = fVar218 * -fVar218 * 0.5;
    fVar330 = fVar243 * -fVar243 * 0.5;
    fVar332 = fVar219 * -fVar219 * 0.5;
    fVar263 = auVar132._0_4_ * 0.5;
    fVar264 = auVar132._4_4_ * 0.5;
    fVar287 = auVar132._8_4_ * 0.5;
    fVar289 = auVar132._12_4_ * 0.5;
    fVar291 = auVar132._16_4_ * 0.5;
    fVar311 = auVar132._20_4_ * 0.5;
    fVar312 = auVar132._24_4_ * 0.5;
    fVar247 = (fVar161 * fVar161 + fVar244 * 4.0) * 0.5;
    fVar261 = (fVar242 * fVar242 + fVar245 * 4.0) * 0.5;
    fVar265 = (fVar189 * fVar189 + fVar246 * 4.0) * 0.5;
    fVar267 = (fVar220 * fVar220 + fVar262 * 4.0) * 0.5;
    fVar269 = (fVar218 * fVar218 + fVar269 * 4.0) * 0.5;
    fVar285 = (fVar243 * fVar243 + fVar285 * 4.0) * 0.5;
    fVar286 = (fVar219 * fVar219 + fVar286 * 4.0) * 0.5;
    fVar161 = auVar238._0_4_ * auVar238._0_4_ * 0.5;
    fVar242 = auVar238._4_4_ * auVar238._4_4_ * 0.5;
    fVar189 = auVar238._8_4_ * auVar238._8_4_ * 0.5;
    fVar220 = auVar238._12_4_ * auVar238._12_4_ * 0.5;
    fVar244 = auVar238._16_4_ * auVar238._16_4_ * 0.5;
    fVar245 = auVar238._20_4_ * auVar238._20_4_ * 0.5;
    fVar246 = auVar238._24_4_ * auVar238._24_4_ * 0.5;
    fVar288 = auVar132._28_4_ + fVar217 + fVar221 + fVar377 + fVar221;
    auVar123 = vpermilps_avx(ZEXT416((uint)(auVar128._0_4_ * 0.04761905)),0);
    fVar218 = auVar123._0_4_;
    fVar408 = fVar218 * ((float)local_1e0._0_4_ * fVar314 +
                        (float)local_260._0_4_ * fVar263 +
                        fVar247 * (float)local_360._0_4_ + fVar161 * (float)local_3e0._0_4_);
    fVar243 = auVar123._4_4_;
    fVar418 = fVar243 * ((float)local_1e0._4_4_ * fVar315 +
                        (float)local_260._4_4_ * fVar264 +
                        fVar261 * (float)local_360._4_4_ + fVar242 * (float)local_3e0._4_4_);
    local_980._4_4_ = fVar418;
    local_980._0_4_ = fVar408;
    fVar219 = auVar123._8_4_;
    fVar419 = fVar219 * (fStack_1d8 * fVar317 +
                        fStack_258 * fVar287 + fVar265 * fStack_358 + fVar189 * fStack_3d8);
    local_980._8_4_ = fVar419;
    fVar262 = auVar123._12_4_;
    fVar420 = fVar262 * (fStack_1d4 * fVar327 +
                        fStack_254 * fVar289 + fVar267 * fStack_354 + fVar220 * fStack_3d4);
    local_980._12_4_ = fVar420;
    fVar421 = fVar218 * (fStack_1d0 * fVar328 +
                        fStack_250 * fVar291 + fVar269 * fStack_350 + fVar244 * fStack_3d0);
    local_980._16_4_ = fVar421;
    fVar422 = fVar243 * (fStack_1cc * fVar330 +
                        fStack_24c * fVar311 + fVar285 * fStack_34c + fVar245 * fStack_3cc);
    local_980._20_4_ = fVar422;
    fVar423 = fVar219 * (fStack_1c8 * fVar332 +
                        fStack_248 * fVar312 + fVar286 * fStack_348 + fVar246 * fStack_3c8);
    local_980._24_4_ = fVar423;
    local_980._28_4_ = uStack_1c4;
    fVar392 = fVar218 * ((float)local_200._0_4_ * fVar314 +
                        (float)local_280._0_4_ * fVar263 +
                        fVar247 * (float)local_380._0_4_ + fVar161 * (float)local_400._0_4_);
    fVar401 = fVar243 * ((float)local_200._4_4_ * fVar315 +
                        (float)local_280._4_4_ * fVar264 +
                        fVar261 * (float)local_380._4_4_ + fVar242 * (float)local_400._4_4_);
    local_8c0._4_4_ = fVar401;
    local_8c0._0_4_ = fVar392;
    fVar402 = fVar219 * (fStack_1f8 * fVar317 +
                        fStack_278 * fVar287 + fVar265 * fStack_378 + fVar189 * fStack_3f8);
    local_8c0._8_4_ = fVar402;
    fVar403 = fVar262 * (fStack_1f4 * fVar327 +
                        fStack_274 * fVar289 + fVar267 * fStack_374 + fVar220 * fStack_3f4);
    local_8c0._12_4_ = fVar403;
    fVar404 = fVar218 * (fStack_1f0 * fVar328 +
                        fStack_270 * fVar291 + fVar269 * fStack_370 + fVar244 * fStack_3f0);
    local_8c0._16_4_ = fVar404;
    fVar405 = fVar243 * (fStack_1ec * fVar330 +
                        fStack_26c * fVar311 + fVar285 * fStack_36c + fVar245 * fStack_3ec);
    local_8c0._20_4_ = fVar405;
    fVar406 = fVar219 * (fStack_1e8 * fVar332 +
                        fStack_268 * fVar312 + fVar286 * fStack_368 + fVar246 * fStack_3e8);
    local_8c0._24_4_ = fVar406;
    local_8c0._28_4_ = uStack_224;
    fVar354 = fVar218 * ((float)local_220._0_4_ * fVar314 +
                        fVar161 * (float)local_420._0_4_ + fVar247 * (float)local_3a0._0_4_ +
                        fVar263 * (float)local_320._0_4_);
    fVar364 = fVar243 * ((float)local_220._4_4_ * fVar315 +
                        fVar242 * (float)local_420._4_4_ + fVar261 * (float)local_3a0._4_4_ +
                        fVar264 * (float)local_320._4_4_);
    local_9e0._4_4_ = fVar364;
    local_9e0._0_4_ = fVar354;
    fVar366 = fVar219 * (fStack_218 * fVar317 +
                        fVar189 * fStack_418 + fVar265 * fStack_398 + fVar287 * fStack_318);
    local_9e0._8_4_ = fVar366;
    fVar368 = fVar262 * (fStack_214 * fVar327 +
                        fVar220 * fStack_414 + fVar267 * fStack_394 + fVar289 * fStack_314);
    local_9e0._12_4_ = fVar368;
    fVar370 = fVar218 * (fStack_210 * fVar328 +
                        fVar244 * fStack_410 + fVar269 * fStack_390 + fVar291 * fStack_310);
    local_9e0._16_4_ = fVar370;
    fVar372 = fVar243 * (fStack_20c * fVar330 +
                        fVar245 * fStack_40c + fVar285 * fStack_38c + fVar311 * fStack_30c);
    local_9e0._20_4_ = fVar372;
    fVar374 = fVar219 * (fStack_208 * fVar332 +
                        fVar246 * fStack_408 + fVar286 * fStack_388 + fVar312 * fStack_308);
    local_9e0._24_4_ = fVar374;
    local_9e0._28_4_ = fVar377;
    fVar263 = fVar218 * ((float)local_240._0_4_ * fVar314 +
                        fVar263 * (float)local_340._0_4_ +
                        fVar161 * local_440._0_4_ + fVar247 * (float)local_3c0._0_4_);
    fVar264 = fVar243 * ((float)local_240._4_4_ * fVar315 +
                        fVar264 * (float)local_340._4_4_ +
                        fVar242 * local_440._4_4_ + fVar261 * (float)local_3c0._4_4_);
    auVar53._4_4_ = fVar264;
    auVar53._0_4_ = fVar263;
    fVar287 = fVar219 * (fStack_238 * fVar317 +
                        fVar287 * fStack_338 + fVar189 * local_440._8_4_ + fVar265 * fStack_3b8);
    auVar53._8_4_ = fVar287;
    fVar262 = fVar262 * (fStack_234 * fVar327 +
                        fVar289 * fStack_334 + fVar220 * local_440._12_4_ + fVar267 * fStack_3b4);
    auVar53._12_4_ = fVar262;
    fVar218 = fVar218 * (fStack_230 * fVar328 +
                        fVar291 * fStack_330 + fVar244 * local_440._16_4_ + fVar269 * fStack_3b0);
    auVar53._16_4_ = fVar218;
    fVar243 = fVar243 * (fStack_22c * fVar330 +
                        fVar311 * fStack_32c + fVar245 * local_440._20_4_ + fVar285 * fStack_3ac);
    auVar53._20_4_ = fVar243;
    fVar219 = fVar219 * (fStack_228 * fVar332 +
                        fVar312 * fStack_328 + fVar246 * local_440._24_4_ + fVar286 * fStack_3a8);
    auVar53._24_4_ = fVar219;
    auVar53._28_4_ = fVar288;
    auVar100._4_4_ = fVar147;
    auVar100._0_4_ = fVar120;
    auVar100._8_4_ = fVar149;
    auVar100._12_4_ = fVar151;
    auVar100._16_4_ = fVar153;
    auVar100._20_4_ = fVar155;
    auVar100._24_4_ = fVar157;
    auVar100._28_4_ = fVar159;
    auVar132 = vperm2f128_avx(auVar100,auVar100,1);
    auVar132 = vshufps_avx(auVar132,auVar100,0x30);
    local_880 = vshufps_avx(auVar100,auVar132,0x29);
    auVar105._4_4_ = fStack_83c;
    auVar105._0_4_ = local_840;
    auVar105._8_4_ = fStack_838;
    auVar105._12_4_ = aStack_834;
    auVar105._16_4_ = fStack_830;
    auVar105._20_4_ = fStack_82c;
    auVar105._24_4_ = fStack_828;
    auVar105._28_4_ = fStack_824;
    auVar132 = vperm2f128_avx(auVar105,auVar105,1);
    auVar132 = vshufps_avx(auVar132,auVar105,0x30);
    local_a40 = vshufps_avx(auVar105,auVar132,0x29);
    auVar186 = vsubps_avx(_local_ae0,auVar53);
    auVar132 = vperm2f128_avx(auVar186,auVar186,1);
    auVar132 = vshufps_avx(auVar132,auVar186,0x30);
    local_7c0 = vshufps_avx(auVar186,auVar132,0x29);
    local_600 = vsubps_avx(local_880,auVar100);
    local_5e0 = vsubps_avx(local_a40,auVar105);
    fVar161 = local_600._0_4_;
    fVar245 = local_600._4_4_;
    auVar54._4_4_ = fVar364 * fVar245;
    auVar54._0_4_ = fVar354 * fVar161;
    fVar267 = local_600._8_4_;
    auVar54._8_4_ = fVar366 * fVar267;
    fVar311 = local_600._12_4_;
    auVar54._12_4_ = fVar368 * fVar311;
    fVar332 = local_600._16_4_;
    auVar54._16_4_ = fVar370 * fVar332;
    fVar351 = local_600._20_4_;
    auVar54._20_4_ = fVar372 * fVar351;
    fVar42 = local_600._24_4_;
    auVar54._24_4_ = fVar374 * fVar42;
    auVar54._28_4_ = auVar186._28_4_;
    fVar242 = local_5e0._0_4_;
    fVar246 = local_5e0._4_4_;
    auVar55._4_4_ = fVar401 * fVar246;
    auVar55._0_4_ = fVar392 * fVar242;
    fVar269 = local_5e0._8_4_;
    auVar55._8_4_ = fVar402 * fVar269;
    fVar312 = local_5e0._12_4_;
    auVar55._12_4_ = fVar403 * fVar312;
    fVar334 = local_5e0._16_4_;
    auVar55._16_4_ = fVar404 * fVar334;
    fVar352 = local_5e0._20_4_;
    auVar55._20_4_ = fVar405 * fVar352;
    fVar43 = local_5e0._24_4_;
    auVar55._24_4_ = fVar406 * fVar43;
    auVar55._28_4_ = auVar132._28_4_;
    auVar37 = vsubps_avx(auVar55,auVar54);
    auVar102._4_4_ = fStack_85c;
    auVar102._0_4_ = local_860;
    auVar102._8_4_ = fStack_858;
    auVar102._12_4_ = fStack_854;
    auVar102._16_4_ = fStack_850;
    auVar102._20_4_ = fStack_84c;
    auVar102._24_4_ = fStack_848;
    auVar102._28_4_ = fStack_844;
    auVar132 = vperm2f128_avx(auVar102,auVar102,1);
    auVar132 = vshufps_avx(auVar132,auVar102,0x30);
    local_9c0 = vshufps_avx(auVar102,auVar132,0x29);
    _local_720 = vsubps_avx(local_9c0,auVar102);
    auVar56._4_4_ = fVar418 * fVar246;
    auVar56._0_4_ = fVar408 * fVar242;
    auVar56._8_4_ = fVar419 * fVar269;
    auVar56._12_4_ = fVar420 * fVar312;
    auVar56._16_4_ = fVar421 * fVar334;
    auVar56._20_4_ = fVar422 * fVar352;
    auVar56._24_4_ = fVar423 * fVar43;
    auVar56._28_4_ = local_9c0._28_4_;
    fVar189 = local_720._0_4_;
    fVar247 = local_720._4_4_;
    auVar57._4_4_ = fVar364 * fVar247;
    auVar57._0_4_ = fVar354 * fVar189;
    fVar285 = local_720._8_4_;
    auVar57._8_4_ = fVar366 * fVar285;
    fVar314 = local_720._12_4_;
    auVar57._12_4_ = fVar368 * fVar314;
    fVar336 = local_720._16_4_;
    auVar57._16_4_ = fVar370 * fVar336;
    fVar353 = local_720._20_4_;
    auVar57._20_4_ = fVar372 * fVar353;
    fVar44 = local_720._24_4_;
    auVar57._24_4_ = fVar374 * fVar44;
    auVar57._28_4_ = local_880._28_4_;
    auVar38 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ = fVar401 * fVar247;
    auVar58._0_4_ = fVar392 * fVar189;
    auVar58._8_4_ = fVar402 * fVar285;
    auVar58._12_4_ = fVar403 * fVar314;
    auVar58._16_4_ = fVar404 * fVar336;
    auVar58._20_4_ = fVar405 * fVar353;
    auVar58._24_4_ = fVar406 * fVar44;
    auVar58._28_4_ = local_880._28_4_;
    auVar59._4_4_ = fVar418 * fVar245;
    auVar59._0_4_ = fVar408 * fVar161;
    auVar59._8_4_ = fVar419 * fVar267;
    auVar59._12_4_ = fVar420 * fVar311;
    auVar59._16_4_ = fVar421 * fVar332;
    auVar59._20_4_ = fVar422 * fVar351;
    auVar59._24_4_ = fVar423 * fVar42;
    auVar59._28_4_ = fVar391;
    auVar39 = vsubps_avx(auVar59,auVar58);
    fVar221 = auVar39._28_4_;
    auVar177._0_4_ = fVar189 * fVar189 + fVar161 * fVar161 + fVar242 * fVar242;
    auVar177._4_4_ = fVar247 * fVar247 + fVar245 * fVar245 + fVar246 * fVar246;
    auVar177._8_4_ = fVar285 * fVar285 + fVar267 * fVar267 + fVar269 * fVar269;
    auVar177._12_4_ = fVar314 * fVar314 + fVar311 * fVar311 + fVar312 * fVar312;
    auVar177._16_4_ = fVar336 * fVar336 + fVar332 * fVar332 + fVar334 * fVar334;
    auVar177._20_4_ = fVar353 * fVar353 + fVar351 * fVar351 + fVar352 * fVar352;
    auVar177._24_4_ = fVar44 * fVar44 + fVar42 * fVar42 + fVar43 * fVar43;
    auVar177._28_4_ = fVar221 + fVar221 + auVar37._28_4_;
    auVar132 = vrcpps_avx(auVar177);
    fVar289 = auVar132._0_4_;
    fVar291 = auVar132._4_4_;
    auVar60._4_4_ = fVar291 * auVar177._4_4_;
    auVar60._0_4_ = fVar289 * auVar177._0_4_;
    fVar317 = auVar132._8_4_;
    auVar60._8_4_ = fVar317 * auVar177._8_4_;
    fVar327 = auVar132._12_4_;
    auVar60._12_4_ = fVar327 * auVar177._12_4_;
    fVar328 = auVar132._16_4_;
    auVar60._16_4_ = fVar328 * auVar177._16_4_;
    fVar330 = auVar132._20_4_;
    auVar60._20_4_ = fVar330 * auVar177._20_4_;
    fVar347 = auVar132._24_4_;
    auVar60._24_4_ = fVar347 * auVar177._24_4_;
    auVar60._28_4_ = fVar391;
    auVar137._8_4_ = 0x3f800000;
    auVar137._0_8_ = 0x3f8000003f800000;
    auVar137._12_4_ = 0x3f800000;
    auVar137._16_4_ = 0x3f800000;
    auVar137._20_4_ = 0x3f800000;
    auVar137._24_4_ = 0x3f800000;
    auVar137._28_4_ = 0x3f800000;
    auVar178 = vsubps_avx(auVar137,auVar60);
    fVar289 = auVar178._0_4_ * fVar289 + fVar289;
    fVar291 = auVar178._4_4_ * fVar291 + fVar291;
    fVar317 = auVar178._8_4_ * fVar317 + fVar317;
    fVar327 = auVar178._12_4_ * fVar327 + fVar327;
    fVar328 = auVar178._16_4_ * fVar328 + fVar328;
    fVar330 = auVar178._20_4_ * fVar330 + fVar330;
    fVar347 = auVar178._24_4_ * fVar347 + fVar347;
    auVar186 = vperm2f128_avx(local_8c0,local_8c0,1);
    auVar186 = vshufps_avx(auVar186,local_8c0,0x30);
    local_9a0 = vshufps_avx(local_8c0,auVar186,0x29);
    auVar186 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar186 = vshufps_avx(auVar186,local_9e0,0x30);
    local_820 = vshufps_avx(local_9e0,auVar186,0x29);
    fVar220 = local_820._0_4_;
    fVar261 = local_820._4_4_;
    auVar61._4_4_ = fVar245 * fVar261;
    auVar61._0_4_ = fVar161 * fVar220;
    fVar286 = local_820._8_4_;
    auVar61._8_4_ = fVar267 * fVar286;
    fVar315 = local_820._12_4_;
    auVar61._12_4_ = fVar311 * fVar315;
    fVar338 = local_820._16_4_;
    auVar61._16_4_ = fVar332 * fVar338;
    fVar376 = local_820._20_4_;
    auVar61._20_4_ = fVar351 * fVar376;
    fVar45 = local_820._24_4_;
    auVar61._24_4_ = fVar42 * fVar45;
    auVar61._28_4_ = auVar186._28_4_;
    fVar424 = local_9a0._0_4_;
    fVar430 = local_9a0._4_4_;
    auVar62._4_4_ = fVar430 * fVar246;
    auVar62._0_4_ = fVar424 * fVar242;
    fVar431 = local_9a0._8_4_;
    auVar62._8_4_ = fVar431 * fVar269;
    fVar432 = local_9a0._12_4_;
    auVar62._12_4_ = fVar432 * fVar312;
    fVar433 = local_9a0._16_4_;
    auVar62._16_4_ = fVar433 * fVar334;
    fVar434 = local_9a0._20_4_;
    auVar62._20_4_ = fVar434 * fVar352;
    fVar435 = local_9a0._24_4_;
    auVar62._24_4_ = fVar435 * fVar43;
    auVar62._28_4_ = uStack_224;
    auVar205 = vsubps_avx(auVar62,auVar61);
    auVar186 = vperm2f128_avx(local_980,local_980,1);
    auVar186 = vshufps_avx(auVar186,local_980,0x30);
    local_8e0 = vshufps_avx(local_980,auVar186,0x29);
    fVar355 = local_8e0._0_4_;
    fVar365 = local_8e0._4_4_;
    auVar63._4_4_ = fVar365 * fVar246;
    auVar63._0_4_ = fVar355 * fVar242;
    fVar367 = local_8e0._8_4_;
    auVar63._8_4_ = fVar367 * fVar269;
    fVar369 = local_8e0._12_4_;
    auVar63._12_4_ = fVar369 * fVar312;
    fVar371 = local_8e0._16_4_;
    auVar63._16_4_ = fVar371 * fVar334;
    fVar373 = local_8e0._20_4_;
    auVar63._20_4_ = fVar373 * fVar352;
    fVar375 = local_8e0._24_4_;
    auVar63._24_4_ = fVar375 * fVar43;
    auVar63._28_4_ = auVar186._28_4_;
    auVar41 = local_820;
    auVar64._4_4_ = fVar261 * fVar247;
    auVar64._0_4_ = fVar220 * fVar189;
    auVar64._8_4_ = fVar286 * fVar285;
    auVar64._12_4_ = fVar315 * fVar314;
    auVar64._16_4_ = fVar338 * fVar336;
    auVar64._20_4_ = fVar376 * fVar353;
    auVar64._24_4_ = fVar45 * fVar44;
    auVar64._28_4_ = uStack_1c4;
    auVar40 = vsubps_avx(auVar64,auVar63);
    auVar65._4_4_ = fVar430 * fVar247;
    auVar65._0_4_ = fVar424 * fVar189;
    auVar65._8_4_ = fVar431 * fVar285;
    auVar65._12_4_ = fVar432 * fVar314;
    auVar65._16_4_ = fVar433 * fVar336;
    auVar65._20_4_ = fVar434 * fVar353;
    auVar65._24_4_ = fVar435 * fVar44;
    auVar65._28_4_ = uStack_1c4;
    auVar66._4_4_ = fVar365 * fVar245;
    auVar66._0_4_ = fVar355 * fVar161;
    auVar66._8_4_ = fVar367 * fVar267;
    auVar66._12_4_ = fVar369 * fVar311;
    auVar66._16_4_ = fVar371 * fVar332;
    auVar66._20_4_ = fVar373 * fVar351;
    fVar244 = local_9a0._28_4_;
    auVar66._24_4_ = fVar375 * fVar42;
    auVar66._28_4_ = fVar244;
    auVar186 = vsubps_avx(auVar66,auVar65);
    fVar265 = auVar186._28_4_;
    auVar67._4_4_ =
         (auVar37._4_4_ * auVar37._4_4_ +
         auVar38._4_4_ * auVar38._4_4_ + auVar39._4_4_ * auVar39._4_4_) * fVar291;
    auVar67._0_4_ =
         (auVar37._0_4_ * auVar37._0_4_ +
         auVar38._0_4_ * auVar38._0_4_ + auVar39._0_4_ * auVar39._0_4_) * fVar289;
    auVar67._8_4_ =
         (auVar37._8_4_ * auVar37._8_4_ +
         auVar38._8_4_ * auVar38._8_4_ + auVar39._8_4_ * auVar39._8_4_) * fVar317;
    auVar67._12_4_ =
         (auVar37._12_4_ * auVar37._12_4_ +
         auVar38._12_4_ * auVar38._12_4_ + auVar39._12_4_ * auVar39._12_4_) * fVar327;
    auVar67._16_4_ =
         (auVar37._16_4_ * auVar37._16_4_ +
         auVar38._16_4_ * auVar38._16_4_ + auVar39._16_4_ * auVar39._16_4_) * fVar328;
    auVar67._20_4_ =
         (auVar37._20_4_ * auVar37._20_4_ +
         auVar38._20_4_ * auVar38._20_4_ + auVar39._20_4_ * auVar39._20_4_) * fVar330;
    auVar67._24_4_ =
         (auVar37._24_4_ * auVar37._24_4_ +
         auVar38._24_4_ * auVar38._24_4_ + auVar39._24_4_ * auVar39._24_4_) * fVar347;
    auVar67._28_4_ = auVar37._28_4_ + auVar38._28_4_ + fVar221;
    auVar68._4_4_ =
         (auVar205._4_4_ * auVar205._4_4_ +
         auVar40._4_4_ * auVar40._4_4_ + auVar186._4_4_ * auVar186._4_4_) * fVar291;
    auVar68._0_4_ =
         (auVar205._0_4_ * auVar205._0_4_ +
         auVar40._0_4_ * auVar40._0_4_ + auVar186._0_4_ * auVar186._0_4_) * fVar289;
    auVar68._8_4_ =
         (auVar205._8_4_ * auVar205._8_4_ +
         auVar40._8_4_ * auVar40._8_4_ + auVar186._8_4_ * auVar186._8_4_) * fVar317;
    auVar68._12_4_ =
         (auVar205._12_4_ * auVar205._12_4_ +
         auVar40._12_4_ * auVar40._12_4_ + auVar186._12_4_ * auVar186._12_4_) * fVar327;
    auVar68._16_4_ =
         (auVar205._16_4_ * auVar205._16_4_ +
         auVar40._16_4_ * auVar40._16_4_ + auVar186._16_4_ * auVar186._16_4_) * fVar328;
    auVar68._20_4_ =
         (auVar205._20_4_ * auVar205._20_4_ +
         auVar40._20_4_ * auVar40._20_4_ + auVar186._20_4_ * auVar186._20_4_) * fVar330;
    auVar68._24_4_ =
         (auVar205._24_4_ * auVar205._24_4_ +
         auVar40._24_4_ * auVar40._24_4_ + auVar186._24_4_ * auVar186._24_4_) * fVar347;
    auVar68._28_4_ = auVar178._28_4_ + auVar132._28_4_;
    auVar132 = vmaxps_avx(auVar67,auVar68);
    auVar186 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar186 = vshufps_avx(auVar186,_local_ae0,0x30);
    _local_7e0 = vshufps_avx(_local_ae0,auVar186,0x29);
    local_6c0._0_4_ = (float)local_ae0._0_4_ + fVar263;
    local_6c0._4_4_ = (float)local_ae0._4_4_ + fVar264;
    fStack_6b8 = fStack_ad8 + fVar287;
    fStack_6b4 = fStack_ad4 + fVar262;
    fStack_6b0 = fStack_ad0 + fVar218;
    fStack_6ac = fStack_acc + fVar243;
    fStack_6a8 = fStack_ac8 + fVar219;
    register0x0000121c = fStack_ac4 + fVar288;
    auVar186 = vmaxps_avx(_local_ae0,_local_6c0);
    auVar37 = vmaxps_avx(local_7c0,_local_7e0);
    auVar186 = vmaxps_avx(auVar186,auVar37);
    auVar37 = vrsqrtps_avx(auVar177);
    fVar221 = auVar37._0_4_;
    fVar218 = auVar37._4_4_;
    fVar243 = auVar37._8_4_;
    fVar219 = auVar37._12_4_;
    fVar262 = auVar37._16_4_;
    fVar263 = auVar37._20_4_;
    fVar264 = auVar37._24_4_;
    auVar69._4_4_ = fVar218 * fVar218 * fVar218 * auVar177._4_4_ * 0.5;
    auVar69._0_4_ = fVar221 * fVar221 * fVar221 * auVar177._0_4_ * 0.5;
    auVar69._8_4_ = fVar243 * fVar243 * fVar243 * auVar177._8_4_ * 0.5;
    auVar69._12_4_ = fVar219 * fVar219 * fVar219 * auVar177._12_4_ * 0.5;
    auVar69._16_4_ = fVar262 * fVar262 * fVar262 * auVar177._16_4_ * 0.5;
    auVar69._20_4_ = fVar263 * fVar263 * fVar263 * auVar177._20_4_ * 0.5;
    auVar69._24_4_ = fVar264 * fVar264 * fVar264 * auVar177._24_4_ * 0.5;
    auVar69._28_4_ = auVar177._28_4_;
    auVar70._4_4_ = fVar218 * 1.5;
    auVar70._0_4_ = fVar221 * 1.5;
    auVar70._8_4_ = fVar243 * 1.5;
    auVar70._12_4_ = fVar219 * 1.5;
    auVar70._16_4_ = fVar262 * 1.5;
    auVar70._20_4_ = fVar263 * 1.5;
    auVar70._24_4_ = fVar264 * 1.5;
    auVar70._28_4_ = auVar37._28_4_;
    auVar38 = vsubps_avx(auVar70,auVar69);
    auVar101._4_4_ = fVar147;
    auVar101._0_4_ = fVar120;
    auVar101._8_4_ = fVar149;
    auVar101._12_4_ = fVar151;
    auVar101._16_4_ = fVar153;
    auVar101._20_4_ = fVar155;
    auVar101._24_4_ = fVar157;
    auVar101._28_4_ = fVar159;
    _local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
    local_780 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
    fVar218 = local_780._0_4_;
    fVar262 = local_780._4_4_;
    fVar287 = local_780._8_4_;
    fVar317 = local_780._12_4_;
    fVar347 = local_780._16_4_;
    fVar377 = local_780._20_4_;
    fVar46 = local_780._24_4_;
    auVar36._4_4_ = fStack_59c;
    auVar36._0_4_ = local_5a0;
    auVar36._8_4_ = fStack_598;
    auVar36._12_4_ = fStack_594;
    auVar36._16_4_ = fStack_590;
    auVar36._20_4_ = fStack_58c;
    auVar36._24_4_ = fStack_588;
    auVar36._28_4_ = fStack_584;
    fVar243 = local_a60._0_4_;
    fVar263 = local_a60._4_4_;
    fVar288 = local_a60._8_4_;
    fVar327 = local_a60._12_4_;
    fVar348 = local_a60._16_4_;
    fVar391 = local_a60._20_4_;
    fVar47 = local_a60._24_4_;
    auVar39 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
    fVar219 = auVar39._0_4_;
    fVar264 = auVar39._4_4_;
    fVar289 = auVar39._8_4_;
    fVar328 = auVar39._12_4_;
    fVar349 = auVar39._16_4_;
    fVar407 = auVar39._20_4_;
    fVar48 = auVar39._24_4_;
    auVar382._0_4_ = local_580 * fVar219 + local_5a0 * fVar243 + local_5c0 * fVar218;
    auVar382._4_4_ = fStack_57c * fVar264 + fStack_59c * fVar263 + fStack_5bc * fVar262;
    auVar382._8_4_ = fStack_578 * fVar289 + fStack_598 * fVar288 + fStack_5b8 * fVar287;
    auVar382._12_4_ = fStack_574 * fVar328 + fStack_594 * fVar327 + fStack_5b4 * fVar317;
    auVar382._16_4_ = fStack_570 * fVar349 + fStack_590 * fVar348 + fStack_5b0 * fVar347;
    auVar382._20_4_ = fStack_56c * fVar407 + fStack_58c * fVar391 + fStack_5ac * fVar377;
    auVar382._24_4_ = fStack_568 * fVar48 + fStack_588 * fVar47 + fStack_5a8 * fVar46;
    auVar382._28_4_ = fVar265 + auVar205._28_4_ + auVar40._28_4_ + fVar265 + auVar37._28_4_;
    auVar413._0_4_ = fVar219 * fVar219 + fVar243 * fVar243 + fVar218 * fVar218;
    auVar413._4_4_ = fVar264 * fVar264 + fVar263 * fVar263 + fVar262 * fVar262;
    auVar413._8_4_ = fVar289 * fVar289 + fVar288 * fVar288 + fVar287 * fVar287;
    auVar413._12_4_ = fVar328 * fVar328 + fVar327 * fVar327 + fVar317 * fVar317;
    auVar413._16_4_ = fVar349 * fVar349 + fVar348 * fVar348 + fVar347 * fVar347;
    auVar413._20_4_ = fVar407 * fVar407 + fVar391 * fVar391 + fVar377 * fVar377;
    auVar413._24_4_ = fVar48 * fVar48 + fVar47 * fVar47 + fVar46 * fVar46;
    auVar413._28_4_ = fVar244 + fVar244 + fVar265;
    fVar244 = auVar38._0_4_;
    fVar265 = auVar38._4_4_;
    fVar291 = auVar38._8_4_;
    fVar330 = auVar38._12_4_;
    fVar350 = auVar38._16_4_;
    fVar290 = auVar38._20_4_;
    fVar292 = auVar38._24_4_;
    fVar221 = local_5e0._28_4_;
    fVar294 = auVar38._28_4_;
    local_620._0_4_ =
         local_580 * fVar189 * fVar244 +
         local_5a0 * fVar161 * fVar244 + fVar242 * fVar244 * local_5c0;
    local_620._4_4_ =
         fStack_57c * fVar247 * fVar265 +
         fStack_59c * fVar245 * fVar265 + fVar246 * fVar265 * fStack_5bc;
    fStack_618 = fStack_578 * fVar285 * fVar291 +
                 fStack_598 * fVar267 * fVar291 + fVar269 * fVar291 * fStack_5b8;
    fStack_614 = fStack_574 * fVar314 * fVar330 +
                 fStack_594 * fVar311 * fVar330 + fVar312 * fVar330 * fStack_5b4;
    fStack_610 = fStack_570 * fVar336 * fVar350 +
                 fStack_590 * fVar332 * fVar350 + fVar334 * fVar350 * fStack_5b0;
    fStack_60c = fStack_56c * fVar353 * fVar290 +
                 fStack_58c * fVar351 * fVar290 + fVar352 * fVar290 * fStack_5ac;
    fStack_608 = fStack_568 * fVar44 * fVar292 +
                 fStack_588 * fVar42 * fVar292 + fVar43 * fVar292 * fStack_5a8;
    fVar293 = fVar294 + fVar221 + 0.0;
    local_900._0_4_ =
         fVar219 * fVar189 * fVar244 + fVar161 * fVar244 * fVar243 + fVar242 * fVar244 * fVar218;
    local_900._4_4_ =
         fVar264 * fVar247 * fVar265 + fVar245 * fVar265 * fVar263 + fVar246 * fVar265 * fVar262;
    fStack_8f8 = fVar289 * fVar285 * fVar291 +
                 fVar267 * fVar291 * fVar288 + fVar269 * fVar291 * fVar287;
    fStack_8f4 = fVar328 * fVar314 * fVar330 +
                 fVar311 * fVar330 * fVar327 + fVar312 * fVar330 * fVar317;
    fStack_8f0 = fVar349 * fVar336 * fVar350 +
                 fVar332 * fVar350 * fVar348 + fVar334 * fVar350 * fVar347;
    fStack_8ec = fVar407 * fVar353 * fVar290 +
                 fVar351 * fVar290 * fVar391 + fVar352 * fVar290 * fVar377;
    fStack_8e8 = fVar48 * fVar44 * fVar292 + fVar42 * fVar292 * fVar47 + fVar43 * fVar292 * fVar46;
    fStack_8e4 = fVar221 + fVar293;
    auVar71._4_4_ = (float)local_900._4_4_ * (float)local_620._4_4_;
    auVar71._0_4_ = (float)local_900._0_4_ * (float)local_620._0_4_;
    auVar71._8_4_ = fStack_8f8 * fStack_618;
    auVar71._12_4_ = fStack_8f4 * fStack_614;
    auVar71._16_4_ = fStack_8f0 * fStack_610;
    auVar71._20_4_ = fStack_8ec * fStack_60c;
    auVar71._24_4_ = fStack_8e8 * fStack_608;
    auVar71._28_4_ = fVar293;
    auVar38 = vsubps_avx(auVar382,auVar71);
    auVar72._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
    auVar72._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
    auVar72._8_4_ = fStack_8f8 * fStack_8f8;
    auVar72._12_4_ = fStack_8f4 * fStack_8f4;
    auVar72._16_4_ = fStack_8f0 * fStack_8f0;
    auVar72._20_4_ = fStack_8ec * fStack_8ec;
    auVar72._24_4_ = fStack_8e8 * fStack_8e8;
    auVar72._28_4_ = fVar221;
    local_660 = vsubps_avx(auVar413,auVar72);
    auVar37 = vsqrtps_avx(auVar132);
    local_920 = auVar37;
    local_920._8_24_ = auVar37._8_24_;
    fVar293 = (auVar186._0_4_ + auVar37._0_4_) * 1.0000002;
    fVar148 = (auVar186._4_4_ + auVar37._4_4_) * 1.0000002;
    fVar150 = (auVar186._8_4_ + auVar37._8_4_) * 1.0000002;
    fVar152 = (auVar186._12_4_ + auVar37._12_4_) * 1.0000002;
    fVar154 = (auVar186._16_4_ + auVar37._16_4_) * 1.0000002;
    fVar156 = (auVar186._20_4_ + auVar37._20_4_) * 1.0000002;
    fVar158 = (auVar186._24_4_ + auVar37._24_4_) * 1.0000002;
    auVar73._4_4_ = fVar148 * fVar148;
    auVar73._0_4_ = fVar293 * fVar293;
    auVar73._8_4_ = fVar150 * fVar150;
    auVar73._12_4_ = fVar152 * fVar152;
    auVar73._16_4_ = fVar154 * fVar154;
    auVar73._20_4_ = fVar156 * fVar156;
    auVar73._24_4_ = fVar158 * fVar158;
    auVar73._28_4_ = auVar186._28_4_ + auVar37._28_4_;
    fVar293 = auVar38._0_4_ + auVar38._0_4_;
    fVar148 = auVar38._4_4_ + auVar38._4_4_;
    local_300._0_8_ = CONCAT44(fVar148,fVar293);
    local_300._8_4_ = auVar38._8_4_ + auVar38._8_4_;
    local_300._12_4_ = auVar38._12_4_ + auVar38._12_4_;
    local_300._16_4_ = auVar38._16_4_ + auVar38._16_4_;
    local_300._20_4_ = auVar38._20_4_ + auVar38._20_4_;
    local_300._24_4_ = auVar38._24_4_ + auVar38._24_4_;
    local_300._28_4_ = auVar38._28_4_ + auVar38._28_4_;
    auVar186 = vsubps_avx(local_660,auVar73);
    local_2e0._4_4_ = (float)local_620._4_4_ * (float)local_620._4_4_;
    local_2e0._0_4_ = (float)local_620._0_4_ * (float)local_620._0_4_;
    local_2e0._8_4_ = fStack_618 * fStack_618;
    local_2e0._12_4_ = fStack_614 * fStack_614;
    local_2e0._16_4_ = fStack_610 * fStack_610;
    local_2e0._20_4_ = fStack_60c * fStack_60c;
    local_2e0._24_4_ = fStack_608 * fStack_608;
    local_2e0._28_4_ = fStack_564;
    local_4a0 = vsubps_avx(local_2a0,local_2e0);
    local_6e0._4_4_ = fVar148 * fVar148;
    local_6e0._0_4_ = fVar293 * fVar293;
    fStack_6d8 = local_300._8_4_ * local_300._8_4_;
    fStack_6d4 = local_300._12_4_ * local_300._12_4_;
    fStack_6d0 = local_300._16_4_ * local_300._16_4_;
    fStack_6cc = local_300._20_4_ * local_300._20_4_;
    fStack_6c8 = local_300._24_4_ * local_300._24_4_;
    unique0x10013864 = fVar294;
    fVar150 = local_4a0._0_4_;
    local_700._0_4_ = fVar150 * 4.0;
    fVar152 = local_4a0._4_4_;
    local_700._4_4_ = fVar152 * 4.0;
    fVar154 = local_4a0._8_4_;
    fStack_6f8 = fVar154 * 4.0;
    fVar156 = local_4a0._12_4_;
    fStack_6f4 = fVar156 * 4.0;
    fVar158 = local_4a0._16_4_;
    fStack_6f0 = fVar158 * 4.0;
    fVar266 = local_4a0._20_4_;
    fStack_6ec = fVar266 * 4.0;
    fVar268 = local_4a0._24_4_;
    fStack_6e8 = fVar268 * 4.0;
    uStack_6e4 = 0x40800000;
    auVar74._4_4_ = auVar186._4_4_ * (float)local_700._4_4_;
    auVar74._0_4_ = auVar186._0_4_ * (float)local_700._0_4_;
    auVar74._8_4_ = auVar186._8_4_ * fStack_6f8;
    auVar74._12_4_ = auVar186._12_4_ * fStack_6f4;
    auVar74._16_4_ = auVar186._16_4_ * fStack_6f0;
    auVar74._20_4_ = auVar186._20_4_ * fStack_6ec;
    auVar74._24_4_ = auVar186._24_4_ * fStack_6e8;
    auVar74._28_4_ = 0x40800000;
    auVar38 = vsubps_avx(_local_6e0,auVar74);
    auVar390 = ZEXT3264(auVar38);
    auVar132 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,5);
    fStack_604 = fVar294 + fVar221 + 0.0;
    fVar221 = local_4a0._28_4_;
    if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0x7f,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar132 >> 0xbf,0) == '\0') &&
        (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar132[0x1f])
    {
      auVar427._8_4_ = 0x7f800000;
      auVar427._0_8_ = 0x7f8000007f800000;
      auVar427._12_4_ = 0x7f800000;
      auVar427._16_4_ = 0x7f800000;
      auVar427._20_4_ = 0x7f800000;
      auVar427._24_4_ = 0x7f800000;
      auVar427._28_4_ = 0x7f800000;
      auVar398._8_4_ = 0xff800000;
      auVar398._0_8_ = 0xff800000ff800000;
      auVar398._12_4_ = 0xff800000;
      auVar398._16_4_ = 0xff800000;
      auVar398._20_4_ = 0xff800000;
      auVar398._24_4_ = 0xff800000;
      auVar398._28_4_ = 0xff800000;
      auVar301 = local_2a0;
      auVar35 = _local_6e0;
    }
    else {
      auVar36 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,5);
      auVar178 = vsqrtps_avx(auVar38);
      auVar300._0_4_ = fVar150 + fVar150;
      auVar300._4_4_ = fVar152 + fVar152;
      auVar300._8_4_ = fVar154 + fVar154;
      auVar300._12_4_ = fVar156 + fVar156;
      auVar300._16_4_ = fVar158 + fVar158;
      auVar300._20_4_ = fVar266 + fVar266;
      auVar300._24_4_ = fVar268 + fVar268;
      auVar300._28_4_ = fVar221 + fVar221;
      auVar38 = vrcpps_avx(auVar300);
      fVar294 = auVar38._0_4_;
      fVar307 = auVar38._4_4_;
      auVar75._4_4_ = auVar300._4_4_ * fVar307;
      auVar75._0_4_ = auVar300._0_4_ * fVar294;
      fVar308 = auVar38._8_4_;
      auVar75._8_4_ = auVar300._8_4_ * fVar308;
      fVar309 = auVar38._12_4_;
      auVar75._12_4_ = auVar300._12_4_ * fVar309;
      fVar310 = auVar38._16_4_;
      auVar75._16_4_ = auVar300._16_4_ * fVar310;
      fVar313 = auVar38._20_4_;
      auVar75._20_4_ = auVar300._20_4_ * fVar313;
      fVar316 = auVar38._24_4_;
      auVar75._24_4_ = auVar300._24_4_ * fVar316;
      auVar75._28_4_ = auVar300._28_4_;
      auVar383._8_4_ = 0x3f800000;
      auVar383._0_8_ = 0x3f8000003f800000;
      auVar383._12_4_ = 0x3f800000;
      auVar383._16_4_ = 0x3f800000;
      auVar383._20_4_ = 0x3f800000;
      auVar383._24_4_ = 0x3f800000;
      auVar383._28_4_ = 0x3f800000;
      auVar205 = vsubps_avx(auVar383,auVar75);
      fVar294 = fVar294 + fVar294 * auVar205._0_4_;
      fVar307 = fVar307 + fVar307 * auVar205._4_4_;
      fVar308 = fVar308 + fVar308 * auVar205._8_4_;
      fVar309 = fVar309 + fVar309 * auVar205._12_4_;
      fVar310 = fVar310 + fVar310 * auVar205._16_4_;
      fVar313 = fVar313 + fVar313 * auVar205._20_4_;
      fVar316 = fVar316 + fVar316 * auVar205._24_4_;
      auVar323._0_8_ = CONCAT44(fVar148,fVar293) ^ 0x8000000080000000;
      auVar323._8_4_ = -local_300._8_4_;
      auVar323._12_4_ = -local_300._12_4_;
      auVar323._16_4_ = -local_300._16_4_;
      auVar323._20_4_ = -local_300._20_4_;
      auVar323._24_4_ = -local_300._24_4_;
      auVar323._28_4_ = -local_300._28_4_;
      auVar40 = vsubps_avx(auVar323,auVar178);
      fVar293 = auVar40._0_4_ * fVar294;
      fVar148 = auVar40._4_4_ * fVar307;
      auVar35._4_4_ = fVar148;
      auVar35._0_4_ = fVar293;
      fVar329 = auVar40._8_4_ * fVar308;
      auVar35._8_4_ = fVar329;
      fVar331 = auVar40._12_4_ * fVar309;
      auVar35._12_4_ = fVar331;
      fVar333 = auVar40._16_4_ * fVar310;
      auVar35._16_4_ = fVar333;
      fVar335 = auVar40._20_4_ * fVar313;
      auVar35._20_4_ = fVar335;
      fVar337 = auVar40._24_4_ * fVar316;
      auVar35._24_4_ = fVar337;
      auVar35._28_4_ = auVar40._28_4_;
      auVar178 = vsubps_avx(auVar178,local_300);
      fVar294 = auVar178._0_4_ * fVar294;
      fVar307 = auVar178._4_4_ * fVar307;
      auVar76._4_4_ = fVar307;
      auVar76._0_4_ = fVar294;
      fVar308 = auVar178._8_4_ * fVar308;
      auVar76._8_4_ = fVar308;
      fVar309 = auVar178._12_4_ * fVar309;
      auVar76._12_4_ = fVar309;
      fVar310 = auVar178._16_4_ * fVar310;
      auVar76._16_4_ = fVar310;
      fVar313 = auVar178._20_4_ * fVar313;
      auVar76._20_4_ = fVar313;
      fVar316 = auVar178._24_4_ * fVar316;
      auVar76._24_4_ = fVar316;
      auVar76._28_4_ = auVar178._28_4_;
      local_680 = fVar244 * ((float)local_900._0_4_ + (float)local_620._0_4_ * fVar293);
      fStack_67c = fVar265 * ((float)local_900._4_4_ + (float)local_620._4_4_ * fVar148);
      fStack_678 = fVar291 * (fStack_8f8 + fStack_618 * fVar329);
      fStack_674 = fVar330 * (fStack_8f4 + fStack_614 * fVar331);
      fStack_670 = fVar350 * (fStack_8f0 + fStack_610 * fVar333);
      fStack_66c = fVar290 * (fStack_8ec + fStack_60c * fVar335);
      fStack_668 = fVar292 * (fStack_8e8 + fStack_608 * fVar337);
      fStack_664 = fStack_8e4 + auVar38._28_4_ + auVar205._28_4_;
      auVar384._8_4_ = 0x7fffffff;
      auVar384._0_8_ = 0x7fffffff7fffffff;
      auVar384._12_4_ = 0x7fffffff;
      auVar384._16_4_ = 0x7fffffff;
      auVar384._20_4_ = 0x7fffffff;
      auVar384._24_4_ = 0x7fffffff;
      auVar384._28_4_ = 0x7fffffff;
      auVar38 = vandps_avx(local_2e0,auVar384);
      auVar178 = vmaxps_avx(local_480,auVar38);
      auVar77._4_4_ = auVar178._4_4_ * 1.9073486e-06;
      auVar77._0_4_ = auVar178._0_4_ * 1.9073486e-06;
      auVar77._8_4_ = auVar178._8_4_ * 1.9073486e-06;
      auVar77._12_4_ = auVar178._12_4_ * 1.9073486e-06;
      auVar77._16_4_ = auVar178._16_4_ * 1.9073486e-06;
      auVar77._20_4_ = auVar178._20_4_ * 1.9073486e-06;
      auVar77._24_4_ = auVar178._24_4_ * 1.9073486e-06;
      auVar77._28_4_ = auVar178._28_4_;
      auVar38 = vandps_avx(auVar384,local_4a0);
      auVar38 = vcmpps_avx(auVar38,auVar77,1);
      auVar390 = ZEXT3264(auVar38);
      auVar399._8_4_ = 0x7f800000;
      auVar399._0_8_ = 0x7f8000007f800000;
      auVar399._12_4_ = 0x7f800000;
      auVar399._16_4_ = 0x7f800000;
      auVar399._20_4_ = 0x7f800000;
      auVar399._24_4_ = 0x7f800000;
      auVar399._28_4_ = 0x7f800000;
      auVar427 = vblendvps_avx(auVar399,auVar35,auVar36);
      local_6a0._4_4_ = fVar265 * ((float)local_900._4_4_ + (float)local_620._4_4_ * fVar307);
      local_6a0._0_4_ = fVar244 * ((float)local_900._0_4_ + (float)local_620._0_4_ * fVar294);
      fStack_698 = fVar291 * (fStack_8f8 + fStack_618 * fVar308);
      fStack_694 = fVar330 * (fStack_8f4 + fStack_614 * fVar309);
      fStack_690 = fVar350 * (fStack_8f0 + fStack_610 * fVar310);
      fStack_68c = fVar290 * (fStack_8ec + fStack_60c * fVar313);
      fStack_688 = fVar292 * (fStack_8e8 + fStack_608 * fVar316);
      fStack_684 = fStack_8e4 + auVar178._28_4_;
      auVar301._8_4_ = 0xff800000;
      auVar301._0_8_ = 0xff800000ff800000;
      auVar301._12_4_ = 0xff800000;
      auVar301._16_4_ = 0xff800000;
      auVar301._20_4_ = 0xff800000;
      auVar301._24_4_ = 0xff800000;
      auVar301._28_4_ = 0xff800000;
      auVar398 = vblendvps_avx(auVar301,auVar76,auVar36);
      auVar178 = auVar36 & auVar38;
      if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar178 >> 0x7f,0) != '\0') ||
            (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar178 >> 0xbf,0) != '\0') ||
          (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar178[0x1f] < '\0') {
        auVar132 = vandps_avx(auVar38,auVar36);
        auVar123 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar301 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
        auVar437._8_4_ = 0xff800000;
        auVar437._0_8_ = 0xff800000ff800000;
        auVar437._12_4_ = 0xff800000;
        auVar437._16_4_ = 0xff800000;
        auVar437._20_4_ = 0xff800000;
        auVar437._24_4_ = 0xff800000;
        auVar437._28_4_ = 0xff800000;
        auVar416._8_4_ = 0x7f800000;
        auVar416._0_8_ = 0x7f8000007f800000;
        auVar416._12_4_ = 0x7f800000;
        auVar416._16_4_ = 0x7f800000;
        auVar416._20_4_ = 0x7f800000;
        auVar416._24_4_ = 0x7f800000;
        auVar416._28_4_ = 0x7f800000;
        auVar186 = vblendvps_avx(auVar416,auVar437,auVar301);
        auVar49 = vpmovsxwd_avx(auVar123);
        auVar390 = ZEXT1664(auVar49);
        auVar123 = vpunpckhwd_avx(auVar123,auVar123);
        auVar283._16_16_ = auVar123;
        auVar283._0_16_ = auVar49;
        auVar427 = vblendvps_avx(auVar427,auVar186,auVar283);
        auVar35 = vblendvps_avx(auVar437,auVar416,auVar301);
        auVar398 = vblendvps_avx(auVar398,auVar35,auVar283);
        auVar186 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar145._0_4_ = auVar132._0_4_ ^ auVar186._0_4_;
        auVar145._4_4_ = auVar132._4_4_ ^ auVar186._4_4_;
        auVar145._8_4_ = auVar132._8_4_ ^ auVar186._8_4_;
        auVar145._12_4_ = auVar132._12_4_ ^ auVar186._12_4_;
        auVar145._16_4_ = auVar132._16_4_ ^ auVar186._16_4_;
        auVar145._20_4_ = auVar132._20_4_ ^ auVar186._20_4_;
        auVar145._24_4_ = auVar132._24_4_ ^ auVar186._24_4_;
        auVar145._28_4_ = auVar132._28_4_ ^ auVar186._28_4_;
        auVar132 = vorps_avx(auVar301,auVar145);
        auVar132 = vandps_avx(auVar36,auVar132);
      }
    }
    auVar400 = ZEXT3264(auVar398);
    auVar326 = ZEXT3264(auVar35);
    auVar306 = ZEXT3264(auVar301);
    auVar363 = ZEXT3264(auVar36);
    auVar284 = ZEXT3264(local_460);
    auVar186 = local_460 & auVar132;
    auVar417 = ZEXT3264(CONCAT428(fStack_564,
                                  CONCAT424(fStack_568,
                                            CONCAT420(fStack_56c,
                                                      CONCAT416(fStack_570,
                                                                CONCAT412(fStack_574,
                                                                          CONCAT48(fStack_578,
                                                                                   CONCAT44(
                                                  fStack_57c,local_580))))))));
    local_920._0_8_ = uVar110;
    if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar186 >> 0x7f,0) != '\0') ||
          (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar186 >> 0xbf,0) != '\0') ||
        (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar186[0x1f] < '\0') {
      auVar123 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7f0._0_4_));
      auVar123 = vshufps_avx(auVar123,auVar123,0);
      auVar277._16_16_ = auVar123;
      auVar277._0_16_ = auVar123;
      auVar178 = vmaxps_avx(auVar277,auVar427);
      auVar123 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_7f0._0_4_));
      auVar123 = vshufps_avx(auVar123,auVar123,0);
      auVar278._16_16_ = auVar123;
      auVar278._0_16_ = auVar123;
      auVar205 = vminps_avx(auVar278,auVar398);
      fVar313 = local_660._28_4_;
      auVar400 = ZEXT3264(CONCAT428(fStack_584,
                                    CONCAT424(fStack_588,
                                              CONCAT420(fStack_58c,
                                                        CONCAT416(fStack_590,
                                                                  CONCAT412(fStack_594,
                                                                            CONCAT48(fStack_598,
                                                                                     CONCAT44(
                                                  fStack_59c,local_5a0))))))));
      auVar204._0_4_ = local_580 * fVar408 + local_5a0 * fVar392 + fVar354 * local_5c0;
      auVar204._4_4_ = fStack_57c * fVar418 + fStack_59c * fVar401 + fVar364 * fStack_5bc;
      auVar204._8_4_ = fStack_578 * fVar419 + fStack_598 * fVar402 + fVar366 * fStack_5b8;
      auVar204._12_4_ = fStack_574 * fVar420 + fStack_594 * fVar403 + fVar368 * fStack_5b4;
      auVar204._16_4_ = fStack_570 * fVar421 + fStack_590 * fVar404 + fVar370 * fStack_5b0;
      auVar204._20_4_ = fStack_56c * fVar422 + fStack_58c * fVar405 + fVar372 * fStack_5ac;
      auVar204._24_4_ = fStack_568 * fVar423 + fStack_588 * fVar406 + fVar374 * fStack_5a8;
      auVar204._28_4_ = fVar313 + fVar313 + auVar39._28_4_;
      auVar186 = vrcpps_avx(auVar204);
      fVar294 = auVar186._0_4_;
      fVar293 = auVar186._4_4_;
      auVar78._4_4_ = auVar204._4_4_ * fVar293;
      auVar78._0_4_ = auVar204._0_4_ * fVar294;
      fVar148 = auVar186._8_4_;
      auVar78._8_4_ = auVar204._8_4_ * fVar148;
      fVar307 = auVar186._12_4_;
      auVar78._12_4_ = auVar204._12_4_ * fVar307;
      fVar308 = auVar186._16_4_;
      auVar78._16_4_ = auVar204._16_4_ * fVar308;
      fVar309 = auVar186._20_4_;
      auVar78._20_4_ = auVar204._20_4_ * fVar309;
      fVar310 = auVar186._24_4_;
      auVar78._24_4_ = auVar204._24_4_ * fVar310;
      auVar78._28_4_ = uStack_1c4;
      auVar385._8_4_ = 0x3f800000;
      auVar385._0_8_ = 0x3f8000003f800000;
      auVar385._12_4_ = 0x3f800000;
      auVar385._16_4_ = 0x3f800000;
      auVar385._20_4_ = 0x3f800000;
      auVar385._24_4_ = 0x3f800000;
      auVar385._28_4_ = 0x3f800000;
      auVar38 = vsubps_avx(auVar385,auVar78);
      auVar324._8_4_ = 0x7fffffff;
      auVar324._0_8_ = 0x7fffffff7fffffff;
      auVar324._12_4_ = 0x7fffffff;
      auVar324._16_4_ = 0x7fffffff;
      auVar324._20_4_ = 0x7fffffff;
      auVar324._24_4_ = 0x7fffffff;
      auVar324._28_4_ = 0x7fffffff;
      auVar186 = vandps_avx(auVar204,auVar324);
      auVar362._8_4_ = 0x219392ef;
      auVar362._0_8_ = 0x219392ef219392ef;
      auVar362._12_4_ = 0x219392ef;
      auVar362._16_4_ = 0x219392ef;
      auVar362._20_4_ = 0x219392ef;
      auVar362._24_4_ = 0x219392ef;
      auVar362._28_4_ = 0x219392ef;
      auVar186 = vcmpps_avx(auVar186,auVar362,1);
      auVar79._4_4_ =
           (fVar293 + fVar293 * auVar38._4_4_) *
           -(fVar418 * fVar264 + fVar401 * fVar263 + fVar364 * fVar262);
      auVar79._0_4_ =
           (fVar294 + fVar294 * auVar38._0_4_) *
           -(fVar408 * fVar219 + fVar392 * fVar243 + fVar354 * fVar218);
      auVar79._8_4_ =
           (fVar148 + fVar148 * auVar38._8_4_) *
           -(fVar419 * fVar289 + fVar402 * fVar288 + fVar366 * fVar287);
      auVar79._12_4_ =
           (fVar307 + fVar307 * auVar38._12_4_) *
           -(fVar420 * fVar328 + fVar403 * fVar327 + fVar368 * fVar317);
      auVar79._16_4_ =
           (fVar308 + fVar308 * auVar38._16_4_) *
           -(fVar421 * fVar349 + fVar404 * fVar348 + fVar370 * fVar347);
      auVar79._20_4_ =
           (fVar309 + fVar309 * auVar38._20_4_) *
           -(fVar422 * fVar407 + fVar405 * fVar391 + fVar372 * fVar377);
      auVar79._24_4_ =
           (fVar310 + fVar310 * auVar38._24_4_) *
           -(fVar423 * fVar48 + fVar406 * fVar47 + fVar374 * fVar46);
      auVar79._28_4_ = -(auVar39._28_4_ + local_300._28_4_ + fVar313);
      auVar363 = ZEXT3264(auVar132);
      auVar123 = ZEXT816(0) << 0x40;
      auVar38 = vcmpps_avx(auVar204,ZEXT1632(auVar123),1);
      auVar39 = vorps_avx(auVar186,auVar38);
      auVar38 = vcmpps_avx(auVar204,ZEXT1632(auVar123),6);
      auVar38 = vorps_avx(auVar186,auVar38);
      auVar428._8_4_ = 0xff800000;
      auVar428._0_8_ = 0xff800000ff800000;
      auVar428._12_4_ = 0xff800000;
      auVar428._16_4_ = 0xff800000;
      auVar428._20_4_ = 0xff800000;
      auVar428._24_4_ = 0xff800000;
      auVar428._28_4_ = 0xff800000;
      auVar186 = vblendvps_avx(auVar79,auVar428,auVar39);
      auVar386._8_4_ = 0x7f800000;
      auVar386._0_8_ = 0x7f8000007f800000;
      auVar386._12_4_ = 0x7f800000;
      auVar386._16_4_ = 0x7f800000;
      auVar386._20_4_ = 0x7f800000;
      auVar386._24_4_ = 0x7f800000;
      auVar386._28_4_ = 0x7f800000;
      auVar390 = ZEXT3264(auVar386);
      auVar38 = vblendvps_avx(auVar79,auVar386,auVar38);
      auVar39 = vmaxps_avx(auVar178,auVar186);
      auVar178 = vminps_avx(auVar205,auVar38);
      auVar138 = ZEXT1632(auVar123);
      auVar186 = vsubps_avx(auVar138,local_880);
      auVar38 = vsubps_avx(auVar138,local_a40);
      auVar80._4_4_ = auVar38._4_4_ * -fVar261;
      auVar80._0_4_ = auVar38._0_4_ * -fVar220;
      auVar80._8_4_ = auVar38._8_4_ * -fVar286;
      auVar80._12_4_ = auVar38._12_4_ * -fVar315;
      auVar80._16_4_ = auVar38._16_4_ * -fVar338;
      auVar80._20_4_ = auVar38._20_4_ * -fVar376;
      auVar80._24_4_ = auVar38._24_4_ * -fVar45;
      auVar80._28_4_ = auVar38._28_4_;
      auVar81._4_4_ = fVar430 * auVar186._4_4_;
      auVar81._0_4_ = fVar424 * auVar186._0_4_;
      auVar81._8_4_ = fVar431 * auVar186._8_4_;
      auVar81._12_4_ = fVar432 * auVar186._12_4_;
      auVar81._16_4_ = fVar433 * auVar186._16_4_;
      auVar81._20_4_ = fVar434 * auVar186._20_4_;
      auVar81._24_4_ = fVar435 * auVar186._24_4_;
      auVar81._28_4_ = auVar186._28_4_;
      auVar186 = vsubps_avx(auVar80,auVar81);
      auVar38 = vsubps_avx(auVar138,local_9c0);
      auVar82._4_4_ = fVar365 * auVar38._4_4_;
      auVar82._0_4_ = fVar355 * auVar38._0_4_;
      auVar82._8_4_ = fVar367 * auVar38._8_4_;
      auVar82._12_4_ = fVar369 * auVar38._12_4_;
      auVar82._16_4_ = fVar371 * auVar38._16_4_;
      auVar82._20_4_ = fVar373 * auVar38._20_4_;
      uVar8 = auVar38._28_4_;
      auVar82._24_4_ = fVar375 * auVar38._24_4_;
      auVar82._28_4_ = uVar8;
      auVar205 = vsubps_avx(auVar186,auVar82);
      auVar83._4_4_ = fStack_5bc * -fVar261;
      auVar83._0_4_ = local_5c0 * -fVar220;
      auVar83._8_4_ = fStack_5b8 * -fVar286;
      auVar83._12_4_ = fStack_5b4 * -fVar315;
      auVar83._16_4_ = fStack_5b0 * -fVar338;
      auVar83._20_4_ = fStack_5ac * -fVar376;
      auVar83._24_4_ = fStack_5a8 * -fVar45;
      auVar83._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar84._4_4_ = fStack_59c * fVar430;
      auVar84._0_4_ = local_5a0 * fVar424;
      auVar84._8_4_ = fStack_598 * fVar431;
      auVar84._12_4_ = fStack_594 * fVar432;
      auVar84._16_4_ = fStack_590 * fVar433;
      auVar84._20_4_ = fStack_58c * fVar434;
      auVar84._24_4_ = fStack_588 * fVar435;
      auVar84._28_4_ = uVar8;
      auVar186 = vsubps_avx(auVar83,auVar84);
      auVar85._4_4_ = fStack_57c * fVar365;
      auVar85._0_4_ = local_580 * fVar355;
      auVar85._8_4_ = fStack_578 * fVar367;
      auVar85._12_4_ = fStack_574 * fVar369;
      auVar85._16_4_ = fStack_570 * fVar371;
      auVar85._20_4_ = fStack_56c * fVar373;
      auVar85._24_4_ = fStack_568 * fVar375;
      auVar85._28_4_ = uVar8;
      auVar414._8_4_ = 0x3f800000;
      auVar414._0_8_ = 0x3f8000003f800000;
      auVar414._12_4_ = 0x3f800000;
      auVar414._16_4_ = 0x3f800000;
      auVar414._20_4_ = 0x3f800000;
      auVar414._24_4_ = 0x3f800000;
      auVar414._28_4_ = 0x3f800000;
      auVar417 = ZEXT3264(auVar414);
      auVar40 = vsubps_avx(auVar186,auVar85);
      auVar186 = vrcpps_avx(auVar40);
      fVar220 = auVar186._0_4_;
      fVar218 = auVar186._4_4_;
      auVar86._4_4_ = auVar40._4_4_ * fVar218;
      auVar86._0_4_ = auVar40._0_4_ * fVar220;
      fVar243 = auVar186._8_4_;
      auVar86._8_4_ = auVar40._8_4_ * fVar243;
      fVar219 = auVar186._12_4_;
      auVar86._12_4_ = auVar40._12_4_ * fVar219;
      fVar261 = auVar186._16_4_;
      auVar86._16_4_ = auVar40._16_4_ * fVar261;
      fVar262 = auVar186._20_4_;
      auVar86._20_4_ = auVar40._20_4_ * fVar262;
      fVar263 = auVar186._24_4_;
      auVar86._24_4_ = auVar40._24_4_ * fVar263;
      auVar86._28_4_ = fStack_5a4;
      auVar50 = vsubps_avx(auVar414,auVar86);
      auVar186 = vandps_avx(auVar40,auVar324);
      auVar325._8_4_ = 0x219392ef;
      auVar325._0_8_ = 0x219392ef219392ef;
      auVar325._12_4_ = 0x219392ef;
      auVar325._16_4_ = 0x219392ef;
      auVar325._20_4_ = 0x219392ef;
      auVar325._24_4_ = 0x219392ef;
      auVar325._28_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar186,auVar325,1);
      auVar306 = ZEXT3264(auVar38);
      auVar87._4_4_ = (fVar218 + fVar218 * auVar50._4_4_) * -auVar205._4_4_;
      auVar87._0_4_ = (fVar220 + fVar220 * auVar50._0_4_) * -auVar205._0_4_;
      auVar87._8_4_ = (fVar243 + fVar243 * auVar50._8_4_) * -auVar205._8_4_;
      auVar87._12_4_ = (fVar219 + fVar219 * auVar50._12_4_) * -auVar205._12_4_;
      auVar87._16_4_ = (fVar261 + fVar261 * auVar50._16_4_) * -auVar205._16_4_;
      auVar87._20_4_ = (fVar262 + fVar262 * auVar50._20_4_) * -auVar205._20_4_;
      auVar87._24_4_ = (fVar263 + fVar263 * auVar50._24_4_) * -auVar205._24_4_;
      auVar87._28_4_ = auVar205._28_4_ ^ 0x80000000;
      auVar186 = vcmpps_avx(auVar40,auVar138,1);
      auVar186 = vorps_avx(auVar38,auVar186);
      auVar186 = vblendvps_avx(auVar87,auVar428,auVar186);
      local_640 = vmaxps_avx(auVar39,auVar186);
      auVar326 = ZEXT3264(local_640);
      auVar284 = ZEXT864(0) << 0x20;
      auVar186 = vcmpps_avx(auVar40,ZEXT832(0) << 0x20,6);
      auVar186 = vorps_avx(auVar38,auVar186);
      auVar186 = vblendvps_avx(auVar87,auVar386,auVar186);
      auVar132 = vandps_avx(auVar132,local_460);
      local_500 = vminps_avx(auVar178,auVar186);
      auVar186 = vcmpps_avx(local_640,local_500,2);
      auVar38 = auVar132 & auVar186;
      if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar38 >> 0x7f,0) != '\0') ||
            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar38 >> 0xbf,0) != '\0') ||
          (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar38[0x1f] < '\0') {
        auVar38 = vminps_avx(_local_ae0,_local_6c0);
        auVar39 = vminps_avx(local_7c0,_local_7e0);
        auVar38 = vminps_avx(auVar38,auVar39);
        auVar37 = vsubps_avx(auVar38,auVar37);
        auVar132 = vandps_avx(auVar186,auVar132);
        auVar107._4_4_ = fStack_67c;
        auVar107._0_4_ = local_680;
        auVar107._8_4_ = fStack_678;
        auVar107._12_4_ = fStack_674;
        auVar107._16_4_ = fStack_670;
        auVar107._20_4_ = fStack_66c;
        auVar107._24_4_ = fStack_668;
        auVar107._28_4_ = fStack_664;
        auVar186 = vminps_avx(auVar107,auVar414);
        auVar186 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar192 + fVar160 * (auVar186._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar215 + fVar187 * (auVar186._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar216 + fVar188 * (auVar186._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar217 + fVar191 * (auVar186._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar192 + fVar160 * (auVar186._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar215 + fVar187 * (auVar186._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar216 + fVar188 * (auVar186._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar217 + auVar186._28_4_ + 7.0;
        auVar186 = vminps_avx(_local_6a0,auVar414);
        auVar186 = vmaxps_avx(auVar186,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar192 + fVar160 * (auVar186._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar215 + fVar187 * (auVar186._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar216 + fVar188 * (auVar186._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar217 + fVar191 * (auVar186._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar192 + fVar160 * (auVar186._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar215 + fVar187 * (auVar186._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar216 + fVar188 * (auVar186._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar217 + auVar186._28_4_ + 7.0;
        auVar88._4_4_ = auVar37._4_4_ * 0.99999976;
        auVar88._0_4_ = auVar37._0_4_ * 0.99999976;
        auVar88._8_4_ = auVar37._8_4_ * 0.99999976;
        auVar88._12_4_ = auVar37._12_4_ * 0.99999976;
        auVar88._16_4_ = auVar37._16_4_ * 0.99999976;
        auVar88._20_4_ = auVar37._20_4_ * 0.99999976;
        auVar88._24_4_ = auVar37._24_4_ * 0.99999976;
        auVar88._28_4_ = 0x3f7ffffc;
        auVar186 = vmaxps_avx(ZEXT832(0) << 0x20,auVar88);
        auVar89._4_4_ = auVar186._4_4_ * auVar186._4_4_;
        auVar89._0_4_ = auVar186._0_4_ * auVar186._0_4_;
        auVar89._8_4_ = auVar186._8_4_ * auVar186._8_4_;
        auVar89._12_4_ = auVar186._12_4_ * auVar186._12_4_;
        auVar89._16_4_ = auVar186._16_4_ * auVar186._16_4_;
        auVar89._20_4_ = auVar186._20_4_ * auVar186._20_4_;
        auVar89._24_4_ = auVar186._24_4_ * auVar186._24_4_;
        auVar89._28_4_ = auVar186._28_4_;
        auVar37 = vsubps_avx(local_660,auVar89);
        auVar90._4_4_ = auVar37._4_4_ * (float)local_700._4_4_;
        auVar90._0_4_ = auVar37._0_4_ * (float)local_700._0_4_;
        auVar90._8_4_ = auVar37._8_4_ * fStack_6f8;
        auVar90._12_4_ = auVar37._12_4_ * fStack_6f4;
        auVar90._16_4_ = auVar37._16_4_ * fStack_6f0;
        auVar90._20_4_ = auVar37._20_4_ * fStack_6ec;
        auVar90._24_4_ = auVar37._24_4_ * fStack_6e8;
        auVar90._28_4_ = auVar186._28_4_;
        auVar38 = vsubps_avx(_local_6e0,auVar90);
        auVar186 = vcmpps_avx(auVar38,ZEXT832(0) << 0x20,5);
        if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar186 >> 0x7f,0) == '\0') &&
              (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar186 >> 0xbf,0) == '\0') &&
            (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar186[0x1f]) {
          auVar178 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_6c0 = ZEXT832(0) << 0x20;
          _local_6e0 = ZEXT832(0) << 0x20;
          _local_700 = ZEXT832(0) << 0x20;
          auVar205 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar234 = ZEXT828(0) << 0x20;
          auVar279._8_4_ = 0x7f800000;
          auVar279._0_8_ = 0x7f8000007f800000;
          auVar279._12_4_ = 0x7f800000;
          auVar279._16_4_ = 0x7f800000;
          auVar279._20_4_ = 0x7f800000;
          auVar279._24_4_ = 0x7f800000;
          auVar279._28_4_ = 0x7f800000;
          auVar302._8_4_ = 0xff800000;
          auVar302._0_8_ = 0xff800000ff800000;
          auVar302._12_4_ = 0xff800000;
          auVar302._16_4_ = 0xff800000;
          auVar302._20_4_ = 0xff800000;
          auVar302._24_4_ = 0xff800000;
          auVar302._28_4_ = 0xff800000;
        }
        else {
          local_980 = auVar37;
          local_a40 = auVar186;
          auVar178 = vsqrtps_avx(auVar38);
          auVar206._0_4_ = fVar150 + fVar150;
          auVar206._4_4_ = fVar152 + fVar152;
          auVar206._8_4_ = fVar154 + fVar154;
          auVar206._12_4_ = fVar156 + fVar156;
          auVar206._16_4_ = fVar158 + fVar158;
          auVar206._20_4_ = fVar266 + fVar266;
          auVar206._24_4_ = fVar268 + fVar268;
          auVar206._28_4_ = fVar221 + fVar221;
          auVar39 = vrcpps_avx(auVar206);
          fVar221 = auVar39._0_4_;
          fVar220 = auVar39._4_4_;
          auVar91._4_4_ = auVar206._4_4_ * fVar220;
          auVar91._0_4_ = auVar206._0_4_ * fVar221;
          fVar218 = auVar39._8_4_;
          auVar91._8_4_ = auVar206._8_4_ * fVar218;
          fVar243 = auVar39._12_4_;
          auVar91._12_4_ = auVar206._12_4_ * fVar243;
          fVar219 = auVar39._16_4_;
          auVar91._16_4_ = auVar206._16_4_ * fVar219;
          fVar261 = auVar39._20_4_;
          auVar91._20_4_ = auVar206._20_4_ * fVar261;
          fVar262 = auVar39._24_4_;
          auVar91._24_4_ = auVar206._24_4_ * fVar262;
          auVar91._28_4_ = auVar206._28_4_;
          auVar205 = vsubps_avx(auVar414,auVar91);
          fVar221 = fVar221 + fVar221 * auVar205._0_4_;
          fVar220 = fVar220 + fVar220 * auVar205._4_4_;
          fVar218 = fVar218 + fVar218 * auVar205._8_4_;
          fVar243 = fVar243 + fVar243 * auVar205._12_4_;
          fVar219 = fVar219 + fVar219 * auVar205._16_4_;
          fVar261 = fVar261 + fVar261 * auVar205._20_4_;
          fVar262 = fVar262 + fVar262 * auVar205._24_4_;
          fVar263 = auVar39._28_4_ + auVar205._28_4_;
          auVar239._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar239._8_4_ = -local_300._8_4_;
          auVar239._12_4_ = -local_300._12_4_;
          auVar239._16_4_ = -local_300._16_4_;
          auVar239._20_4_ = -local_300._20_4_;
          auVar239._24_4_ = -local_300._24_4_;
          auVar239._28_4_ = -local_300._28_4_;
          auVar39 = vsubps_avx(auVar239,auVar178);
          fVar327 = auVar39._0_4_ * fVar221;
          fVar328 = auVar39._4_4_ * fVar220;
          auVar92._4_4_ = fVar328;
          auVar92._0_4_ = fVar327;
          fVar338 = auVar39._8_4_ * fVar218;
          auVar92._8_4_ = fVar338;
          fVar347 = auVar39._12_4_ * fVar243;
          auVar92._12_4_ = fVar347;
          fVar348 = auVar39._16_4_ * fVar219;
          auVar92._16_4_ = fVar348;
          fVar349 = auVar39._20_4_ * fVar261;
          auVar92._20_4_ = fVar349;
          fVar376 = auVar39._24_4_ * fVar262;
          auVar92._24_4_ = fVar376;
          auVar92._28_4_ = 0xff800000;
          auVar178 = vsubps_avx(auVar178,local_300);
          fVar221 = auVar178._0_4_ * fVar221;
          fVar220 = auVar178._4_4_ * fVar220;
          auVar93._4_4_ = fVar220;
          auVar93._0_4_ = fVar221;
          fVar218 = auVar178._8_4_ * fVar218;
          auVar93._8_4_ = fVar218;
          fVar243 = auVar178._12_4_ * fVar243;
          auVar93._12_4_ = fVar243;
          fVar219 = auVar178._16_4_ * fVar219;
          auVar93._16_4_ = fVar219;
          fVar261 = auVar178._20_4_ * fVar261;
          auVar93._20_4_ = fVar261;
          fVar262 = auVar178._24_4_ * fVar262;
          auVar93._24_4_ = fVar262;
          auVar93._28_4_ = 0x3f800000;
          fVar264 = fVar244 * ((float)local_620._0_4_ * fVar327 + (float)local_900._0_4_);
          fVar286 = fVar265 * ((float)local_620._4_4_ * fVar328 + (float)local_900._4_4_);
          fVar287 = fVar291 * (fStack_618 * fVar338 + fStack_8f8);
          fVar288 = fVar330 * (fStack_614 * fVar347 + fStack_8f4);
          fVar289 = fVar350 * (fStack_610 * fVar348 + fStack_8f0);
          fVar315 = fVar290 * (fStack_60c * fVar349 + fStack_8ec);
          fVar317 = fVar292 * (fStack_608 * fVar376 + fStack_8e8);
          auVar179._0_4_ = local_860 + fVar189 * fVar264;
          auVar179._4_4_ = fStack_85c + fVar247 * fVar286;
          auVar179._8_4_ = fStack_858 + fVar285 * fVar287;
          auVar179._12_4_ = fStack_854 + fVar314 * fVar288;
          auVar179._16_4_ = fStack_850 + fVar336 * fVar289;
          auVar179._20_4_ = fStack_84c + fVar353 * fVar315;
          auVar179._24_4_ = fStack_848 + fVar44 * fVar317;
          auVar179._28_4_ = fStack_844 + auVar178._28_4_ + fStack_8e4;
          auVar94._4_4_ = fStack_57c * fVar328;
          auVar94._0_4_ = local_580 * fVar327;
          auVar94._8_4_ = fStack_578 * fVar338;
          auVar94._12_4_ = fStack_574 * fVar347;
          auVar94._16_4_ = fStack_570 * fVar348;
          auVar94._20_4_ = fStack_56c * fVar349;
          auVar94._24_4_ = fStack_568 * fVar376;
          auVar94._28_4_ = fVar263;
          auVar178 = vsubps_avx(auVar94,auVar179);
          _local_a60 = auVar178;
          auVar207._0_4_ = fVar120 + fVar161 * fVar264;
          auVar207._4_4_ = fVar147 + fVar245 * fVar286;
          auVar207._8_4_ = fVar149 + fVar267 * fVar287;
          auVar207._12_4_ = fVar151 + fVar311 * fVar288;
          auVar207._16_4_ = fVar153 + fVar332 * fVar289;
          auVar207._20_4_ = fVar155 + fVar351 * fVar315;
          auVar207._24_4_ = fVar157 + fVar42 * fVar317;
          auVar207._28_4_ = fVar159 + fVar263;
          auVar280._0_4_ = local_5a0 * fVar327;
          auVar280._4_4_ = fStack_59c * fVar328;
          auVar280._8_4_ = fStack_598 * fVar338;
          auVar280._12_4_ = fStack_594 * fVar347;
          auVar280._16_4_ = fStack_590 * fVar348;
          auVar280._20_4_ = fStack_58c * fVar349;
          auVar280._24_4_ = fStack_588 * fVar376;
          auVar280._28_4_ = 0;
          auVar205 = vsubps_avx(auVar280,auVar207);
          local_880 = auVar205;
          auVar240._0_4_ = local_840 + fVar242 * fVar264;
          auVar240._4_4_ = fStack_83c + fVar246 * fVar286;
          auVar240._8_4_ = fStack_838 + fVar269 * fVar287;
          auVar240._12_4_ = aStack_834.w + fVar312 * fVar288;
          auVar240._16_4_ = fStack_830 + fVar334 * fVar289;
          auVar240._20_4_ = fStack_82c + fVar352 * fVar315;
          auVar240._24_4_ = fStack_828 + fVar43 * fVar317;
          auVar240._28_4_ = fStack_824 + auVar39._28_4_;
          auVar95._4_4_ = fStack_5bc * fVar328;
          auVar95._0_4_ = local_5c0 * fVar327;
          auVar95._8_4_ = fStack_5b8 * fVar338;
          auVar95._12_4_ = fStack_5b4 * fVar347;
          auVar95._16_4_ = fStack_5b0 * fVar348;
          auVar95._20_4_ = fStack_5ac * fVar349;
          auVar95._24_4_ = fStack_5a8 * fVar376;
          auVar95._28_4_ = 0;
          auVar39 = vsubps_avx(auVar95,auVar240);
          auVar234 = auVar39._0_28_;
          fVar244 = fVar244 * ((float)local_620._0_4_ * fVar221 + (float)local_900._0_4_);
          fVar265 = fVar265 * ((float)local_620._4_4_ * fVar220 + (float)local_900._4_4_);
          fVar291 = fVar291 * (fStack_618 * fVar218 + fStack_8f8);
          fVar330 = fVar330 * (fStack_614 * fVar243 + fStack_8f4);
          fVar350 = fVar350 * (fStack_610 * fVar219 + fStack_8f0);
          fVar290 = fVar290 * (fStack_60c * fVar261 + fStack_8ec);
          fVar292 = fVar292 * (fStack_608 * fVar262 + fStack_8e8);
          auVar303._0_4_ = local_860 + fVar189 * fVar244;
          auVar303._4_4_ = fStack_85c + fVar247 * fVar265;
          auVar303._8_4_ = fStack_858 + fVar285 * fVar291;
          auVar303._12_4_ = fStack_854 + fVar314 * fVar330;
          auVar303._16_4_ = fStack_850 + fVar336 * fVar350;
          auVar303._20_4_ = fStack_84c + fVar353 * fVar290;
          auVar303._24_4_ = fStack_848 + fVar44 * fVar292;
          auVar303._28_4_ = fStack_844 + fStack_704;
          auVar96._4_4_ = fStack_57c * fVar220;
          auVar96._0_4_ = local_580 * fVar221;
          auVar96._8_4_ = fStack_578 * fVar218;
          auVar96._12_4_ = fStack_574 * fVar243;
          auVar96._16_4_ = fStack_570 * fVar219;
          auVar96._20_4_ = fStack_56c * fVar261;
          auVar96._24_4_ = fStack_568 * fVar262;
          auVar96._28_4_ = fStack_844;
          _local_6c0 = vsubps_avx(auVar96,auVar303);
          auVar304._0_4_ = fVar120 + fVar161 * fVar244;
          auVar304._4_4_ = fVar147 + fVar245 * fVar265;
          auVar304._8_4_ = fVar149 + fVar267 * fVar291;
          auVar304._12_4_ = fVar151 + fVar311 * fVar330;
          auVar304._16_4_ = fVar153 + fVar332 * fVar350;
          auVar304._20_4_ = fVar155 + fVar351 * fVar290;
          auVar304._24_4_ = fVar157 + fVar42 * fVar292;
          auVar304._28_4_ = fVar159 + local_6c0._28_4_;
          auVar97._4_4_ = fVar220 * fStack_59c;
          auVar97._0_4_ = fVar221 * local_5a0;
          auVar97._8_4_ = fVar218 * fStack_598;
          auVar97._12_4_ = fVar243 * fStack_594;
          auVar97._16_4_ = fVar219 * fStack_590;
          auVar97._20_4_ = fVar261 * fStack_58c;
          auVar97._24_4_ = fVar262 * fStack_588;
          auVar97._28_4_ = fStack_844;
          _local_6e0 = vsubps_avx(auVar97,auVar304);
          auVar281._0_4_ = local_840 + fVar242 * fVar244;
          auVar281._4_4_ = fStack_83c + fVar246 * fVar265;
          auVar281._8_4_ = fStack_838 + fVar269 * fVar291;
          auVar281._12_4_ = aStack_834.w + fVar312 * fVar330;
          auVar281._16_4_ = fStack_830 + fVar334 * fVar350;
          auVar281._20_4_ = fStack_82c + fVar352 * fVar290;
          auVar281._24_4_ = fStack_828 + fVar43 * fVar292;
          auVar281._28_4_ = fStack_824 + fStack_8e4 + 0.0;
          auVar98._4_4_ = fStack_5bc * fVar220;
          auVar98._0_4_ = local_5c0 * fVar221;
          auVar98._8_4_ = fStack_5b8 * fVar218;
          auVar98._12_4_ = fStack_5b4 * fVar243;
          auVar98._16_4_ = fStack_5b0 * fVar219;
          auVar98._20_4_ = fStack_5ac * fVar261;
          auVar98._24_4_ = fStack_5a8 * fVar262;
          auVar98._28_4_ = local_6e0._28_4_;
          _local_700 = vsubps_avx(auVar98,auVar281);
          auVar39 = vcmpps_avx(auVar38,_DAT_01faff00,5);
          auVar282._8_4_ = 0x7f800000;
          auVar282._0_8_ = 0x7f8000007f800000;
          auVar282._12_4_ = 0x7f800000;
          auVar282._16_4_ = 0x7f800000;
          auVar282._20_4_ = 0x7f800000;
          auVar282._24_4_ = 0x7f800000;
          auVar282._28_4_ = 0x7f800000;
          auVar279 = vblendvps_avx(auVar282,auVar92,auVar39);
          auVar387._8_4_ = 0x7fffffff;
          auVar387._0_8_ = 0x7fffffff7fffffff;
          auVar387._12_4_ = 0x7fffffff;
          auVar387._16_4_ = 0x7fffffff;
          auVar387._20_4_ = 0x7fffffff;
          auVar387._24_4_ = 0x7fffffff;
          auVar387._28_4_ = 0x7fffffff;
          auVar38 = vandps_avx(auVar387,local_2e0);
          auVar38 = vmaxps_avx(local_480,auVar38);
          auVar99._4_4_ = auVar38._4_4_ * 1.9073486e-06;
          auVar99._0_4_ = auVar38._0_4_ * 1.9073486e-06;
          auVar99._8_4_ = auVar38._8_4_ * 1.9073486e-06;
          auVar99._12_4_ = auVar38._12_4_ * 1.9073486e-06;
          auVar99._16_4_ = auVar38._16_4_ * 1.9073486e-06;
          auVar99._20_4_ = auVar38._20_4_ * 1.9073486e-06;
          auVar99._24_4_ = auVar38._24_4_ * 1.9073486e-06;
          auVar99._28_4_ = auVar38._28_4_;
          auVar38 = vandps_avx(auVar387,local_4a0);
          auVar38 = vcmpps_avx(auVar38,auVar99,1);
          auVar305._8_4_ = 0xff800000;
          auVar305._0_8_ = 0xff800000ff800000;
          auVar305._12_4_ = 0xff800000;
          auVar305._16_4_ = 0xff800000;
          auVar305._20_4_ = 0xff800000;
          auVar305._24_4_ = 0xff800000;
          auVar305._28_4_ = 0xff800000;
          auVar302 = vblendvps_avx(auVar305,auVar93,auVar39);
          auVar40 = auVar39 & auVar38;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            auVar186 = vandps_avx(auVar38,auVar39);
            auVar123 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
            auVar38 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,2);
            auVar438._8_4_ = 0xff800000;
            auVar438._0_8_ = 0xff800000ff800000;
            auVar438._12_4_ = 0xff800000;
            auVar438._16_4_ = 0xff800000;
            auVar438._20_4_ = 0xff800000;
            auVar438._24_4_ = 0xff800000;
            auVar438._28_4_ = 0xff800000;
            auVar429._8_4_ = 0x7f800000;
            auVar429._0_8_ = 0x7f8000007f800000;
            auVar429._12_4_ = 0x7f800000;
            auVar429._16_4_ = 0x7f800000;
            auVar429._20_4_ = 0x7f800000;
            auVar429._24_4_ = 0x7f800000;
            auVar429._28_4_ = 0x7f800000;
            auVar37 = vblendvps_avx(auVar429,auVar438,auVar38);
            auVar49 = vpmovsxwd_avx(auVar123);
            auVar123 = vpunpckhwd_avx(auVar123,auVar123);
            auVar389._16_16_ = auVar123;
            auVar389._0_16_ = auVar49;
            auVar279 = vblendvps_avx(auVar279,auVar37,auVar389);
            auVar37 = vblendvps_avx(auVar438,auVar429,auVar38);
            auVar302 = vblendvps_avx(auVar302,auVar37,auVar389);
            auVar37 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar146._0_4_ = auVar37._0_4_ ^ auVar186._0_4_;
            auVar146._4_4_ = auVar37._4_4_ ^ auVar186._4_4_;
            auVar146._8_4_ = auVar37._8_4_ ^ auVar186._8_4_;
            auVar146._12_4_ = auVar37._12_4_ ^ auVar186._12_4_;
            auVar146._16_4_ = auVar37._16_4_ ^ auVar186._16_4_;
            auVar146._20_4_ = auVar37._20_4_ ^ auVar186._20_4_;
            auVar146._24_4_ = auVar37._24_4_ ^ auVar186._24_4_;
            auVar146._28_4_ = auVar37._28_4_ ^ auVar186._28_4_;
            auVar186 = vorps_avx(auVar38,auVar146);
            auVar186 = vandps_avx(auVar39,auVar186);
          }
        }
        auVar326 = ZEXT3264(auVar132);
        fVar221 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar357._4_4_ = fVar221;
        auVar357._0_4_ = fVar221;
        auVar357._8_4_ = fVar221;
        auVar357._12_4_ = fVar221;
        auVar357._16_4_ = fVar221;
        auVar357._20_4_ = fVar221;
        auVar357._24_4_ = fVar221;
        local_7c0._28_4_ = fVar221;
        local_7c0._0_28_ = auVar357;
        auVar363 = ZEXT3264(local_7c0);
        fVar161 = (ray->super_RayK<1>).dir.field_0.m128[1];
        auVar388._4_4_ = fVar161;
        auVar388._0_4_ = fVar161;
        auVar388._8_4_ = fVar161;
        auVar388._12_4_ = fVar161;
        auVar388._16_4_ = fVar161;
        auVar388._20_4_ = fVar161;
        auVar388._24_4_ = fVar161;
        auVar388._28_4_ = fVar161;
        auVar390 = ZEXT3264(auVar388);
        fVar242 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar415._4_4_ = fVar242;
        auVar415._0_4_ = fVar242;
        auVar415._8_4_ = fVar242;
        auVar415._12_4_ = fVar242;
        auVar415._16_4_ = fVar242;
        auVar415._20_4_ = fVar242;
        auVar415._24_4_ = fVar242;
        auVar415._28_4_ = fVar242;
        auVar417 = ZEXT3264(auVar415);
        local_4e0 = local_640;
        local_4c0 = vminps_avx(local_500,auVar279);
        _local_520 = vmaxps_avx(local_640,auVar302);
        auVar306 = ZEXT3264(_local_520);
        auVar37 = vcmpps_avx(local_640,local_4c0,2);
        local_5e0 = vandps_avx(auVar37,auVar132);
        auVar284 = ZEXT3264(local_5e0);
        auVar37 = vcmpps_avx(_local_520,local_500,2);
        auVar132 = vandps_avx(auVar37,auVar132);
        auVar400 = ZEXT3264(auVar132);
        auVar37 = vorps_avx(auVar132,local_5e0);
        if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0x7f,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0xbf,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar37[0x1f] < '\0') {
          _local_720 = _local_520;
          auVar38 = _local_720;
          auVar37 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_620._0_4_ = auVar186._0_4_ ^ auVar37._0_4_;
          local_620._4_4_ = auVar186._4_4_ ^ auVar37._4_4_;
          fStack_618 = (float)(auVar186._8_4_ ^ auVar37._8_4_);
          fStack_614 = (float)(auVar186._12_4_ ^ auVar37._12_4_);
          fStack_610 = (float)(auVar186._16_4_ ^ auVar37._16_4_);
          fStack_60c = (float)(auVar186._20_4_ ^ auVar37._20_4_);
          fStack_608 = (float)(auVar186._24_4_ ^ auVar37._24_4_);
          fStack_604 = (float)((uint)auVar186._28_4_ ^ auVar37._28_4_);
          auVar139._0_4_ =
               fVar221 * auVar178._0_4_ + fVar161 * auVar205._0_4_ + fVar242 * auVar234._0_4_;
          auVar139._4_4_ =
               fVar221 * auVar178._4_4_ + fVar161 * auVar205._4_4_ + fVar242 * auVar234._4_4_;
          auVar139._8_4_ =
               fVar221 * auVar178._8_4_ + fVar161 * auVar205._8_4_ + fVar242 * auVar234._8_4_;
          auVar139._12_4_ =
               fVar221 * auVar178._12_4_ + fVar161 * auVar205._12_4_ + fVar242 * auVar234._12_4_;
          auVar139._16_4_ =
               fVar221 * auVar178._16_4_ + fVar161 * auVar205._16_4_ + fVar242 * auVar234._16_4_;
          auVar139._20_4_ =
               fVar221 * auVar178._20_4_ + fVar161 * auVar205._20_4_ + fVar242 * auVar234._20_4_;
          auVar139._24_4_ =
               fVar221 * auVar178._24_4_ + fVar161 * auVar205._24_4_ + fVar242 * auVar234._24_4_;
          auVar139._28_4_ = auVar186._28_4_ + auVar178._28_4_ + auVar205._28_4_;
          auVar180._8_4_ = 0x7fffffff;
          auVar180._0_8_ = 0x7fffffff7fffffff;
          auVar180._12_4_ = 0x7fffffff;
          auVar180._16_4_ = 0x7fffffff;
          auVar180._20_4_ = 0x7fffffff;
          auVar180._24_4_ = 0x7fffffff;
          auVar180._28_4_ = 0x7fffffff;
          auVar186 = vandps_avx(auVar139,auVar180);
          auVar181._8_4_ = 0x3e99999a;
          auVar181._0_8_ = 0x3e99999a3e99999a;
          auVar181._12_4_ = 0x3e99999a;
          auVar181._16_4_ = 0x3e99999a;
          auVar181._20_4_ = 0x3e99999a;
          auVar181._24_4_ = 0x3e99999a;
          auVar181._28_4_ = 0x3e99999a;
          auVar186 = vcmpps_avx(auVar186,auVar181,1);
          auVar186 = vorps_avx(auVar186,_local_620);
          auVar182._8_4_ = 3;
          auVar182._0_8_ = 0x300000003;
          auVar182._12_4_ = 3;
          auVar182._16_4_ = 3;
          auVar182._20_4_ = 3;
          auVar182._24_4_ = 3;
          auVar182._28_4_ = 3;
          auVar208._8_4_ = 2;
          auVar208._0_8_ = 0x200000002;
          auVar208._12_4_ = 2;
          auVar208._16_4_ = 2;
          auVar208._20_4_ = 2;
          auVar208._24_4_ = 2;
          auVar208._28_4_ = 2;
          auVar186 = vblendvps_avx(auVar208,auVar182,auVar186);
          local_660 = ZEXT432(local_b0c);
          auVar49 = vpshufd_avx(ZEXT416(local_b0c),0);
          auVar214 = ZEXT1664(auVar49);
          auVar123 = vpcmpgtd_avx(auVar186._16_16_,auVar49);
          local_680 = auVar49._0_4_;
          fStack_67c = auVar49._4_4_;
          fStack_678 = auVar49._8_4_;
          fStack_674 = auVar49._12_4_;
          auVar49 = vpcmpgtd_avx(auVar186._0_16_,auVar49);
          auVar183._16_16_ = auVar123;
          auVar183._0_16_ = auVar49;
          local_600 = vblendps_avx(ZEXT1632(auVar49),auVar183,0xf0);
          local_560 = vandnps_avx(local_600,local_5e0);
          auVar326 = ZEXT3264(local_560);
          auVar186 = local_5e0 & ~local_600;
          local_820 = auVar41;
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar186 >> 0x7f,0) == '\0') &&
                (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar186 >> 0xbf,0) == '\0') &&
              (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar186[0x1f]) {
            fVar221 = (ray->super_RayK<1>).tfar;
            auVar140._4_4_ = fVar221;
            auVar140._0_4_ = fVar221;
            auVar140._8_4_ = fVar221;
            auVar140._12_4_ = fVar221;
            auVar140._16_4_ = fVar221;
            auVar140._20_4_ = fVar221;
            auVar140._24_4_ = fVar221;
            auVar140._28_4_ = fVar221;
            local_720._0_4_ = local_520._0_4_;
            local_720._4_4_ = local_520._4_4_;
            fStack_718 = local_520._8_4_;
            fStack_714 = local_520._12_4_;
            fStack_710 = local_520._16_4_;
            fStack_70c = local_520._20_4_;
            fStack_708 = local_520._24_4_;
            fStack_704 = local_520._28_4_;
            local_8a0 = _local_520;
            fVar221 = (float)local_720._0_4_;
            fVar161 = (float)local_720._4_4_;
            fVar242 = fStack_718;
            fVar189 = fStack_714;
            fVar220 = fStack_710;
            fVar218 = fStack_70c;
            fVar243 = fStack_708;
            fVar219 = fStack_704;
            _local_720 = auVar38;
          }
          else {
            auVar214 = ZEXT3264(local_640);
            local_7e0._4_4_ = local_640._4_4_ + (float)local_760._4_4_;
            local_7e0._0_4_ = local_640._0_4_ + (float)local_760._0_4_;
            fStack_7d8 = local_640._8_4_ + fStack_758;
            fStack_7d4 = local_640._12_4_ + fStack_754;
            fStack_7d0 = local_640._16_4_ + fStack_750;
            fStack_7cc = local_640._20_4_ + fStack_74c;
            fStack_7c8 = local_640._24_4_ + fStack_748;
            fStack_7c4 = local_640._28_4_ + fStack_744;
            _local_6a0 = auVar388;
            local_9c0 = auVar132;
            local_9e0 = auVar415;
            do {
              auVar141._8_4_ = 0x7f800000;
              auVar141._0_8_ = 0x7f8000007f800000;
              auVar141._12_4_ = 0x7f800000;
              auVar141._16_4_ = 0x7f800000;
              auVar141._20_4_ = 0x7f800000;
              auVar141._24_4_ = 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar132 = auVar326._0_32_;
              auVar186 = vblendvps_avx(auVar141,auVar214._0_32_,auVar132);
              auVar37 = vshufps_avx(auVar186,auVar186,0xb1);
              auVar37 = vminps_avx(auVar186,auVar37);
              auVar38 = vshufpd_avx(auVar37,auVar37,5);
              auVar37 = vminps_avx(auVar37,auVar38);
              auVar38 = vperm2f128_avx(auVar37,auVar37,1);
              auVar37 = vminps_avx(auVar37,auVar38);
              auVar186 = vcmpps_avx(auVar186,auVar37,0);
              auVar37 = auVar132 & auVar186;
              if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar37 >> 0x7f,0) != '\0') ||
                    (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar37 >> 0xbf,0) != '\0') ||
                  (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar37[0x1f] < '\0') {
                auVar132 = vandps_avx(auVar186,auVar132);
              }
              uVar109 = vmovmskps_avx(auVar132);
              uVar112 = 0;
              if (uVar109 != 0) {
                for (; (uVar109 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
                }
              }
              uVar110 = (ulong)uVar112;
              *(undefined4 *)(local_560 + uVar110 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_840 = aVar10.x;
              fStack_83c = aVar10.y;
              fStack_838 = aVar10.z;
              aStack_834 = aVar10.field_3;
              auVar123 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar221 = local_1a0[uVar110];
              uVar112 = *(uint *)(local_4e0 + uVar110 * 4);
              if (auVar123._0_4_ < 0.0) {
                fVar161 = sqrtf(auVar123._0_4_);
              }
              else {
                auVar123 = vsqrtss_avx(auVar123,auVar123);
                fVar161 = auVar123._0_4_;
              }
              auVar49 = vminps_avx(_local_9f0,_local_a10);
              auVar123 = vmaxps_avx(_local_9f0,_local_a10);
              auVar128 = vminps_avx(_local_a00,_local_a20);
              auVar169 = vminps_avx(auVar49,auVar128);
              auVar49 = vmaxps_avx(_local_a00,_local_a20);
              auVar128 = vmaxps_avx(auVar123,auVar49);
              auVar224._8_4_ = 0x7fffffff;
              auVar224._0_8_ = 0x7fffffff7fffffff;
              auVar224._12_4_ = 0x7fffffff;
              auVar123 = vandps_avx(auVar169,auVar224);
              auVar49 = vandps_avx(auVar128,auVar224);
              auVar123 = vmaxps_avx(auVar123,auVar49);
              auVar49 = vmovshdup_avx(auVar123);
              auVar49 = vmaxss_avx(auVar49,auVar123);
              auVar123 = vshufpd_avx(auVar123,auVar123,1);
              auVar123 = vmaxss_avx(auVar123,auVar49);
              local_860 = auVar123._0_4_ * 1.9073486e-06;
              local_8c0._0_4_ = fVar161 * 1.9073486e-06;
              _local_7a0 = vshufps_avx(auVar128,auVar128,0xff);
              auVar123 = vinsertps_avx(ZEXT416(uVar112),ZEXT416((uint)fVar221),0x10);
              auVar363 = ZEXT1664(auVar123);
              lVar115 = 5;
              do {
                auVar356 = auVar363._0_16_;
                auVar49 = vmovshdup_avx(auVar356);
                fVar243 = auVar49._0_4_;
                fVar218 = 1.0 - fVar243;
                fVar221 = fVar218 * fVar218;
                fVar161 = fVar218 * fVar221;
                fVar242 = fVar243 * fVar243;
                fVar189 = fVar243 * fVar242;
                fVar220 = fVar243 * fVar218;
                auVar123 = vshufps_avx(ZEXT416((uint)(fVar189 * 0.16666667)),
                                       ZEXT416((uint)(fVar189 * 0.16666667)),0);
                auVar128 = ZEXT416((uint)((fVar189 * 4.0 + fVar161 +
                                          fVar243 * fVar220 * 12.0 + fVar218 * fVar220 * 6.0) *
                                         0.16666667));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar169 = ZEXT416((uint)((fVar161 * 4.0 + fVar189 +
                                          fVar218 * fVar220 * 12.0 + fVar243 * fVar220 * 6.0) *
                                         0.16666667));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar127 = vshufps_avx(auVar356,auVar356,0);
                auVar195._0_4_ = auVar127._0_4_ * local_840 + 0.0;
                auVar195._4_4_ = auVar127._4_4_ * fStack_83c + 0.0;
                auVar195._8_4_ = auVar127._8_4_ * fStack_838 + 0.0;
                auVar195._12_4_ = auVar127._12_4_ * aStack_834.w + 0.0;
                auVar127 = vshufps_avx(ZEXT416((uint)(fVar161 * 0.16666667)),
                                       ZEXT416((uint)(fVar161 * 0.16666667)),0);
                auVar124._0_4_ =
                     auVar127._0_4_ * (float)local_9f0._0_4_ +
                     auVar169._0_4_ * (float)local_a10._0_4_ +
                     auVar123._0_4_ * (float)local_a20._0_4_ +
                     auVar128._0_4_ * (float)local_a00._0_4_;
                auVar124._4_4_ =
                     auVar127._4_4_ * (float)local_9f0._4_4_ +
                     auVar169._4_4_ * (float)local_a10._4_4_ +
                     auVar123._4_4_ * (float)local_a20._4_4_ +
                     auVar128._4_4_ * (float)local_a00._4_4_;
                auVar124._8_4_ =
                     auVar127._8_4_ * fStack_9e8 +
                     auVar169._8_4_ * fStack_a08 +
                     auVar123._8_4_ * fStack_a18 + auVar128._8_4_ * fStack_9f8;
                auVar124._12_4_ =
                     auVar127._12_4_ * fStack_9e4 +
                     auVar169._12_4_ * fStack_a04 +
                     auVar123._12_4_ * fStack_a14 + auVar128._12_4_ * fStack_9f4;
                local_880._0_16_ = auVar124;
                auVar123 = vsubps_avx(auVar195,auVar124);
                _local_a60 = auVar123;
                auVar123 = vdpps_avx(auVar123,auVar123,0x7f);
                fVar161 = auVar123._0_4_;
                if (fVar161 < 0.0) {
                  local_a40._0_16_ = auVar49;
                  local_980._0_4_ = fVar242;
                  local_9a0._0_4_ = fVar221;
                  local_8e0._0_4_ = fVar220;
                  fVar189 = sqrtf(fVar161);
                  fVar221 = (float)local_9a0._0_4_;
                  fVar242 = (float)local_980._0_4_;
                  fVar220 = (float)local_8e0._0_4_;
                  auVar49 = local_a40._0_16_;
                }
                else {
                  auVar128 = vsqrtss_avx(auVar123,auVar123);
                  fVar189 = auVar128._0_4_;
                }
                fVar243 = auVar49._0_4_;
                auVar49 = vshufps_avx(ZEXT416((uint)(fVar242 * 0.5)),ZEXT416((uint)(fVar242 * 0.5)),
                                      0);
                auVar128 = ZEXT416((uint)((fVar221 + fVar220 * 4.0) * 0.5));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar169 = ZEXT416((uint)((fVar243 * -fVar243 - fVar220 * 4.0) * 0.5));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar127 = ZEXT416((uint)(fVar218 * -fVar218 * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar339._0_4_ =
                     (float)local_9f0._0_4_ * auVar127._0_4_ +
                     (float)local_a10._0_4_ * auVar169._0_4_ +
                     (float)local_a20._0_4_ * auVar49._0_4_ +
                     (float)local_a00._0_4_ * auVar128._0_4_;
                auVar339._4_4_ =
                     (float)local_9f0._4_4_ * auVar127._4_4_ +
                     (float)local_a10._4_4_ * auVar169._4_4_ +
                     (float)local_a20._4_4_ * auVar49._4_4_ +
                     (float)local_a00._4_4_ * auVar128._4_4_;
                auVar339._8_4_ =
                     fStack_9e8 * auVar127._8_4_ +
                     fStack_a08 * auVar169._8_4_ +
                     fStack_a18 * auVar49._8_4_ + fStack_9f8 * auVar128._8_4_;
                auVar339._12_4_ =
                     fStack_9e4 * auVar127._12_4_ +
                     fStack_a04 * auVar169._12_4_ +
                     fStack_a14 * auVar49._12_4_ + fStack_9f4 * auVar128._12_4_;
                auVar49 = vshufps_avx(auVar356,auVar356,0x55);
                auVar128 = ZEXT416((uint)(fVar218 - (fVar243 + fVar243)));
                auVar169 = vshufps_avx(auVar128,auVar128,0);
                auVar128 = ZEXT416((uint)(fVar243 - (fVar218 + fVar218)));
                auVar127 = vshufps_avx(auVar128,auVar128,0);
                auVar12 = vshufps_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),0);
                auVar128 = vdpps_avx(auVar339,auVar339,0x7f);
                auVar165._0_4_ =
                     (float)local_9f0._0_4_ * auVar12._0_4_ +
                     (float)local_a10._0_4_ * auVar127._0_4_ +
                     (float)local_a20._0_4_ * auVar49._0_4_ +
                     (float)local_a00._0_4_ * auVar169._0_4_;
                auVar165._4_4_ =
                     (float)local_9f0._4_4_ * auVar12._4_4_ +
                     (float)local_a10._4_4_ * auVar127._4_4_ +
                     (float)local_a20._4_4_ * auVar49._4_4_ +
                     (float)local_a00._4_4_ * auVar169._4_4_;
                auVar165._8_4_ =
                     fStack_9e8 * auVar12._8_4_ +
                     fStack_a08 * auVar127._8_4_ +
                     fStack_a18 * auVar49._8_4_ + fStack_9f8 * auVar169._8_4_;
                auVar165._12_4_ =
                     fStack_9e4 * auVar12._12_4_ +
                     fStack_a04 * auVar127._12_4_ +
                     fStack_a14 * auVar49._12_4_ + fStack_9f4 * auVar169._12_4_;
                auVar49 = vblendps_avx(auVar128,_DAT_01f7aa10,0xe);
                auVar169 = vrsqrtss_avx(auVar49,auVar49);
                fVar242 = auVar169._0_4_;
                fVar221 = auVar128._0_4_;
                auVar169 = vdpps_avx(auVar339,auVar165,0x7f);
                auVar127 = vshufps_avx(auVar128,auVar128,0);
                auVar166._0_4_ = auVar165._0_4_ * auVar127._0_4_;
                auVar166._4_4_ = auVar165._4_4_ * auVar127._4_4_;
                auVar166._8_4_ = auVar165._8_4_ * auVar127._8_4_;
                auVar166._12_4_ = auVar165._12_4_ * auVar127._12_4_;
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar250._0_4_ = auVar339._0_4_ * auVar169._0_4_;
                auVar250._4_4_ = auVar339._4_4_ * auVar169._4_4_;
                auVar250._8_4_ = auVar339._8_4_ * auVar169._8_4_;
                auVar250._12_4_ = auVar339._12_4_ * auVar169._12_4_;
                auVar12 = vsubps_avx(auVar166,auVar250);
                auVar169 = vrcpss_avx(auVar49,auVar49);
                auVar49 = vmaxss_avx(ZEXT416((uint)local_860),
                                     ZEXT416((uint)(auVar363._0_4_ * (float)local_8c0._0_4_)));
                auVar169 = ZEXT416((uint)(auVar169._0_4_ * (2.0 - fVar221 * auVar169._0_4_)));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                uVar110 = CONCAT44(auVar339._4_4_,auVar339._0_4_);
                auVar272._0_8_ = uVar110 ^ 0x8000000080000000;
                auVar272._8_4_ = -auVar339._8_4_;
                auVar272._12_4_ = -auVar339._12_4_;
                auVar127 = ZEXT416((uint)(fVar242 * 1.5 +
                                         fVar221 * -0.5 * fVar242 * fVar242 * fVar242));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar225._0_4_ = auVar127._0_4_ * auVar12._0_4_ * auVar169._0_4_;
                auVar225._4_4_ = auVar127._4_4_ * auVar12._4_4_ * auVar169._4_4_;
                auVar225._8_4_ = auVar127._8_4_ * auVar12._8_4_ * auVar169._8_4_;
                auVar225._12_4_ = auVar127._12_4_ * auVar12._12_4_ * auVar169._12_4_;
                auVar297._0_4_ = auVar339._0_4_ * auVar127._0_4_;
                auVar297._4_4_ = auVar339._4_4_ * auVar127._4_4_;
                auVar297._8_4_ = auVar339._8_4_ * auVar127._8_4_;
                auVar297._12_4_ = auVar339._12_4_ * auVar127._12_4_;
                local_a40._0_4_ = auVar49._0_4_;
                if (fVar221 < 0.0) {
                  local_980._0_4_ = fVar189;
                  local_9a0._0_16_ = auVar272;
                  local_8e0._0_16_ = auVar297;
                  local_820._0_16_ = auVar225;
                  fVar242 = sqrtf(fVar221);
                  auVar225 = local_820._0_16_;
                  auVar272 = local_9a0._0_16_;
                  auVar297 = local_8e0._0_16_;
                  fVar221 = (float)local_a40._0_4_;
                }
                else {
                  auVar128 = vsqrtss_avx(auVar128,auVar128);
                  fVar242 = auVar128._0_4_;
                  local_980._0_4_ = fVar189;
                  fVar221 = auVar49._0_4_;
                }
                auVar49 = vdpps_avx(_local_a60,auVar297,0x7f);
                fVar242 = (local_860 / fVar242) * ((float)local_980._0_4_ + 1.0) +
                          fVar221 + (float)local_980._0_4_ * local_860;
                auVar128 = vdpps_avx(auVar272,auVar297,0x7f);
                auVar169 = vdpps_avx(_local_a60,auVar225,0x7f);
                auVar103._4_4_ = fStack_83c;
                auVar103._0_4_ = local_840;
                auVar103._8_4_ = fStack_838;
                auVar103._12_4_ = aStack_834.a;
                auVar127 = vdpps_avx(auVar103,auVar297,0x7f);
                auVar12 = vdpps_avx(_local_a60,auVar272,0x7f);
                fVar189 = auVar128._0_4_ + auVar169._0_4_;
                fVar220 = auVar49._0_4_;
                auVar125._0_4_ = fVar220 * fVar220;
                auVar125._4_4_ = auVar49._4_4_ * auVar49._4_4_;
                auVar125._8_4_ = auVar49._8_4_ * auVar49._8_4_;
                auVar125._12_4_ = auVar49._12_4_ * auVar49._12_4_;
                auVar169 = vsubps_avx(auVar123,auVar125);
                local_980._0_16_ = ZEXT416((uint)fVar189);
                auVar128 = vdpps_avx(_local_a60,auVar103,0x7f);
                fVar218 = auVar12._0_4_ - fVar220 * fVar189;
                fVar220 = auVar128._0_4_ - fVar220 * auVar127._0_4_;
                auVar128 = vrsqrtss_avx(auVar169,auVar169);
                fVar243 = auVar169._0_4_;
                fVar189 = auVar128._0_4_;
                fVar189 = fVar189 * 1.5 + fVar243 * -0.5 * fVar189 * fVar189 * fVar189;
                if (fVar243 < 0.0) {
                  local_9a0._0_16_ = auVar49;
                  local_8e0._0_4_ = fVar242;
                  local_820._0_16_ = auVar127;
                  local_780._0_4_ = fVar218;
                  local_900._0_4_ = fVar220;
                  local_8a0._0_4_ = fVar189;
                  fVar243 = sqrtf(fVar243);
                  fVar189 = (float)local_8a0._0_4_;
                  fVar218 = (float)local_780._0_4_;
                  fVar220 = (float)local_900._0_4_;
                  auVar127 = local_820._0_16_;
                  auVar49 = local_9a0._0_16_;
                  fVar242 = (float)local_8e0._0_4_;
                  fVar221 = (float)local_a40._0_4_;
                }
                else {
                  auVar128 = vsqrtss_avx(auVar169,auVar169);
                  fVar243 = auVar128._0_4_;
                }
                auVar400 = ZEXT3264(local_9c0);
                auVar12 = vpermilps_avx(local_880._0_16_,0xff);
                auVar13 = vshufps_avx(auVar339,auVar339,0xff);
                fVar219 = fVar218 * fVar189 - auVar13._0_4_;
                auVar251._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
                auVar251._8_4_ = auVar127._8_4_ ^ 0x80000000;
                auVar251._12_4_ = auVar127._12_4_ ^ 0x80000000;
                auVar273._0_4_ = -fVar219;
                auVar273._4_4_ = 0x80000000;
                auVar273._8_4_ = 0x80000000;
                auVar273._12_4_ = 0x80000000;
                auVar284 = ZEXT1664(auVar273);
                fVar218 = local_980._0_4_ * fVar220 * fVar189;
                auVar306 = ZEXT464((uint)fVar218);
                auVar128 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar220 * fVar189)),0x1c);
                auVar127 = vmovsldup_avx(ZEXT416((uint)(fVar218 - auVar127._0_4_ * fVar219)));
                auVar128 = vdivps_avx(auVar128,auVar127);
                auVar169 = vinsertps_avx(local_980._0_16_,auVar251,0x10);
                auVar169 = vdivps_avx(auVar169,auVar127);
                auVar127 = vmovsldup_avx(auVar49);
                auVar130 = ZEXT416((uint)(fVar243 - auVar12._0_4_));
                auVar12 = vmovsldup_avx(auVar130);
                auVar196._0_4_ = auVar127._0_4_ * auVar128._0_4_ + auVar12._0_4_ * auVar169._0_4_;
                auVar196._4_4_ = auVar127._4_4_ * auVar128._4_4_ + auVar12._4_4_ * auVar169._4_4_;
                auVar196._8_4_ = auVar127._8_4_ * auVar128._8_4_ + auVar12._8_4_ * auVar169._8_4_;
                auVar196._12_4_ =
                     auVar127._12_4_ * auVar128._12_4_ + auVar12._12_4_ * auVar169._12_4_;
                auVar128 = vsubps_avx(auVar356,auVar196);
                auVar363 = ZEXT1664(auVar128);
                auVar197._8_4_ = 0x7fffffff;
                auVar197._0_8_ = 0x7fffffff7fffffff;
                auVar197._12_4_ = 0x7fffffff;
                auVar49 = vandps_avx(auVar49,auVar197);
                if (auVar49._0_4_ < fVar242) {
                  auVar226._8_4_ = 0x7fffffff;
                  auVar226._0_8_ = 0x7fffffff7fffffff;
                  auVar226._12_4_ = 0x7fffffff;
                  auVar49 = vandps_avx(auVar130,auVar226);
                  if (auVar49._0_4_ < (float)local_7a0._0_4_ * 1.9073486e-06 + fVar221 + fVar242) {
                    fVar221 = auVar128._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar221) {
                      fVar242 = (ray->super_RayK<1>).tfar;
                      auVar306 = ZEXT464((uint)fVar242);
                      if (fVar221 <= fVar242) {
                        auVar49 = vmovshdup_avx(auVar128);
                        fVar189 = auVar49._0_4_;
                        if ((0.0 <= fVar189) && (fVar189 <= 1.0)) {
                          auVar123 = vrsqrtss_avx(auVar123,auVar123);
                          fVar220 = auVar123._0_4_;
                          auVar284 = ZEXT464((uint)(fVar161 * -0.5));
                          pGVar30 = (context->scene->geometries).items[uVar114].ptr;
                          if ((pGVar30->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar123 = ZEXT416((uint)(fVar220 * 1.5 +
                                                     fVar161 * -0.5 * fVar220 * fVar220 * fVar220));
                            auVar123 = vshufps_avx(auVar123,auVar123,0);
                            auVar227._0_4_ = auVar123._0_4_ * (float)local_a60._0_4_;
                            auVar227._4_4_ = auVar123._4_4_ * (float)local_a60._4_4_;
                            auVar227._8_4_ = auVar123._8_4_ * fStack_a58;
                            auVar227._12_4_ = auVar123._12_4_ * fStack_a54;
                            auVar167._0_4_ = auVar339._0_4_ + auVar13._0_4_ * auVar227._0_4_;
                            auVar167._4_4_ = auVar339._4_4_ + auVar13._4_4_ * auVar227._4_4_;
                            auVar167._8_4_ = auVar339._8_4_ + auVar13._8_4_ * auVar227._8_4_;
                            auVar167._12_4_ = auVar339._12_4_ + auVar13._12_4_ * auVar227._12_4_;
                            auVar123 = vshufps_avx(auVar227,auVar227,0xc9);
                            auVar49 = vshufps_avx(auVar339,auVar339,0xc9);
                            auVar228._0_4_ = auVar49._0_4_ * auVar227._0_4_;
                            auVar228._4_4_ = auVar49._4_4_ * auVar227._4_4_;
                            auVar228._8_4_ = auVar49._8_4_ * auVar227._8_4_;
                            auVar228._12_4_ = auVar49._12_4_ * auVar227._12_4_;
                            auVar252._0_4_ = auVar339._0_4_ * auVar123._0_4_;
                            auVar252._4_4_ = auVar339._4_4_ * auVar123._4_4_;
                            auVar252._8_4_ = auVar339._8_4_ * auVar123._8_4_;
                            auVar252._12_4_ = auVar339._12_4_ * auVar123._12_4_;
                            auVar169 = vsubps_avx(auVar252,auVar228);
                            auVar123 = vshufps_avx(auVar169,auVar169,0xc9);
                            auVar49 = vshufps_avx(auVar167,auVar167,0xc9);
                            auVar284 = ZEXT1664(auVar49);
                            auVar253._0_4_ = auVar49._0_4_ * auVar123._0_4_;
                            auVar253._4_4_ = auVar49._4_4_ * auVar123._4_4_;
                            auVar253._8_4_ = auVar49._8_4_ * auVar123._8_4_;
                            auVar253._12_4_ = auVar49._12_4_ * auVar123._12_4_;
                            auVar123 = vshufps_avx(auVar169,auVar169,0xd2);
                            auVar168._0_4_ = auVar167._0_4_ * auVar123._0_4_;
                            auVar168._4_4_ = auVar167._4_4_ * auVar123._4_4_;
                            auVar168._8_4_ = auVar167._8_4_ * auVar123._8_4_;
                            auVar168._12_4_ = auVar167._12_4_ * auVar123._12_4_;
                            auVar123 = vsubps_avx(auVar253,auVar168);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar221;
                              auVar49 = vshufps_avx(auVar123,auVar123,0xe9);
                              uVar9 = vmovlps_avx(auVar49);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                              (ray->Ng).field_0.field_0.z = auVar123._0_4_;
                              ray->u = fVar189;
                              ray->v = 0.0;
                              ray->primID = local_920._0_4_;
                              ray->geomID = uVar114;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar169 = vshufps_avx(auVar123,auVar123,0xe9);
                              local_950 = vmovlps_avx(auVar169);
                              local_948 = auVar123._0_4_;
                              local_944 = fVar189;
                              local_940 = 0;
                              local_93c = local_920._0_4_;
                              local_938 = uVar114;
                              local_934 = context->user->instID[0];
                              local_930 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar221;
                              local_740._0_4_ = 0xffffffff;
                              local_a98.valid = (int *)local_740;
                              local_a98.geometryUserPtr = pGVar30->userPtr;
                              local_a98.context = context->user;
                              local_a98.hit = (RTCHitN *)&local_950;
                              local_a98.N = 1;
                              local_a98.ray = (RTCRayN *)ray;
                              if (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113bfaf:
                                p_Var34 = context->args->filter;
                                if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar30->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar284 = ZEXT1664(auVar284._0_16_);
                                  auVar306 = ZEXT1664(auVar306._0_16_);
                                  auVar363 = ZEXT1664(auVar363._0_16_);
                                  (*p_Var34)(&local_a98);
                                  if (*local_a98.valid == 0) goto LAB_0113c043;
                                }
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a98.hit;
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a98.hit + 4);
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a98.hit + 8);
                                *(float *)((long)local_a98.ray + 0x3c) =
                                     *(float *)(local_a98.hit + 0xc);
                                *(float *)((long)local_a98.ray + 0x40) =
                                     *(float *)(local_a98.hit + 0x10);
                                *(float *)((long)local_a98.ray + 0x44) =
                                     *(float *)(local_a98.hit + 0x14);
                                *(float *)((long)local_a98.ray + 0x48) =
                                     *(float *)(local_a98.hit + 0x18);
                                *(float *)((long)local_a98.ray + 0x4c) =
                                     *(float *)(local_a98.hit + 0x1c);
                                *(float *)((long)local_a98.ray + 0x50) =
                                     *(float *)(local_a98.hit + 0x20);
                              }
                              else {
                                auVar284 = ZEXT1664(auVar49);
                                auVar306 = ZEXT464((uint)fVar242);
                                auVar363 = ZEXT1664(auVar128);
                                (*pGVar30->intersectionFilterN)(&local_a98);
                                if (*local_a98.valid != 0) goto LAB_0113bfaf;
LAB_0113c043:
                                (ray->super_RayK<1>).tfar = fVar242;
                              }
                              auVar400 = ZEXT3264(local_9c0);
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar115 = lVar115 + -1;
              } while (lVar115 != 0);
              auVar186 = local_560;
              fVar221 = (ray->super_RayK<1>).tfar;
              auVar140._4_4_ = fVar221;
              auVar140._0_4_ = fVar221;
              auVar140._8_4_ = fVar221;
              auVar140._12_4_ = fVar221;
              auVar140._16_4_ = fVar221;
              auVar140._20_4_ = fVar221;
              auVar140._24_4_ = fVar221;
              auVar140._28_4_ = fVar221;
              auVar132 = vcmpps_avx(_local_7e0,auVar140,2);
              local_560 = vandps_avx(auVar132,local_560);
              auVar326 = ZEXT3264(local_560);
              auVar186 = auVar186 & auVar132;
              auVar214 = ZEXT3264(local_640);
              auVar357 = local_7c0._0_28_;
            } while ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar186 >> 0x7f,0) != '\0') ||
                       (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar186 >> 0xbf,0) != '\0') ||
                     (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar186[0x1f] < '\0');
            auVar326 = ZEXT3264(_local_520);
            local_8a0 = _local_520;
            auVar390 = ZEXT3264(_local_6a0);
            auVar417 = ZEXT3264(local_9e0);
            fVar221 = (float)local_720._0_4_;
            fVar161 = (float)local_720._4_4_;
            fVar242 = fStack_718;
            fVar189 = fStack_714;
            fVar220 = fStack_710;
            fVar218 = fStack_70c;
            fVar243 = fStack_708;
            fVar219 = fStack_704;
          }
          auVar184._0_4_ =
               auVar357._0_4_ * (float)local_6c0._0_4_ +
               auVar390._0_4_ * (float)local_6e0._0_4_ + auVar417._0_4_ * (float)local_700._0_4_;
          auVar184._4_4_ =
               auVar357._4_4_ * (float)local_6c0._4_4_ +
               auVar390._4_4_ * (float)local_6e0._4_4_ + auVar417._4_4_ * (float)local_700._4_4_;
          auVar184._8_4_ =
               auVar357._8_4_ * fStack_6b8 +
               auVar390._8_4_ * fStack_6d8 + auVar417._8_4_ * fStack_6f8;
          auVar184._12_4_ =
               auVar357._12_4_ * fStack_6b4 +
               auVar390._12_4_ * fStack_6d4 + auVar417._12_4_ * fStack_6f4;
          auVar184._16_4_ =
               auVar357._16_4_ * fStack_6b0 +
               auVar390._16_4_ * fStack_6d0 + auVar417._16_4_ * fStack_6f0;
          auVar184._20_4_ =
               auVar357._20_4_ * fStack_6ac +
               auVar390._20_4_ * fStack_6cc + auVar417._20_4_ * fStack_6ec;
          auVar184._24_4_ =
               auVar357._24_4_ * fStack_6a8 +
               auVar390._24_4_ * fStack_6c8 + auVar417._24_4_ * fStack_6e8;
          auVar184._28_4_ = auVar214._28_4_ + auVar214._28_4_ + auVar326._28_4_;
          auVar209._8_4_ = 0x7fffffff;
          auVar209._0_8_ = 0x7fffffff7fffffff;
          auVar209._12_4_ = 0x7fffffff;
          auVar209._16_4_ = 0x7fffffff;
          auVar209._20_4_ = 0x7fffffff;
          auVar209._24_4_ = 0x7fffffff;
          auVar209._28_4_ = 0x7fffffff;
          auVar132 = vandps_avx(auVar184,auVar209);
          auVar210._8_4_ = 0x3e99999a;
          auVar210._0_8_ = 0x3e99999a3e99999a;
          auVar210._12_4_ = 0x3e99999a;
          auVar210._16_4_ = 0x3e99999a;
          auVar210._20_4_ = 0x3e99999a;
          auVar210._24_4_ = 0x3e99999a;
          auVar210._28_4_ = 0x3e99999a;
          auVar132 = vcmpps_avx(auVar132,auVar210,1);
          auVar186 = vorps_avx(auVar132,_local_620);
          auVar211._0_4_ = (float)local_760._0_4_ + fVar221;
          auVar211._4_4_ = (float)local_760._4_4_ + fVar161;
          auVar211._8_4_ = fStack_758 + fVar242;
          auVar211._12_4_ = fStack_754 + fVar189;
          auVar211._16_4_ = fStack_750 + fVar220;
          auVar211._20_4_ = fStack_74c + fVar218;
          auVar211._24_4_ = fStack_748 + fVar243;
          auVar211._28_4_ = fStack_744 + fVar219;
          auVar132 = vcmpps_avx(auVar211,auVar140,2);
          _local_7e0 = vandps_avx(auVar400._0_32_,auVar132);
          auVar212._8_4_ = 3;
          auVar212._0_8_ = 0x300000003;
          auVar212._12_4_ = 3;
          auVar212._16_4_ = 3;
          auVar212._20_4_ = 3;
          auVar212._24_4_ = 3;
          auVar212._28_4_ = 3;
          auVar241._8_4_ = 2;
          auVar241._0_8_ = 0x200000002;
          auVar241._12_4_ = 2;
          auVar241._16_4_ = 2;
          auVar241._20_4_ = 2;
          auVar241._24_4_ = 2;
          auVar241._28_4_ = 2;
          auVar132 = vblendvps_avx(auVar241,auVar212,auVar186);
          auVar106._4_4_ = fStack_67c;
          auVar106._0_4_ = local_680;
          auVar106._8_4_ = fStack_678;
          auVar106._12_4_ = fStack_674;
          auVar123 = vpcmpgtd_avx(auVar132._16_16_,auVar106);
          auVar49 = vpshufd_avx(local_660._0_16_,0);
          auVar49 = vpcmpgtd_avx(auVar132._0_16_,auVar49);
          auVar213._16_16_ = auVar123;
          auVar213._0_16_ = auVar140._0_16_;
          local_7c0 = vblendps_avx(ZEXT1632(auVar49),auVar213,0xf0);
          local_740 = vandnps_avx(local_7c0,_local_7e0);
          auVar132 = _local_7e0 & ~local_7c0;
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar132 >> 0x7f,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0xbf,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar132[0x1f] < '\0') {
            local_7a0._4_4_ = (float)local_760._4_4_ + local_520._4_4_;
            local_7a0._0_4_ = (float)local_760._0_4_ + local_520._0_4_;
            fStack_798 = fStack_758 + local_520._8_4_;
            fStack_794 = fStack_754 + local_520._12_4_;
            fStack_790 = fStack_750 + local_520._16_4_;
            fStack_78c = fStack_74c + local_520._20_4_;
            fStack_788 = fStack_748 + local_520._24_4_;
            fStack_784 = fStack_744 + local_520._28_4_;
            local_8a0 = _local_520;
            do {
              auVar142._8_4_ = 0x7f800000;
              auVar142._0_8_ = 0x7f8000007f800000;
              auVar142._12_4_ = 0x7f800000;
              auVar142._16_4_ = 0x7f800000;
              auVar142._20_4_ = 0x7f800000;
              auVar142._24_4_ = 0x7f800000;
              auVar142._28_4_ = 0x7f800000;
              auVar132 = vblendvps_avx(auVar142,local_8a0,local_740);
              auVar186 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar186 = vminps_avx(auVar132,auVar186);
              auVar37 = vshufpd_avx(auVar186,auVar186,5);
              auVar186 = vminps_avx(auVar186,auVar37);
              auVar37 = vperm2f128_avx(auVar186,auVar186,1);
              auVar186 = vminps_avx(auVar186,auVar37);
              auVar186 = vcmpps_avx(auVar132,auVar186,0);
              auVar37 = local_740 & auVar186;
              auVar132 = local_740;
              if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar37 >> 0x7f,0) != '\0') ||
                    (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar37 >> 0xbf,0) != '\0') ||
                  (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar37[0x1f] < '\0') {
                auVar132 = vandps_avx(auVar186,local_740);
              }
              uVar109 = vmovmskps_avx(auVar132);
              uVar112 = 0;
              if (uVar109 != 0) {
                for (; (uVar109 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
                }
              }
              uVar110 = (ulong)uVar112;
              *(undefined4 *)(local_740 + uVar110 * 4) = 0;
              aVar10 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_840 = aVar10.x;
              fStack_83c = aVar10.y;
              fStack_838 = aVar10.z;
              aStack_834 = aVar10.field_3;
              auVar123 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
              fVar221 = local_1c0[uVar110];
              uVar112 = *(uint *)(local_500 + uVar110 * 4);
              if (auVar123._0_4_ < 0.0) {
                fVar161 = sqrtf(auVar123._0_4_);
              }
              else {
                auVar123 = vsqrtss_avx(auVar123,auVar123);
                fVar161 = auVar123._0_4_;
              }
              auVar49 = vminps_avx(_local_9f0,_local_a10);
              auVar123 = vmaxps_avx(_local_9f0,_local_a10);
              auVar128 = vminps_avx(_local_a00,_local_a20);
              auVar169 = vminps_avx(auVar49,auVar128);
              auVar49 = vmaxps_avx(_local_a00,_local_a20);
              auVar128 = vmaxps_avx(auVar123,auVar49);
              auVar229._8_4_ = 0x7fffffff;
              auVar229._0_8_ = 0x7fffffff7fffffff;
              auVar229._12_4_ = 0x7fffffff;
              auVar123 = vandps_avx(auVar169,auVar229);
              auVar49 = vandps_avx(auVar128,auVar229);
              auVar123 = vmaxps_avx(auVar123,auVar49);
              auVar49 = vmovshdup_avx(auVar123);
              auVar49 = vmaxss_avx(auVar49,auVar123);
              auVar123 = vshufpd_avx(auVar123,auVar123,1);
              auVar123 = vmaxss_avx(auVar123,auVar49);
              local_860 = auVar123._0_4_ * 1.9073486e-06;
              local_980._0_4_ = fVar161 * 1.9073486e-06;
              _local_900 = vshufps_avx(auVar128,auVar128,0xff);
              auVar123 = vinsertps_avx(ZEXT416(uVar112),ZEXT416((uint)fVar221),0x10);
              auVar363 = ZEXT1664(auVar123);
              lVar115 = 5;
              do {
                auVar356 = auVar363._0_16_;
                auVar49 = vmovshdup_avx(auVar356);
                fVar221 = auVar49._0_4_;
                fVar243 = 1.0 - fVar221;
                fVar161 = fVar243 * fVar243;
                fVar242 = fVar243 * fVar161;
                fVar189 = fVar221 * fVar221;
                fVar220 = fVar221 * fVar189;
                fVar218 = fVar221 * fVar243;
                auVar123 = vshufps_avx(ZEXT416((uint)(fVar220 * 0.16666667)),
                                       ZEXT416((uint)(fVar220 * 0.16666667)),0);
                auVar128 = ZEXT416((uint)((fVar220 * 4.0 + fVar242 +
                                          fVar221 * fVar218 * 12.0 + fVar243 * fVar218 * 6.0) *
                                         0.16666667));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar169 = ZEXT416((uint)((fVar242 * 4.0 + fVar220 +
                                          fVar243 * fVar218 * 12.0 + fVar221 * fVar218 * 6.0) *
                                         0.16666667));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar127 = vshufps_avx(auVar356,auVar356,0);
                auVar198._0_4_ = auVar127._0_4_ * local_840 + 0.0;
                auVar198._4_4_ = auVar127._4_4_ * fStack_83c + 0.0;
                auVar198._8_4_ = auVar127._8_4_ * fStack_838 + 0.0;
                auVar198._12_4_ = auVar127._12_4_ * aStack_834.w + 0.0;
                auVar127 = vshufps_avx(ZEXT416((uint)(fVar242 * 0.16666667)),
                                       ZEXT416((uint)(fVar242 * 0.16666667)),0);
                auVar126._0_4_ =
                     auVar127._0_4_ * (float)local_9f0._0_4_ +
                     auVar169._0_4_ * (float)local_a10._0_4_ +
                     auVar123._0_4_ * (float)local_a20._0_4_ +
                     auVar128._0_4_ * (float)local_a00._0_4_;
                auVar126._4_4_ =
                     auVar127._4_4_ * (float)local_9f0._4_4_ +
                     auVar169._4_4_ * (float)local_a10._4_4_ +
                     auVar123._4_4_ * (float)local_a20._4_4_ +
                     auVar128._4_4_ * (float)local_a00._4_4_;
                auVar126._8_4_ =
                     auVar127._8_4_ * fStack_9e8 +
                     auVar169._8_4_ * fStack_a08 +
                     auVar123._8_4_ * fStack_a18 + auVar128._8_4_ * fStack_9f8;
                auVar126._12_4_ =
                     auVar127._12_4_ * fStack_9e4 +
                     auVar169._12_4_ * fStack_a04 +
                     auVar123._12_4_ * fStack_a14 + auVar128._12_4_ * fStack_9f4;
                local_880._0_16_ = auVar126;
                auVar123 = vsubps_avx(auVar198,auVar126);
                _local_a60 = auVar123;
                auVar123 = vdpps_avx(auVar123,auVar123,0x7f);
                fVar242 = auVar123._0_4_;
                local_b00 = auVar363._0_4_;
                if (fVar242 < 0.0) {
                  local_a40._0_16_ = auVar49;
                  local_8c0._0_4_ = fVar189;
                  local_9c0._0_4_ = fVar161;
                  local_9e0._0_4_ = fVar218;
                  fVar220 = sqrtf(fVar242);
                  fVar189 = (float)local_8c0._0_4_;
                  fVar161 = (float)local_9c0._0_4_;
                  fVar218 = (float)local_9e0._0_4_;
                  fVar221 = (float)local_a40._0_4_;
                }
                else {
                  auVar49 = vsqrtss_avx(auVar123,auVar123);
                  fVar220 = auVar49._0_4_;
                }
                auVar49 = vshufps_avx(ZEXT416((uint)(fVar189 * 0.5)),ZEXT416((uint)(fVar189 * 0.5)),
                                      0);
                auVar128 = ZEXT416((uint)((fVar161 + fVar218 * 4.0) * 0.5));
                auVar128 = vshufps_avx(auVar128,auVar128,0);
                auVar169 = ZEXT416((uint)((fVar221 * -fVar221 - fVar218 * 4.0) * 0.5));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar127 = ZEXT416((uint)(fVar243 * -fVar243 * 0.5));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar340._0_4_ =
                     (float)local_9f0._0_4_ * auVar127._0_4_ +
                     (float)local_a10._0_4_ * auVar169._0_4_ +
                     (float)local_a20._0_4_ * auVar49._0_4_ +
                     (float)local_a00._0_4_ * auVar128._0_4_;
                auVar340._4_4_ =
                     (float)local_9f0._4_4_ * auVar127._4_4_ +
                     (float)local_a10._4_4_ * auVar169._4_4_ +
                     (float)local_a20._4_4_ * auVar49._4_4_ +
                     (float)local_a00._4_4_ * auVar128._4_4_;
                auVar340._8_4_ =
                     fStack_9e8 * auVar127._8_4_ +
                     fStack_a08 * auVar169._8_4_ +
                     fStack_a18 * auVar49._8_4_ + fStack_9f8 * auVar128._8_4_;
                auVar340._12_4_ =
                     fStack_9e4 * auVar127._12_4_ +
                     fStack_a04 * auVar169._12_4_ +
                     fStack_a14 * auVar49._12_4_ + fStack_9f4 * auVar128._12_4_;
                auVar49 = vshufps_avx(auVar356,auVar356,0x55);
                auVar128 = ZEXT416((uint)(fVar243 - (fVar221 + fVar221)));
                auVar169 = vshufps_avx(auVar128,auVar128,0);
                auVar128 = ZEXT416((uint)(fVar221 - (fVar243 + fVar243)));
                auVar127 = vshufps_avx(auVar128,auVar128,0);
                auVar12 = vshufps_avx(ZEXT416((uint)fVar243),ZEXT416((uint)fVar243),0);
                auVar128 = vdpps_avx(auVar340,auVar340,0x7f);
                auVar170._0_4_ =
                     (float)local_9f0._0_4_ * auVar12._0_4_ +
                     (float)local_a10._0_4_ * auVar127._0_4_ +
                     (float)local_a20._0_4_ * auVar49._0_4_ +
                     (float)local_a00._0_4_ * auVar169._0_4_;
                auVar170._4_4_ =
                     (float)local_9f0._4_4_ * auVar12._4_4_ +
                     (float)local_a10._4_4_ * auVar127._4_4_ +
                     (float)local_a20._4_4_ * auVar49._4_4_ +
                     (float)local_a00._4_4_ * auVar169._4_4_;
                auVar170._8_4_ =
                     fStack_9e8 * auVar12._8_4_ +
                     fStack_a08 * auVar127._8_4_ +
                     fStack_a18 * auVar49._8_4_ + fStack_9f8 * auVar169._8_4_;
                auVar170._12_4_ =
                     fStack_9e4 * auVar12._12_4_ +
                     fStack_a04 * auVar127._12_4_ +
                     fStack_a14 * auVar49._12_4_ + fStack_9f4 * auVar169._12_4_;
                auVar49 = vblendps_avx(auVar128,_DAT_01f7aa10,0xe);
                auVar169 = vrsqrtss_avx(auVar49,auVar49);
                fVar161 = auVar169._0_4_;
                fVar221 = auVar128._0_4_;
                auVar169 = vdpps_avx(auVar340,auVar170,0x7f);
                auVar127 = vshufps_avx(auVar128,auVar128,0);
                auVar171._0_4_ = auVar170._0_4_ * auVar127._0_4_;
                auVar171._4_4_ = auVar170._4_4_ * auVar127._4_4_;
                auVar171._8_4_ = auVar170._8_4_ * auVar127._8_4_;
                auVar171._12_4_ = auVar170._12_4_ * auVar127._12_4_;
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar254._0_4_ = auVar340._0_4_ * auVar169._0_4_;
                auVar254._4_4_ = auVar340._4_4_ * auVar169._4_4_;
                auVar254._8_4_ = auVar340._8_4_ * auVar169._8_4_;
                auVar254._12_4_ = auVar340._12_4_ * auVar169._12_4_;
                auVar12 = vsubps_avx(auVar171,auVar254);
                auVar169 = vrcpss_avx(auVar49,auVar49);
                auVar49 = vmaxss_avx(ZEXT416((uint)local_860),
                                     ZEXT416((uint)(local_b00 * (float)local_980._0_4_)));
                auVar390 = ZEXT1664(auVar49);
                auVar169 = ZEXT416((uint)(auVar169._0_4_ * (2.0 - fVar221 * auVar169._0_4_)));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                uVar110 = CONCAT44(auVar340._4_4_,auVar340._0_4_);
                auVar274._0_8_ = uVar110 ^ 0x8000000080000000;
                auVar274._8_4_ = -auVar340._8_4_;
                auVar274._12_4_ = -auVar340._12_4_;
                auVar127 = ZEXT416((uint)(fVar161 * 1.5 +
                                         fVar221 * -0.5 * fVar161 * fVar161 * fVar161));
                auVar127 = vshufps_avx(auVar127,auVar127,0);
                auVar230._0_4_ = auVar127._0_4_ * auVar12._0_4_ * auVar169._0_4_;
                auVar230._4_4_ = auVar127._4_4_ * auVar12._4_4_ * auVar169._4_4_;
                auVar230._8_4_ = auVar127._8_4_ * auVar12._8_4_ * auVar169._8_4_;
                auVar230._12_4_ = auVar127._12_4_ * auVar12._12_4_ * auVar169._12_4_;
                auVar298._0_4_ = auVar340._0_4_ * auVar127._0_4_;
                auVar298._4_4_ = auVar340._4_4_ * auVar127._4_4_;
                auVar298._8_4_ = auVar340._8_4_ * auVar127._8_4_;
                auVar298._12_4_ = auVar340._12_4_ * auVar127._12_4_;
                local_a40._0_4_ = auVar49._0_4_;
                if (fVar221 < 0.0) {
                  local_8c0._0_4_ = fVar220;
                  local_9c0._0_16_ = auVar274;
                  local_9e0._0_16_ = auVar298;
                  local_9a0._0_16_ = auVar230;
                  fVar221 = sqrtf(fVar221);
                  auVar390 = ZEXT464((uint)local_a40._0_4_);
                  auVar230 = local_9a0._0_16_;
                  auVar274 = local_9c0._0_16_;
                  auVar298 = local_9e0._0_16_;
                  fVar220 = (float)local_8c0._0_4_;
                }
                else {
                  auVar49 = vsqrtss_avx(auVar128,auVar128);
                  fVar221 = auVar49._0_4_;
                }
                auVar49 = vdpps_avx(_local_a60,auVar298,0x7f);
                fVar221 = (local_860 / fVar221) * (fVar220 + 1.0) +
                          auVar390._0_4_ + fVar220 * local_860;
                auVar128 = vdpps_avx(auVar274,auVar298,0x7f);
                auVar169 = vdpps_avx(_local_a60,auVar230,0x7f);
                auVar104._4_4_ = fStack_83c;
                auVar104._0_4_ = local_840;
                auVar104._8_4_ = fStack_838;
                auVar104._12_4_ = aStack_834.a;
                auVar127 = vdpps_avx(auVar104,auVar298,0x7f);
                auVar12 = vdpps_avx(_local_a60,auVar274,0x7f);
                fVar161 = auVar128._0_4_ + auVar169._0_4_;
                fVar189 = auVar49._0_4_;
                auVar129._0_4_ = fVar189 * fVar189;
                auVar129._4_4_ = auVar49._4_4_ * auVar49._4_4_;
                auVar129._8_4_ = auVar49._8_4_ * auVar49._8_4_;
                auVar129._12_4_ = auVar49._12_4_ * auVar49._12_4_;
                auVar169 = vsubps_avx(auVar123,auVar129);
                auVar128 = vdpps_avx(_local_a60,auVar104,0x7f);
                fVar220 = auVar12._0_4_ - fVar189 * fVar161;
                fVar218 = auVar128._0_4_ - fVar189 * auVar127._0_4_;
                auVar128 = vrsqrtss_avx(auVar169,auVar169);
                fVar243 = auVar169._0_4_;
                fVar189 = auVar128._0_4_;
                fVar189 = fVar189 * 1.5 + fVar243 * -0.5 * fVar189 * fVar189 * fVar189;
                if (fVar243 < 0.0) {
                  local_8c0._0_16_ = auVar49;
                  local_9c0._0_4_ = fVar221;
                  local_9e0._0_16_ = auVar127;
                  local_9a0._0_16_ = ZEXT416((uint)fVar161);
                  local_8e0._0_4_ = fVar220;
                  local_820._0_4_ = fVar218;
                  local_780._0_4_ = fVar189;
                  fVar243 = sqrtf(fVar243);
                  auVar390 = ZEXT464((uint)local_a40._0_4_);
                  fVar189 = (float)local_780._0_4_;
                  fVar220 = (float)local_8e0._0_4_;
                  fVar218 = (float)local_820._0_4_;
                  auVar127 = local_9e0._0_16_;
                  fVar221 = (float)local_9c0._0_4_;
                  auVar49 = local_8c0._0_16_;
                  auVar128 = local_9a0._0_16_;
                }
                else {
                  auVar128 = vsqrtss_avx(auVar169,auVar169);
                  fVar243 = auVar128._0_4_;
                  auVar128 = ZEXT416((uint)fVar161);
                }
                auVar417 = ZEXT1664(auVar49);
                auVar400 = ZEXT464((uint)fVar221);
                auVar12 = vpermilps_avx(local_880._0_16_,0xff);
                auVar13 = vshufps_avx(auVar340,auVar340,0xff);
                fVar220 = fVar220 * fVar189 - auVar13._0_4_;
                auVar255._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
                auVar255._8_4_ = auVar127._8_4_ ^ 0x80000000;
                auVar255._12_4_ = auVar127._12_4_ ^ 0x80000000;
                auVar275._0_4_ = -fVar220;
                auVar275._4_4_ = 0x80000000;
                auVar275._8_4_ = 0x80000000;
                auVar275._12_4_ = 0x80000000;
                auVar284 = ZEXT1664(auVar275);
                fVar161 = auVar128._0_4_ * fVar218 * fVar189;
                auVar306 = ZEXT464((uint)fVar161);
                auVar169 = vinsertps_avx(auVar275,ZEXT416((uint)(fVar218 * fVar189)),0x1c);
                auVar127 = vmovsldup_avx(ZEXT416((uint)(fVar161 - auVar127._0_4_ * fVar220)));
                auVar169 = vdivps_avx(auVar169,auVar127);
                auVar128 = vinsertps_avx(auVar128,auVar255,0x10);
                auVar128 = vdivps_avx(auVar128,auVar127);
                auVar127 = vmovsldup_avx(auVar49);
                auVar130 = ZEXT416((uint)(fVar243 - auVar12._0_4_));
                auVar12 = vmovsldup_avx(auVar130);
                auVar199._0_4_ = auVar127._0_4_ * auVar169._0_4_ + auVar12._0_4_ * auVar128._0_4_;
                auVar199._4_4_ = auVar127._4_4_ * auVar169._4_4_ + auVar12._4_4_ * auVar128._4_4_;
                auVar199._8_4_ = auVar127._8_4_ * auVar169._8_4_ + auVar12._8_4_ * auVar128._8_4_;
                auVar199._12_4_ =
                     auVar127._12_4_ * auVar169._12_4_ + auVar12._12_4_ * auVar128._12_4_;
                auVar169 = vsubps_avx(auVar356,auVar199);
                auVar363 = ZEXT1664(auVar169);
                auVar200._8_4_ = 0x7fffffff;
                auVar200._0_8_ = 0x7fffffff7fffffff;
                auVar200._12_4_ = 0x7fffffff;
                auVar128 = vandps_avx(auVar49,auVar200);
                if (auVar128._0_4_ < fVar221) {
                  auVar231._8_4_ = 0x7fffffff;
                  auVar231._0_8_ = 0x7fffffff7fffffff;
                  auVar231._12_4_ = 0x7fffffff;
                  auVar128 = vandps_avx(auVar130,auVar231);
                  if (auVar128._0_4_ <
                      (float)local_900._0_4_ * 1.9073486e-06 + auVar390._0_4_ + fVar221) {
                    fVar161 = auVar169._0_4_ + (float)local_7f0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar161) {
                      fVar189 = (ray->super_RayK<1>).tfar;
                      auVar306 = ZEXT464((uint)fVar189);
                      if (fVar161 <= fVar189) {
                        auVar128 = vmovshdup_avx(auVar169);
                        fVar220 = auVar128._0_4_;
                        if ((0.0 <= fVar220) && (fVar220 <= 1.0)) {
                          auVar123 = vrsqrtss_avx(auVar123,auVar123);
                          fVar218 = auVar123._0_4_;
                          auVar284 = ZEXT464((uint)(fVar242 * -0.5));
                          pGVar30 = (context->scene->geometries).items[uVar114].ptr;
                          if ((pGVar30->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar123 = ZEXT416((uint)(fVar218 * 1.5 +
                                                     fVar242 * -0.5 * fVar218 * fVar218 * fVar218));
                            auVar123 = vshufps_avx(auVar123,auVar123,0);
                            auVar232._0_4_ = auVar123._0_4_ * (float)local_a60._0_4_;
                            auVar232._4_4_ = auVar123._4_4_ * (float)local_a60._4_4_;
                            auVar232._8_4_ = auVar123._8_4_ * fStack_a58;
                            auVar232._12_4_ = auVar123._12_4_ * fStack_a54;
                            auVar172._0_4_ = auVar340._0_4_ + auVar13._0_4_ * auVar232._0_4_;
                            auVar172._4_4_ = auVar340._4_4_ + auVar13._4_4_ * auVar232._4_4_;
                            auVar172._8_4_ = auVar340._8_4_ + auVar13._8_4_ * auVar232._8_4_;
                            auVar172._12_4_ = auVar340._12_4_ + auVar13._12_4_ * auVar232._12_4_;
                            auVar123 = vshufps_avx(auVar232,auVar232,0xc9);
                            auVar128 = vshufps_avx(auVar340,auVar340,0xc9);
                            auVar233._0_4_ = auVar128._0_4_ * auVar232._0_4_;
                            auVar233._4_4_ = auVar128._4_4_ * auVar232._4_4_;
                            auVar233._8_4_ = auVar128._8_4_ * auVar232._8_4_;
                            auVar233._12_4_ = auVar128._12_4_ * auVar232._12_4_;
                            auVar256._0_4_ = auVar340._0_4_ * auVar123._0_4_;
                            auVar256._4_4_ = auVar340._4_4_ * auVar123._4_4_;
                            auVar256._8_4_ = auVar340._8_4_ * auVar123._8_4_;
                            auVar256._12_4_ = auVar340._12_4_ * auVar123._12_4_;
                            auVar127 = vsubps_avx(auVar256,auVar233);
                            auVar123 = vshufps_avx(auVar127,auVar127,0xc9);
                            auVar128 = vshufps_avx(auVar172,auVar172,0xc9);
                            auVar284 = ZEXT1664(auVar128);
                            auVar257._0_4_ = auVar128._0_4_ * auVar123._0_4_;
                            auVar257._4_4_ = auVar128._4_4_ * auVar123._4_4_;
                            auVar257._8_4_ = auVar128._8_4_ * auVar123._8_4_;
                            auVar257._12_4_ = auVar128._12_4_ * auVar123._12_4_;
                            auVar123 = vshufps_avx(auVar127,auVar127,0xd2);
                            auVar173._0_4_ = auVar172._0_4_ * auVar123._0_4_;
                            auVar173._4_4_ = auVar172._4_4_ * auVar123._4_4_;
                            auVar173._8_4_ = auVar172._8_4_ * auVar123._8_4_;
                            auVar173._12_4_ = auVar172._12_4_ * auVar123._12_4_;
                            auVar123 = vsubps_avx(auVar257,auVar173);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar161;
                              auVar49 = vshufps_avx(auVar123,auVar123,0xe9);
                              uVar9 = vmovlps_avx(auVar49);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                              (ray->Ng).field_0.field_0.z = auVar123._0_4_;
                              ray->u = fVar220;
                              ray->v = 0.0;
                              ray->primID = local_920._0_4_;
                              ray->geomID = uVar114;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar127 = vshufps_avx(auVar123,auVar123,0xe9);
                              local_950 = vmovlps_avx(auVar127);
                              local_948 = auVar123._0_4_;
                              local_944 = fVar220;
                              local_940 = 0;
                              local_93c = local_920._0_4_;
                              local_938 = uVar114;
                              local_934 = context->user->instID[0];
                              local_930 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar161;
                              local_a64 = -1;
                              local_a98.valid = &local_a64;
                              local_a98.geometryUserPtr = pGVar30->userPtr;
                              local_a98.context = context->user;
                              local_a98.hit = (RTCHitN *)&local_950;
                              local_a98.N = 1;
                              local_a98.ray = (RTCRayN *)ray;
                              if (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113cac7:
                                p_Var34 = context->args->filter;
                                if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar30->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar284 = ZEXT1664(auVar284._0_16_);
                                  auVar306 = ZEXT1664(auVar306._0_16_);
                                  auVar363 = ZEXT1664(auVar363._0_16_);
                                  auVar390 = ZEXT1664(auVar390._0_16_);
                                  auVar400 = ZEXT1664(auVar400._0_16_);
                                  auVar417 = ZEXT1664(auVar417._0_16_);
                                  (*p_Var34)(&local_a98);
                                  if (*local_a98.valid == 0) goto LAB_0113cb5e;
                                }
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a98.hit;
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a98.hit + 4);
                                (((Vec3f *)((long)local_a98.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a98.hit + 8);
                                *(float *)((long)local_a98.ray + 0x3c) =
                                     *(float *)(local_a98.hit + 0xc);
                                *(float *)((long)local_a98.ray + 0x40) =
                                     *(float *)(local_a98.hit + 0x10);
                                *(float *)((long)local_a98.ray + 0x44) =
                                     *(float *)(local_a98.hit + 0x14);
                                *(float *)((long)local_a98.ray + 0x48) =
                                     *(float *)(local_a98.hit + 0x18);
                                *(float *)((long)local_a98.ray + 0x4c) =
                                     *(float *)(local_a98.hit + 0x1c);
                                *(float *)((long)local_a98.ray + 0x50) =
                                     *(float *)(local_a98.hit + 0x20);
                              }
                              else {
                                auVar284 = ZEXT1664(auVar128);
                                auVar306 = ZEXT464((uint)fVar189);
                                auVar363 = ZEXT1664(auVar169);
                                auVar390 = ZEXT1664(auVar390._0_16_);
                                auVar400 = ZEXT464((uint)fVar221);
                                auVar417 = ZEXT1664(auVar49);
                                (*pGVar30->intersectionFilterN)(&local_a98);
                                if (*local_a98.valid != 0) goto LAB_0113cac7;
LAB_0113cb5e:
                                (ray->super_RayK<1>).tfar = fVar189;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar115 = lVar115 + -1;
              } while (lVar115 != 0);
              auVar186 = local_740;
              fVar221 = (ray->super_RayK<1>).tfar;
              auVar140._4_4_ = fVar221;
              auVar140._0_4_ = fVar221;
              auVar140._8_4_ = fVar221;
              auVar140._12_4_ = fVar221;
              auVar140._16_4_ = fVar221;
              auVar140._20_4_ = fVar221;
              auVar140._24_4_ = fVar221;
              auVar140._28_4_ = fVar221;
              auVar132 = vcmpps_avx(_local_7a0,auVar140,2);
              local_740 = vandps_avx(auVar132,local_740);
              auVar186 = auVar186 & auVar132;
            } while ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar186 >> 0x7f,0) != '\0') ||
                       (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar186 >> 0xbf,0) != '\0') ||
                     (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar186[0x1f] < '\0');
          }
          auVar132 = vandps_avx(local_600,local_5e0);
          auVar186 = vandps_avx(_local_7e0,local_7c0);
          auVar326 = ZEXT3264(_local_760);
          auVar259._0_4_ = local_760._0_4_ + local_4e0._0_4_;
          auVar259._4_4_ = local_760._4_4_ + local_4e0._4_4_;
          auVar259._8_4_ = local_760._8_4_ + local_4e0._8_4_;
          auVar259._12_4_ = local_760._12_4_ + local_4e0._12_4_;
          auVar259._16_4_ = local_760._16_4_ + local_4e0._16_4_;
          auVar259._20_4_ = local_760._20_4_ + local_4e0._20_4_;
          auVar259._24_4_ = local_760._24_4_ + local_4e0._24_4_;
          auVar259._28_4_ = local_760._28_4_ + local_4e0._28_4_;
          auVar37 = vcmpps_avx(auVar259,auVar140,2);
          auVar132 = vandps_avx(auVar37,auVar132);
          auVar260._0_4_ = local_520._0_4_ + local_760._0_4_;
          auVar260._4_4_ = local_520._4_4_ + local_760._4_4_;
          auVar260._8_4_ = local_520._8_4_ + local_760._8_4_;
          auVar260._12_4_ = local_520._12_4_ + local_760._12_4_;
          auVar260._16_4_ = local_520._16_4_ + local_760._16_4_;
          auVar260._20_4_ = local_520._20_4_ + local_760._20_4_;
          auVar260._24_4_ = local_520._24_4_ + local_760._24_4_;
          auVar260._28_4_ = local_520._28_4_ + local_760._28_4_;
          auVar37 = vcmpps_avx(auVar260,auVar140,2);
          auVar186 = vandps_avx(auVar37,auVar186);
          auVar186 = vorps_avx(auVar132,auVar186);
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0x7f,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar186 >> 0xbf,0) != '\0') ||
              (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar186[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar119 * 0x60) = auVar186;
            auVar132 = vblendvps_avx(_local_520,local_4e0,auVar132);
            *(undefined1 (*) [32])(auStack_160 + uVar119 * 0x60) = auVar132;
            uVar9 = vmovlps_avx(local_530);
            (&uStack_140)[uVar119 * 0xc] = uVar9;
            aiStack_138[uVar119 * 0x18] = local_b0c + 1;
            iVar118 = iVar118 + 1;
          }
        }
      }
    }
    fVar221 = (ray->super_RayK<1>).tfar;
    auVar143._4_4_ = fVar221;
    auVar143._0_4_ = fVar221;
    auVar143._8_4_ = fVar221;
    auVar143._12_4_ = fVar221;
    auVar143._16_4_ = fVar221;
    auVar143._20_4_ = fVar221;
    auVar143._24_4_ = fVar221;
    auVar143._28_4_ = fVar221;
    if (iVar118 == 0) break;
    uVar112 = -iVar118;
    pauVar111 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar118 - 1) * 0x60);
    while( true ) {
      auVar132 = pauVar111[1];
      auVar185._0_4_ = auVar132._0_4_ + (float)local_760._0_4_;
      auVar185._4_4_ = auVar132._4_4_ + (float)local_760._4_4_;
      auVar185._8_4_ = auVar132._8_4_ + fStack_758;
      auVar185._12_4_ = auVar132._12_4_ + fStack_754;
      auVar185._16_4_ = auVar132._16_4_ + fStack_750;
      auVar185._20_4_ = auVar132._20_4_ + fStack_74c;
      auVar185._24_4_ = auVar132._24_4_ + fStack_748;
      auVar185._28_4_ = auVar132._28_4_ + fStack_744;
      auVar37 = vcmpps_avx(auVar185,auVar143,2);
      auVar186 = vandps_avx(auVar37,*pauVar111);
      local_4e0 = auVar186;
      auVar37 = *pauVar111 & auVar37;
      if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar37 >> 0x7f,0) != '\0') ||
            (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0xbf,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar37[0x1f] < '\0') break;
      pauVar111 = pauVar111 + -3;
      uVar112 = uVar112 + 1;
      if (uVar112 == 0) goto LAB_0113ce32;
    }
    auVar144._8_4_ = 0x7f800000;
    auVar144._0_8_ = 0x7f8000007f800000;
    auVar144._12_4_ = 0x7f800000;
    auVar144._16_4_ = 0x7f800000;
    auVar144._20_4_ = 0x7f800000;
    auVar144._24_4_ = 0x7f800000;
    auVar144._28_4_ = 0x7f800000;
    auVar132 = vblendvps_avx(auVar144,auVar132,auVar186);
    auVar37 = vshufps_avx(auVar132,auVar132,0xb1);
    auVar37 = vminps_avx(auVar132,auVar37);
    auVar38 = vshufpd_avx(auVar37,auVar37,5);
    auVar37 = vminps_avx(auVar37,auVar38);
    auVar38 = vperm2f128_avx(auVar37,auVar37,1);
    auVar37 = vminps_avx(auVar37,auVar38);
    auVar132 = vcmpps_avx(auVar132,auVar37,0);
    auVar37 = auVar186 & auVar132;
    if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar37 >> 0x7f,0) != '\0') ||
          (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar37 >> 0xbf,0) != '\0') ||
        (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar37[0x1f] < '\0')
    {
      auVar186 = vandps_avx(auVar132,auVar186);
    }
    auVar131._8_8_ = 0;
    auVar131._0_8_ = *(ulong *)pauVar111[2];
    local_b0c = *(uint *)(pauVar111[2] + 8);
    uVar113 = vmovmskps_avx(auVar186);
    uVar109 = 0;
    if (uVar113 != 0) {
      for (; (uVar113 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
      }
    }
    *(undefined4 *)(local_4e0 + (ulong)uVar109 * 4) = 0;
    *pauVar111 = local_4e0;
    uVar113 = ~uVar112;
    if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4e0 >> 0x7f,0) != '\0') ||
          (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4e0 >> 0xbf,0) != '\0') ||
        (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4e0[0x1f] < '\0') {
      uVar113 = -uVar112;
    }
    uVar119 = (ulong)uVar113;
    auVar123 = vshufps_avx(auVar131,auVar131,0);
    auVar49 = vshufps_avx(auVar131,auVar131,0x55);
    auVar49 = vsubps_avx(auVar49,auVar123);
    local_520._4_4_ = auVar123._4_4_ + auVar49._4_4_ * 0.14285715;
    local_520._0_4_ = auVar123._0_4_ + auVar49._0_4_ * 0.0;
    fStack_518 = auVar123._8_4_ + auVar49._8_4_ * 0.2857143;
    fStack_514 = auVar123._12_4_ + auVar49._12_4_ * 0.42857146;
    fStack_510 = auVar123._0_4_ + auVar49._0_4_ * 0.5714286;
    fStack_50c = auVar123._4_4_ + auVar49._4_4_ * 0.71428573;
    fStack_508 = auVar123._8_4_ + auVar49._8_4_ * 0.8571429;
    fStack_504 = auVar123._12_4_ + auVar49._12_4_;
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_520 + (ulong)uVar109 * 4);
    uVar110 = local_920._0_8_;
  } while( true );
LAB_0113ce32:
  auVar132 = vcmpps_avx(local_2c0,auVar143,2);
  uVar114 = vmovmskps_avx(auVar132);
  uVar108 = uVar108 - 1 & uVar108 & uVar114;
  if (uVar108 == 0) {
    return;
  }
  goto LAB_0113a3ff;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }